

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [28];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  uint uVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  bool bVar117;
  bool bVar118;
  bool bVar119;
  bool bVar120;
  bool bVar121;
  bool bVar122;
  bool bVar123;
  bool bVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [12];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  undefined1 auVar141 [28];
  undefined1 auVar142 [24];
  undefined1 auVar143 [28];
  uint uVar144;
  uint uVar145;
  uint uVar146;
  float fVar200;
  float fVar202;
  float fVar203;
  undefined1 auVar181 [32];
  undefined1 auVar201 [16];
  long lVar147;
  ulong uVar148;
  undefined1 auVar149 [8];
  ulong uVar150;
  long lVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar169;
  float fVar171;
  float fVar173;
  float fVar174;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar170;
  float fVar172;
  float fVar175;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  float fVar176;
  float fVar194;
  float fVar196;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar198;
  float fVar204;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar177;
  undefined1 auVar187 [32];
  float fVar195;
  float fVar197;
  float fVar199;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar217;
  float fVar234;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar263 [16];
  float fVar230;
  float fVar232;
  float fVar236;
  float fVar238;
  float fVar241;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  float fVar231;
  float fVar233;
  float fVar235;
  float fVar237;
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar244;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar245 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar257;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar258;
  float fVar270;
  float fVar273;
  undefined1 auVar261 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar264 [32];
  undefined1 auVar262 [16];
  float fVar259;
  float fVar260;
  float fVar276;
  undefined1 auVar265 [32];
  float fVar271;
  float fVar272;
  float fVar274;
  float fVar275;
  float fVar277;
  float fVar278;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar283 [16];
  float fVar282;
  float fVar292;
  float fVar293;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  float fVar294;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar295;
  float fVar296;
  undefined1 auVar291 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [16];
  float fVar311;
  float fVar313;
  float fVar314;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar312;
  undefined1 auVar309 [32];
  undefined1 auVar310 [64];
  float fVar315;
  undefined1 auVar316 [16];
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar317 [32];
  float fVar326;
  float fVar331;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [64];
  float fVar332;
  float fVar333;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  float in_register_0000151c;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar353;
  undefined1 auVar354 [16];
  float fVar360;
  float fVar361;
  undefined1 auVar355 [32];
  float fVar362;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [64];
  float fVar363;
  float fVar368;
  float fVar370;
  float fVar372;
  float fVar374;
  float fVar375;
  float in_register_0000159c;
  undefined1 auVar364 [32];
  float fVar369;
  float fVar371;
  float fVar373;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar376;
  float fVar380;
  float fVar381;
  float fVar382;
  float in_register_000015dc;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  int local_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  Precalculations *local_808;
  RayHit *local_800;
  RayQueryContext *local_7f8;
  ulong local_7f0;
  ulong local_7e8;
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  undefined1 auStack_770 [16];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_710 [8];
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [8];
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined8 local_650;
  undefined4 local_648;
  float local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  uint local_634;
  uint local_630;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  undefined1 auStack_5b0 [8];
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_550 [8];
  float fStack_548;
  float fStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  float local_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  undefined1 local_320 [32];
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [8];
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar19 = prim[1];
  uVar150 = (ulong)(byte)PVar19;
  lVar147 = uVar150 * 5;
  fVar217 = *(float *)(prim + uVar150 * 0x19 + 0x12);
  auVar201 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + uVar150 * 0x19 + 6));
  auVar261._0_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar261._4_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar261._8_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar261._12_4_ = fVar217 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar150 * 4 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar150 * 4 + 10)));
  auVar178._0_4_ = fVar217 * auVar201._0_4_;
  auVar178._4_4_ = fVar217 * auVar201._4_4_;
  auVar178._8_4_ = fVar217 * auVar201._8_4_;
  auVar178._12_4_ = fVar217 * auVar201._12_4_;
  auVar156._16_16_ = auVar209;
  auVar156._0_16_ = auVar263;
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar147 + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar147 + 10)));
  auVar213._16_16_ = auVar209;
  auVar213._0_16_ = auVar263;
  auVar25 = vcvtdq2ps_avx(auVar213);
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar150 * 6 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar150 * 6 + 10)));
  auVar221._16_16_ = auVar209;
  auVar221._0_16_ = auVar263;
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar150 * 0xb + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar150 * 0xb + 10)));
  auVar26 = vcvtdq2ps_avx(auVar221);
  auVar222._16_16_ = auVar209;
  auVar222._0_16_ = auVar263;
  auVar27 = vcvtdq2ps_avx(auVar222);
  uVar148 = (ulong)((uint)(byte)PVar19 * 0xc);
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + 10)));
  auVar284._16_16_ = auVar209;
  auVar284._0_16_ = auVar263;
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + uVar150 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar284);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + uVar150 + 10)));
  auVar297._16_16_ = auVar209;
  auVar297._0_16_ = auVar263;
  lVar151 = uVar150 * 9;
  uVar148 = (ulong)(uint)((int)lVar151 * 2);
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + 6)));
  auVar29 = vcvtdq2ps_avx(auVar297);
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + 10)));
  auVar298._16_16_ = auVar209;
  auVar298._0_16_ = auVar263;
  auVar30 = vcvtdq2ps_avx(auVar298);
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + uVar150 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + uVar150 + 10)));
  auVar317._16_16_ = auVar209;
  auVar317._0_16_ = auVar263;
  uVar148 = (ulong)(uint)((int)lVar147 << 2);
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + 6)));
  auVar209 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 + 10)));
  auVar31 = vcvtdq2ps_avx(auVar317);
  auVar334._16_16_ = auVar209;
  auVar334._0_16_ = auVar263;
  auVar32 = vcvtdq2ps_avx(auVar334);
  auVar263 = vshufps_avx(auVar261,auVar261,0);
  auVar209 = vshufps_avx(auVar261,auVar261,0x55);
  auVar201 = vshufps_avx(auVar261,auVar261,0xaa);
  fVar217 = auVar201._0_4_;
  fVar230 = auVar201._4_4_;
  fVar232 = auVar201._8_4_;
  fVar234 = auVar201._12_4_;
  fVar236 = auVar209._0_4_;
  fVar238 = auVar209._4_4_;
  fVar241 = auVar209._8_4_;
  fVar244 = auVar209._12_4_;
  fVar251 = auVar263._0_4_;
  fVar252 = auVar263._4_4_;
  fVar253 = auVar263._8_4_;
  fVar254 = auVar263._12_4_;
  auVar347._0_4_ = fVar251 * auVar156._0_4_ + fVar236 * auVar25._0_4_ + fVar217 * auVar26._0_4_;
  auVar347._4_4_ = fVar252 * auVar156._4_4_ + fVar238 * auVar25._4_4_ + fVar230 * auVar26._4_4_;
  auVar347._8_4_ = fVar253 * auVar156._8_4_ + fVar241 * auVar25._8_4_ + fVar232 * auVar26._8_4_;
  auVar347._12_4_ = fVar254 * auVar156._12_4_ + fVar244 * auVar25._12_4_ + fVar234 * auVar26._12_4_;
  auVar347._16_4_ = fVar251 * auVar156._16_4_ + fVar236 * auVar25._16_4_ + fVar217 * auVar26._16_4_;
  auVar347._20_4_ = fVar252 * auVar156._20_4_ + fVar238 * auVar25._20_4_ + fVar230 * auVar26._20_4_;
  auVar347._24_4_ = fVar253 * auVar156._24_4_ + fVar241 * auVar25._24_4_ + fVar232 * auVar26._24_4_;
  auVar347._28_4_ = fVar244 + in_register_000015dc + in_register_0000151c;
  auVar344._0_4_ = fVar251 * auVar27._0_4_ + fVar236 * auVar28._0_4_ + auVar29._0_4_ * fVar217;
  auVar344._4_4_ = fVar252 * auVar27._4_4_ + fVar238 * auVar28._4_4_ + auVar29._4_4_ * fVar230;
  auVar344._8_4_ = fVar253 * auVar27._8_4_ + fVar241 * auVar28._8_4_ + auVar29._8_4_ * fVar232;
  auVar344._12_4_ = fVar254 * auVar27._12_4_ + fVar244 * auVar28._12_4_ + auVar29._12_4_ * fVar234;
  auVar344._16_4_ = fVar251 * auVar27._16_4_ + fVar236 * auVar28._16_4_ + auVar29._16_4_ * fVar217;
  auVar344._20_4_ = fVar252 * auVar27._20_4_ + fVar238 * auVar28._20_4_ + auVar29._20_4_ * fVar230;
  auVar344._24_4_ = fVar253 * auVar27._24_4_ + fVar241 * auVar28._24_4_ + auVar29._24_4_ * fVar232;
  auVar344._28_4_ = fVar244 + in_register_000015dc + in_register_0000159c;
  auVar264._0_4_ = fVar251 * auVar30._0_4_ + fVar236 * auVar31._0_4_ + auVar32._0_4_ * fVar217;
  auVar264._4_4_ = fVar252 * auVar30._4_4_ + fVar238 * auVar31._4_4_ + auVar32._4_4_ * fVar230;
  auVar264._8_4_ = fVar253 * auVar30._8_4_ + fVar241 * auVar31._8_4_ + auVar32._8_4_ * fVar232;
  auVar264._12_4_ = fVar254 * auVar30._12_4_ + fVar244 * auVar31._12_4_ + auVar32._12_4_ * fVar234;
  auVar264._16_4_ = fVar251 * auVar30._16_4_ + fVar236 * auVar31._16_4_ + auVar32._16_4_ * fVar217;
  auVar264._20_4_ = fVar252 * auVar30._20_4_ + fVar238 * auVar31._20_4_ + auVar32._20_4_ * fVar230;
  auVar264._24_4_ = fVar253 * auVar30._24_4_ + fVar241 * auVar31._24_4_ + auVar32._24_4_ * fVar232;
  auVar264._28_4_ = fVar254 + fVar244 + fVar234;
  auVar263 = vshufps_avx(auVar178,auVar178,0);
  auVar209 = vshufps_avx(auVar178,auVar178,0x55);
  auVar201 = vshufps_avx(auVar178,auVar178,0xaa);
  fVar230 = auVar201._0_4_;
  fVar232 = auVar201._4_4_;
  fVar234 = auVar201._8_4_;
  fVar236 = auVar201._12_4_;
  fVar252 = auVar209._0_4_;
  fVar253 = auVar209._4_4_;
  fVar254 = auVar209._8_4_;
  fVar255 = auVar209._12_4_;
  fVar238 = auVar263._0_4_;
  fVar241 = auVar263._4_4_;
  fVar244 = auVar263._8_4_;
  fVar251 = auVar263._12_4_;
  fVar217 = auVar156._28_4_;
  auVar285._0_4_ = fVar238 * auVar156._0_4_ + fVar252 * auVar25._0_4_ + fVar230 * auVar26._0_4_;
  auVar285._4_4_ = fVar241 * auVar156._4_4_ + fVar253 * auVar25._4_4_ + fVar232 * auVar26._4_4_;
  auVar285._8_4_ = fVar244 * auVar156._8_4_ + fVar254 * auVar25._8_4_ + fVar234 * auVar26._8_4_;
  auVar285._12_4_ = fVar251 * auVar156._12_4_ + fVar255 * auVar25._12_4_ + fVar236 * auVar26._12_4_;
  auVar285._16_4_ = fVar238 * auVar156._16_4_ + fVar252 * auVar25._16_4_ + fVar230 * auVar26._16_4_;
  auVar285._20_4_ = fVar241 * auVar156._20_4_ + fVar253 * auVar25._20_4_ + fVar232 * auVar26._20_4_;
  auVar285._24_4_ = fVar244 * auVar156._24_4_ + fVar254 * auVar25._24_4_ + fVar234 * auVar26._24_4_;
  auVar285._28_4_ = fVar217 + auVar25._28_4_ + auVar26._28_4_;
  auVar181._0_4_ = fVar238 * auVar27._0_4_ + auVar29._0_4_ * fVar230 + fVar252 * auVar28._0_4_;
  auVar181._4_4_ = fVar241 * auVar27._4_4_ + auVar29._4_4_ * fVar232 + fVar253 * auVar28._4_4_;
  auVar181._8_4_ = fVar244 * auVar27._8_4_ + auVar29._8_4_ * fVar234 + fVar254 * auVar28._8_4_;
  auVar181._12_4_ = fVar251 * auVar27._12_4_ + auVar29._12_4_ * fVar236 + fVar255 * auVar28._12_4_;
  auVar181._16_4_ = fVar238 * auVar27._16_4_ + auVar29._16_4_ * fVar230 + fVar252 * auVar28._16_4_;
  auVar181._20_4_ = fVar241 * auVar27._20_4_ + auVar29._20_4_ * fVar232 + fVar253 * auVar28._20_4_;
  auVar181._24_4_ = fVar244 * auVar27._24_4_ + auVar29._24_4_ * fVar234 + fVar254 * auVar28._24_4_;
  auVar181._28_4_ = fVar217 + auVar29._28_4_ + auVar26._28_4_;
  auVar299._8_4_ = 0x7fffffff;
  auVar299._0_8_ = 0x7fffffff7fffffff;
  auVar299._12_4_ = 0x7fffffff;
  auVar299._16_4_ = 0x7fffffff;
  auVar299._20_4_ = 0x7fffffff;
  auVar299._24_4_ = 0x7fffffff;
  auVar299._28_4_ = 0x7fffffff;
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar214._16_4_ = 0x219392ef;
  auVar214._20_4_ = 0x219392ef;
  auVar214._24_4_ = 0x219392ef;
  auVar214._28_4_ = 0x219392ef;
  auVar156 = vandps_avx(auVar347,auVar299);
  auVar156 = vcmpps_avx(auVar156,auVar214,1);
  auVar25 = vblendvps_avx(auVar347,auVar214,auVar156);
  auVar156 = vandps_avx(auVar344,auVar299);
  auVar156 = vcmpps_avx(auVar156,auVar214,1);
  auVar26 = vblendvps_avx(auVar344,auVar214,auVar156);
  auVar156 = vandps_avx(auVar264,auVar299);
  auVar156 = vcmpps_avx(auVar156,auVar214,1);
  auVar156 = vblendvps_avx(auVar264,auVar214,auVar156);
  auVar215._0_4_ = fVar252 * auVar31._0_4_ + auVar32._0_4_ * fVar230 + fVar238 * auVar30._0_4_;
  auVar215._4_4_ = fVar253 * auVar31._4_4_ + auVar32._4_4_ * fVar232 + fVar241 * auVar30._4_4_;
  auVar215._8_4_ = fVar254 * auVar31._8_4_ + auVar32._8_4_ * fVar234 + fVar244 * auVar30._8_4_;
  auVar215._12_4_ = fVar255 * auVar31._12_4_ + auVar32._12_4_ * fVar236 + fVar251 * auVar30._12_4_;
  auVar215._16_4_ = fVar252 * auVar31._16_4_ + auVar32._16_4_ * fVar230 + fVar238 * auVar30._16_4_;
  auVar215._20_4_ = fVar253 * auVar31._20_4_ + auVar32._20_4_ * fVar232 + fVar241 * auVar30._20_4_;
  auVar215._24_4_ = fVar254 * auVar31._24_4_ + auVar32._24_4_ * fVar234 + fVar244 * auVar30._24_4_;
  auVar215._28_4_ = auVar28._28_4_ + fVar236 + fVar217;
  auVar27 = vrcpps_avx(auVar25);
  fVar217 = auVar27._0_4_;
  fVar230 = auVar27._4_4_;
  auVar28._4_4_ = auVar25._4_4_ * fVar230;
  auVar28._0_4_ = auVar25._0_4_ * fVar217;
  fVar232 = auVar27._8_4_;
  auVar28._8_4_ = auVar25._8_4_ * fVar232;
  fVar234 = auVar27._12_4_;
  auVar28._12_4_ = auVar25._12_4_ * fVar234;
  fVar236 = auVar27._16_4_;
  auVar28._16_4_ = auVar25._16_4_ * fVar236;
  fVar238 = auVar27._20_4_;
  auVar28._20_4_ = auVar25._20_4_ * fVar238;
  fVar241 = auVar27._24_4_;
  auVar28._24_4_ = auVar25._24_4_ * fVar241;
  auVar28._28_4_ = auVar25._28_4_;
  auVar307._8_4_ = 0x3f800000;
  auVar307._0_8_ = &DAT_3f8000003f800000;
  auVar307._12_4_ = 0x3f800000;
  auVar307._16_4_ = 0x3f800000;
  auVar307._20_4_ = 0x3f800000;
  auVar307._24_4_ = 0x3f800000;
  auVar307._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar307,auVar28);
  auVar25 = vrcpps_avx(auVar26);
  fVar217 = fVar217 + fVar217 * auVar28._0_4_;
  fVar230 = fVar230 + fVar230 * auVar28._4_4_;
  fVar232 = fVar232 + fVar232 * auVar28._8_4_;
  fVar234 = fVar234 + fVar234 * auVar28._12_4_;
  fVar236 = fVar236 + fVar236 * auVar28._16_4_;
  fVar238 = fVar238 + fVar238 * auVar28._20_4_;
  fVar241 = fVar241 + fVar241 * auVar28._24_4_;
  fVar258 = auVar25._0_4_;
  fVar270 = auVar25._4_4_;
  auVar29._4_4_ = fVar270 * auVar26._4_4_;
  auVar29._0_4_ = fVar258 * auVar26._0_4_;
  fVar273 = auVar25._8_4_;
  auVar29._8_4_ = fVar273 * auVar26._8_4_;
  fVar276 = auVar25._12_4_;
  auVar29._12_4_ = fVar276 * auVar26._12_4_;
  fVar279 = auVar25._16_4_;
  auVar29._16_4_ = fVar279 * auVar26._16_4_;
  fVar280 = auVar25._20_4_;
  auVar29._20_4_ = fVar280 * auVar26._20_4_;
  fVar281 = auVar25._24_4_;
  auVar29._24_4_ = fVar281 * auVar26._24_4_;
  auVar29._28_4_ = auVar27._28_4_;
  auVar25 = vsubps_avx(auVar307,auVar29);
  fVar258 = fVar258 + fVar258 * auVar25._0_4_;
  fVar270 = fVar270 + fVar270 * auVar25._4_4_;
  fVar273 = fVar273 + fVar273 * auVar25._8_4_;
  fVar276 = fVar276 + fVar276 * auVar25._12_4_;
  fVar279 = fVar279 + fVar279 * auVar25._16_4_;
  fVar280 = fVar280 + fVar280 * auVar25._20_4_;
  fVar281 = fVar281 + fVar281 * auVar25._24_4_;
  auVar25 = vrcpps_avx(auVar156);
  fVar244 = auVar25._0_4_;
  fVar251 = auVar25._4_4_;
  auVar30._4_4_ = fVar251 * auVar156._4_4_;
  auVar30._0_4_ = fVar244 * auVar156._0_4_;
  fVar252 = auVar25._8_4_;
  auVar30._8_4_ = fVar252 * auVar156._8_4_;
  fVar253 = auVar25._12_4_;
  auVar30._12_4_ = fVar253 * auVar156._12_4_;
  fVar254 = auVar25._16_4_;
  auVar30._16_4_ = fVar254 * auVar156._16_4_;
  fVar255 = auVar25._20_4_;
  auVar30._20_4_ = fVar255 * auVar156._20_4_;
  fVar256 = auVar25._24_4_;
  auVar30._24_4_ = fVar256 * auVar156._24_4_;
  auVar30._28_4_ = auVar26._28_4_;
  auVar156 = vsubps_avx(auVar307,auVar30);
  fVar244 = fVar244 + fVar244 * auVar156._0_4_;
  fVar251 = fVar251 + fVar251 * auVar156._4_4_;
  fVar252 = fVar252 + fVar252 * auVar156._8_4_;
  fVar253 = fVar253 + fVar253 * auVar156._12_4_;
  fVar254 = fVar254 + fVar254 * auVar156._16_4_;
  fVar255 = fVar255 + fVar255 * auVar156._20_4_;
  fVar256 = fVar256 + fVar256 * auVar156._24_4_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar150 * 7 + 6);
  auVar263 = vpmovsxwd_avx(auVar263);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar150 * 7 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar209);
  auVar157._16_16_ = auVar209;
  auVar157._0_16_ = auVar263;
  auVar156 = vcvtdq2ps_avx(auVar157);
  auVar156 = vsubps_avx(auVar156,auVar285);
  auVar154._0_4_ = fVar217 * auVar156._0_4_;
  auVar154._4_4_ = fVar230 * auVar156._4_4_;
  auVar154._8_4_ = fVar232 * auVar156._8_4_;
  auVar154._12_4_ = fVar234 * auVar156._12_4_;
  auVar26._16_4_ = fVar236 * auVar156._16_4_;
  auVar26._0_16_ = auVar154;
  auVar26._20_4_ = fVar238 * auVar156._20_4_;
  auVar26._24_4_ = fVar241 * auVar156._24_4_;
  auVar26._28_4_ = auVar156._28_4_;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar263 = vpmovsxwd_avx(auVar201);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar220);
  auVar300._16_16_ = auVar209;
  auVar300._0_16_ = auVar263;
  auVar156 = vcvtdq2ps_avx(auVar300);
  auVar156 = vsubps_avx(auVar156,auVar285);
  auVar218._0_4_ = fVar217 * auVar156._0_4_;
  auVar218._4_4_ = fVar230 * auVar156._4_4_;
  auVar218._8_4_ = fVar232 * auVar156._8_4_;
  auVar218._12_4_ = fVar234 * auVar156._12_4_;
  auVar31._16_4_ = fVar236 * auVar156._16_4_;
  auVar31._0_16_ = auVar218;
  auVar31._20_4_ = fVar238 * auVar156._20_4_;
  auVar31._24_4_ = fVar241 * auVar156._24_4_;
  auVar31._28_4_ = auVar27._28_4_ + auVar28._28_4_;
  lVar147 = (ulong)(byte)PVar19 * 0x10;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar147 + 6);
  auVar263 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar147 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar12);
  lVar147 = lVar147 + uVar150 * -2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar147 + 6);
  auVar201 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar147 + 0xe);
  auVar220 = vpmovsxwd_avx(auVar14);
  auVar286._16_16_ = auVar220;
  auVar286._0_16_ = auVar201;
  auVar156 = vcvtdq2ps_avx(auVar286);
  auVar156 = vsubps_avx(auVar156,auVar181);
  auVar283._0_4_ = fVar258 * auVar156._0_4_;
  auVar283._4_4_ = fVar270 * auVar156._4_4_;
  auVar283._8_4_ = fVar273 * auVar156._8_4_;
  auVar283._12_4_ = fVar276 * auVar156._12_4_;
  auVar27._16_4_ = fVar279 * auVar156._16_4_;
  auVar27._0_16_ = auVar283;
  auVar27._20_4_ = fVar280 * auVar156._20_4_;
  auVar27._24_4_ = fVar281 * auVar156._24_4_;
  auVar27._28_4_ = auVar156._28_4_;
  auVar301._16_16_ = auVar209;
  auVar301._0_16_ = auVar263;
  auVar156 = vcvtdq2ps_avx(auVar301);
  auVar156 = vsubps_avx(auVar156,auVar181);
  auVar179._0_4_ = fVar258 * auVar156._0_4_;
  auVar179._4_4_ = fVar270 * auVar156._4_4_;
  auVar179._8_4_ = fVar273 * auVar156._8_4_;
  auVar179._12_4_ = fVar276 * auVar156._12_4_;
  auVar25._16_4_ = fVar279 * auVar156._16_4_;
  auVar25._0_16_ = auVar179;
  auVar25._20_4_ = fVar280 * auVar156._20_4_;
  auVar25._24_4_ = fVar281 * auVar156._24_4_;
  auVar25._28_4_ = auVar156._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar148 + uVar150 + 6);
  auVar263 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar148 + uVar150 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar16);
  auVar265._16_16_ = auVar209;
  auVar265._0_16_ = auVar263;
  auVar156 = vcvtdq2ps_avx(auVar265);
  auVar156 = vsubps_avx(auVar156,auVar215);
  auVar262._0_4_ = fVar244 * auVar156._0_4_;
  auVar262._4_4_ = fVar251 * auVar156._4_4_;
  auVar262._8_4_ = fVar252 * auVar156._8_4_;
  auVar262._12_4_ = fVar253 * auVar156._12_4_;
  auVar32._16_4_ = fVar254 * auVar156._16_4_;
  auVar32._0_16_ = auVar262;
  auVar32._20_4_ = fVar255 * auVar156._20_4_;
  auVar32._24_4_ = fVar256 * auVar156._24_4_;
  auVar32._28_4_ = auVar156._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar150 * 0x17 + 6);
  auVar263 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar150 * 0x17 + 0xe);
  auVar209 = vpmovsxwd_avx(auVar18);
  auVar302._16_16_ = auVar209;
  auVar302._0_16_ = auVar263;
  auVar156 = vcvtdq2ps_avx(auVar302);
  auVar156 = vsubps_avx(auVar156,auVar215);
  auVar205._0_4_ = fVar244 * auVar156._0_4_;
  auVar205._4_4_ = fVar251 * auVar156._4_4_;
  auVar205._8_4_ = fVar252 * auVar156._8_4_;
  auVar205._12_4_ = fVar253 * auVar156._12_4_;
  auVar33._16_4_ = fVar254 * auVar156._16_4_;
  auVar33._0_16_ = auVar205;
  auVar33._20_4_ = fVar255 * auVar156._20_4_;
  auVar33._24_4_ = fVar256 * auVar156._24_4_;
  auVar33._28_4_ = auVar156._28_4_;
  auVar263 = vpminsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar209 = vpminsd_avx(auVar154,auVar218);
  auVar308._16_16_ = auVar263;
  auVar308._0_16_ = auVar209;
  auVar201 = auVar25._16_16_;
  auVar322 = ZEXT1664(auVar201);
  auVar263 = vpminsd_avx(auVar27._16_16_,auVar201);
  auVar209 = vpminsd_avx(auVar283,auVar179);
  auVar345._16_16_ = auVar263;
  auVar345._0_16_ = auVar209;
  auVar156 = vmaxps_avx(auVar308,auVar345);
  auVar263 = vpminsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar209 = vpminsd_avx(auVar262,auVar205);
  auVar355._16_16_ = auVar263;
  auVar355._0_16_ = auVar209;
  uVar8 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar364._4_4_ = uVar8;
  auVar364._0_4_ = uVar8;
  auVar364._8_4_ = uVar8;
  auVar364._12_4_ = uVar8;
  auVar364._16_4_ = uVar8;
  auVar364._20_4_ = uVar8;
  auVar364._24_4_ = uVar8;
  auVar364._28_4_ = uVar8;
  auVar25 = vmaxps_avx(auVar355,auVar364);
  auVar156 = vmaxps_avx(auVar156,auVar25);
  auVar359 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                CONCAT424(0x3f7ffffa,
                                          CONCAT420(0x3f7ffffa,
                                                    CONCAT416(0x3f7ffffa,
                                                              CONCAT412(0x3f7ffffa,
                                                                        CONCAT48(0x3f7ffffa,
                                                                                 0x3f7ffffa3f7ffffa)
                                                                       ))))));
  local_80._4_4_ = auVar156._4_4_ * 0.99999964;
  local_80._0_4_ = auVar156._0_4_ * 0.99999964;
  local_80._8_4_ = auVar156._8_4_ * 0.99999964;
  local_80._12_4_ = auVar156._12_4_ * 0.99999964;
  local_80._16_4_ = auVar156._16_4_ * 0.99999964;
  local_80._20_4_ = auVar156._20_4_ * 0.99999964;
  local_80._24_4_ = auVar156._24_4_ * 0.99999964;
  local_80._28_4_ = auVar156._28_4_;
  auVar263 = vpmaxsd_avx(auVar26._16_16_,auVar31._16_16_);
  auVar209 = vpmaxsd_avx(auVar154,auVar218);
  auVar158._16_16_ = auVar263;
  auVar158._0_16_ = auVar209;
  auVar263 = vpmaxsd_avx(auVar27._16_16_,auVar201);
  auVar209 = vpmaxsd_avx(auVar283,auVar179);
  auVar182._16_16_ = auVar263;
  auVar182._0_16_ = auVar209;
  auVar156 = vminps_avx(auVar158,auVar182);
  auVar263 = vpmaxsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar209 = vpmaxsd_avx(auVar262,auVar205);
  fVar217 = (ray->super_RayK<1>).tfar;
  auVar223._4_4_ = fVar217;
  auVar223._0_4_ = fVar217;
  auVar223._8_4_ = fVar217;
  auVar223._12_4_ = fVar217;
  auVar223._16_4_ = fVar217;
  auVar223._20_4_ = fVar217;
  auVar223._24_4_ = fVar217;
  auVar223._28_4_ = fVar217;
  auVar183._16_16_ = auVar263;
  auVar183._0_16_ = auVar209;
  auVar25 = vminps_avx(auVar183,auVar223);
  auVar156 = vminps_avx(auVar156,auVar25);
  auVar24._4_4_ = auVar156._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar156._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar156._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar156._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar156._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar156._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar156._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar156._28_4_;
  auVar156 = vcmpps_avx(local_80,auVar24,2);
  auVar263 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar184._16_16_ = auVar263;
  auVar184._0_16_ = auVar263;
  auVar25 = vcvtdq2ps_avx(auVar184);
  auVar25 = vcmpps_avx(_DAT_02020f40,auVar25,1);
  auVar156 = vandps_avx(auVar156,auVar25);
  uVar144 = vmovmskps_avx(auVar156);
  if (uVar144 != 0) {
    local_540 = mm_lookupmask_ps._16_8_;
    uStack_538 = mm_lookupmask_ps._24_8_;
    uStack_530 = mm_lookupmask_ps._16_8_;
    uStack_528 = mm_lookupmask_ps._24_8_;
    uVar144 = uVar144 & 0xff;
    do {
      uVar150 = (ulong)uVar144;
      local_760 = auVar322._0_32_;
      local_740 = auVar359._0_32_;
      lVar147 = 0;
      if (uVar150 != 0) {
        for (; (uVar144 >> lVar147 & 1) == 0; lVar147 = lVar147 + 1) {
        }
      }
      uVar150 = uVar150 - 1 & uVar150;
      uVar144 = *(uint *)(prim + 2);
      uVar146 = *(uint *)(prim + lVar147 * 4 + 6);
      local_7f0 = (ulong)uVar144;
      pGVar21 = (context->scene->geometries).items[uVar144].ptr;
      local_7e8 = (ulong)uVar146;
      uVar148 = (ulong)*(uint *)(*(long *)&pGVar21->field_0x58 +
                                pGVar21[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i * (ulong)uVar146);
      p_Var22 = pGVar21[1].intersectionFilterN;
      lVar147 = *(long *)&pGVar21[1].time_range.upper;
      _local_820 = *(undefined1 (*) [16])(lVar147 + (long)p_Var22 * uVar148);
      _local_710 = *(undefined1 (*) [16])(lVar147 + (uVar148 + 1) * (long)p_Var22);
      _local_660 = *(undefined1 (*) [16])(lVar147 + (uVar148 + 2) * (long)p_Var22);
      lVar151 = 0;
      if (uVar150 != 0) {
        for (; (uVar150 >> lVar151 & 1) == 0; lVar151 = lVar151 + 1) {
        }
      }
      _local_550 = *(undefined1 (*) [16])(lVar147 + (uVar148 + 3) * (long)p_Var22);
      if (((uVar150 != 0) && (uVar148 = uVar150 - 1 & uVar150, uVar148 != 0)) &&
         (lVar147 = 0, uVar148 != 0)) {
        for (; (uVar148 >> lVar147 & 1) == 0; lVar147 = lVar147 + 1) {
        }
      }
      uVar20 = (uint)pGVar21[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar10 = (ray->super_RayK<1>).org.field_0;
      auVar201 = vsubps_avx(_local_820,(undefined1  [16])aVar10);
      auVar14 = _local_820;
      auVar263 = vshufps_avx(auVar201,auVar201,0);
      auVar209 = vshufps_avx(auVar201,auVar201,0x55);
      auVar201 = vshufps_avx(auVar201,auVar201,0xaa);
      fVar217 = (pre->ray_space).vx.field_0.m128[0];
      fVar230 = (pre->ray_space).vx.field_0.m128[1];
      fVar232 = (pre->ray_space).vx.field_0.m128[2];
      fVar234 = (pre->ray_space).vx.field_0.m128[3];
      fVar236 = (pre->ray_space).vy.field_0.m128[0];
      fVar238 = (pre->ray_space).vy.field_0.m128[1];
      fVar241 = (pre->ray_space).vy.field_0.m128[2];
      fVar244 = (pre->ray_space).vy.field_0.m128[3];
      fVar251 = (pre->ray_space).vz.field_0.m128[0];
      fVar252 = (pre->ray_space).vz.field_0.m128[1];
      fVar253 = (pre->ray_space).vz.field_0.m128[2];
      fVar254 = (pre->ray_space).vz.field_0.m128[3];
      auVar180._0_4_ =
           auVar263._0_4_ * fVar217 + auVar201._0_4_ * fVar251 + auVar209._0_4_ * fVar236;
      auVar180._4_4_ =
           auVar263._4_4_ * fVar230 + auVar201._4_4_ * fVar252 + auVar209._4_4_ * fVar238;
      auVar180._8_4_ =
           auVar263._8_4_ * fVar232 + auVar201._8_4_ * fVar253 + auVar209._8_4_ * fVar241;
      auVar180._12_4_ =
           auVar263._12_4_ * fVar234 + auVar201._12_4_ * fVar254 + auVar209._12_4_ * fVar244;
      auVar263 = vblendps_avx(auVar180,_local_820,8);
      auVar220 = vsubps_avx(_local_710,(undefined1  [16])aVar10);
      auVar209 = vshufps_avx(auVar220,auVar220,0);
      auVar201 = vshufps_avx(auVar220,auVar220,0x55);
      auVar220 = vshufps_avx(auVar220,auVar220,0xaa);
      auVar354._0_4_ =
           auVar209._0_4_ * fVar217 + auVar201._0_4_ * fVar236 + auVar220._0_4_ * fVar251;
      auVar354._4_4_ =
           auVar209._4_4_ * fVar230 + auVar201._4_4_ * fVar238 + auVar220._4_4_ * fVar252;
      auVar354._8_4_ =
           auVar209._8_4_ * fVar232 + auVar201._8_4_ * fVar241 + auVar220._8_4_ * fVar253;
      auVar354._12_4_ =
           auVar209._12_4_ * fVar234 + auVar201._12_4_ * fVar244 + auVar220._12_4_ * fVar254;
      auVar209 = vblendps_avx(auVar354,_local_710,8);
      auVar11 = vsubps_avx(_local_660,(undefined1  [16])aVar10);
      auVar201 = vshufps_avx(auVar11,auVar11,0);
      auVar220 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar306._0_4_ = auVar201._0_4_ * fVar217 + auVar220._0_4_ * fVar236 + auVar11._0_4_ * fVar251
      ;
      auVar306._4_4_ = auVar201._4_4_ * fVar230 + auVar220._4_4_ * fVar238 + auVar11._4_4_ * fVar252
      ;
      auVar306._8_4_ = auVar201._8_4_ * fVar232 + auVar220._8_4_ * fVar241 + auVar11._8_4_ * fVar253
      ;
      auVar306._12_4_ =
           auVar201._12_4_ * fVar234 + auVar220._12_4_ * fVar244 + auVar11._12_4_ * fVar254;
      auVar12 = vshufps_avx(_local_660,_local_660,0xff);
      auVar201 = vblendps_avx(auVar306,_local_660,8);
      auVar13 = vsubps_avx(_local_550,(undefined1  [16])aVar10);
      auVar220 = vshufps_avx(auVar13,auVar13,0);
      auVar11 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar316._0_4_ = auVar220._0_4_ * fVar217 + auVar13._0_4_ * fVar251 + auVar11._0_4_ * fVar236;
      auVar316._4_4_ = auVar220._4_4_ * fVar230 + auVar13._4_4_ * fVar252 + auVar11._4_4_ * fVar238;
      auVar316._8_4_ = auVar220._8_4_ * fVar232 + auVar13._8_4_ * fVar253 + auVar11._8_4_ * fVar241;
      auVar316._12_4_ =
           auVar220._12_4_ * fVar234 + auVar13._12_4_ * fVar254 + auVar11._12_4_ * fVar244;
      auVar13 = vshufps_avx(_local_550,_local_550,0xff);
      auVar220 = vblendps_avx(auVar316,_local_550,8);
      auVar245._8_4_ = 0x7fffffff;
      auVar245._0_8_ = 0x7fffffff7fffffff;
      auVar245._12_4_ = 0x7fffffff;
      auVar263 = vandps_avx(auVar263,auVar245);
      auVar209 = vandps_avx(auVar209,auVar245);
      auVar11 = vmaxps_avx(auVar263,auVar209);
      auVar263 = vandps_avx(auVar201,auVar245);
      auVar209 = vandps_avx(auVar220,auVar245);
      auVar263 = vmaxps_avx(auVar263,auVar209);
      auVar263 = vmaxps_avx(auVar11,auVar263);
      auVar209 = vmovshdup_avx(auVar263);
      auVar209 = vmaxss_avx(auVar209,auVar263);
      auVar263 = vshufpd_avx(auVar263,auVar263,1);
      auVar263 = vmaxss_avx(auVar263,auVar209);
      lVar147 = (long)(int)uVar20 * 0x44;
      fVar338 = *(float *)(bezier_basis0 + lVar147 + 0x908);
      fVar243 = *(float *)(bezier_basis0 + lVar147 + 0x90c);
      fVar341 = *(float *)(bezier_basis0 + lVar147 + 0x910);
      fVar152 = *(float *)(bezier_basis0 + lVar147 + 0x914);
      fVar169 = *(float *)(bezier_basis0 + lVar147 + 0x918);
      fVar171 = *(float *)(bezier_basis0 + lVar147 + 0x91c);
      fVar153 = *(float *)(bezier_basis0 + lVar147 + 0x920);
      auVar209 = vshufps_avx(auVar306,auVar306,0);
      register0x00001390 = auVar209;
      _local_4a0 = auVar209;
      auVar201 = vshufps_avx(auVar306,auVar306,0x55);
      register0x00001350 = auVar201;
      _local_400 = auVar201;
      register0x00001410 = auVar12;
      _local_160 = auVar12;
      fVar170 = *(float *)(bezier_basis0 + lVar147 + 0xd8c);
      fVar172 = *(float *)(bezier_basis0 + lVar147 + 0xd90);
      fVar257 = *(float *)(bezier_basis0 + lVar147 + 0xd94);
      fVar295 = *(float *)(bezier_basis0 + lVar147 + 0xd98);
      fVar231 = *(float *)(bezier_basis0 + lVar147 + 0xd9c);
      fVar233 = *(float *)(bezier_basis0 + lVar147 + 0xda0);
      fVar235 = *(float *)(bezier_basis0 + lVar147 + 0xda4);
      auVar220 = vshufps_avx(auVar316,auVar316,0);
      register0x000015d0 = auVar220;
      _local_440 = auVar220;
      auVar11 = vshufps_avx(auVar316,auVar316,0x55);
      register0x00001250 = auVar11;
      _local_520 = auVar11;
      register0x000013d0 = auVar13;
      _local_1a0 = auVar13;
      fVar376 = auVar220._0_4_;
      fVar380 = auVar220._4_4_;
      fVar381 = auVar220._8_4_;
      fVar382 = auVar220._12_4_;
      fVar176 = auVar11._0_4_;
      fVar194 = auVar11._4_4_;
      fVar196 = auVar11._8_4_;
      fVar198 = auVar11._12_4_;
      fVar282 = auVar209._0_4_;
      fVar292 = auVar209._4_4_;
      fVar293 = auVar209._8_4_;
      fVar294 = auVar209._12_4_;
      fVar259 = auVar201._0_4_;
      fVar271 = auVar201._4_4_;
      fVar274 = auVar201._8_4_;
      fVar277 = auVar201._12_4_;
      fVar252 = auVar13._0_4_;
      fVar256 = auVar13._4_4_;
      fVar258 = auVar13._8_4_;
      fVar279 = auVar13._12_4_;
      fVar280 = auVar12._0_4_;
      fVar311 = auVar12._4_4_;
      fVar237 = auVar12._8_4_;
      auVar209 = vshufps_avx(auVar354,auVar354,0);
      register0x00001490 = auVar209;
      _local_6c0 = auVar209;
      local_500 = *(float *)(bezier_basis0 + lVar147 + 0x484);
      fStack_4fc = *(float *)(bezier_basis0 + lVar147 + 0x488);
      fStack_4f8 = *(float *)(bezier_basis0 + lVar147 + 0x48c);
      fStack_4f4 = *(float *)(bezier_basis0 + lVar147 + 0x490);
      fStack_4f0 = *(float *)(bezier_basis0 + lVar147 + 0x494);
      fStack_4ec = *(float *)(bezier_basis0 + lVar147 + 0x498);
      fStack_4e8 = *(float *)(bezier_basis0 + lVar147 + 0x49c);
      fVar332 = auVar209._0_4_;
      fVar337 = auVar209._4_4_;
      fVar339 = auVar209._8_4_;
      fVar340 = auVar209._12_4_;
      auVar201 = vshufps_avx(auVar354,auVar354,0x55);
      register0x00001350 = auVar201;
      _local_6e0 = auVar201;
      fVar260 = auVar201._0_4_;
      fVar272 = auVar201._4_4_;
      fVar275 = auVar201._8_4_;
      fVar278 = auVar201._12_4_;
      auVar13 = _local_710;
      auVar201 = vshufps_avx(_local_710,_local_710,0xff);
      register0x00001590 = auVar201;
      _local_a0 = auVar201;
      fStack_4e4 = (float)*(undefined4 *)(bezier_basis0 + lVar147 + 0x4a0);
      fVar333 = auVar201._0_4_;
      fVar368 = auVar201._4_4_;
      fVar370 = auVar201._8_4_;
      fVar372 = auVar201._12_4_;
      fVar251 = *(float *)(bezier_basis0 + lVar147 + 0x924) + 0.0 + 0.0;
      auVar201 = vshufps_avx(auVar180,auVar180,0);
      local_1e0._16_16_ = auVar201;
      local_1e0._0_16_ = auVar201;
      pauVar1 = (undefined1 (*) [16])(bezier_basis0 + lVar147);
      fVar232 = *(float *)*pauVar1;
      fVar234 = *(float *)(bezier_basis0 + lVar147 + 4);
      fVar236 = *(float *)(bezier_basis0 + lVar147 + 8);
      auVar138 = *(undefined1 (*) [12])*pauVar1;
      fVar204 = *(float *)(bezier_basis0 + lVar147 + 0xc);
      fStack_1f0 = *(float *)(bezier_basis0 + lVar147 + 0x10);
      fStack_1ec = *(float *)(bezier_basis0 + lVar147 + 0x14);
      fStack_1e8 = *(float *)(bezier_basis0 + lVar147 + 0x18);
      fStack_1e4 = *(float *)(bezier_basis0 + lVar147 + 0x1c);
      fVar217 = auVar201._0_4_;
      fVar238 = auVar201._4_4_;
      fVar253 = auVar201._8_4_;
      fVar270 = auVar201._12_4_;
      auVar348._0_4_ =
           fVar232 * fVar217 + fVar332 * local_500 + fVar282 * fVar338 + fVar376 * fVar170;
      auVar348._4_4_ =
           fVar234 * fVar238 + fVar337 * fStack_4fc + fVar292 * fVar243 + fVar380 * fVar172;
      auVar348._8_4_ =
           fVar236 * fVar253 + fVar339 * fStack_4f8 + fVar293 * fVar341 + fVar381 * fVar257;
      auVar348._12_4_ =
           fVar204 * fVar270 + fVar340 * fStack_4f4 + fVar294 * fVar152 + fVar382 * fVar295;
      auVar348._16_4_ =
           fStack_1f0 * fVar217 + fVar332 * fStack_4f0 + fVar282 * fVar169 + fVar376 * fVar231;
      auVar348._20_4_ =
           fStack_1ec * fVar238 + fVar337 * fStack_4ec + fVar292 * fVar171 + fVar380 * fVar233;
      auVar348._24_4_ =
           fStack_1e8 * fVar253 + fVar339 * fStack_4e8 + fVar293 * fVar153 + fVar381 * fVar235;
      auVar348._28_4_ = fVar294 + 0.0;
      auVar201 = vshufps_avx(auVar180,auVar180,0x55);
      register0x00001210 = auVar201;
      _local_180 = auVar201;
      fVar230 = auVar201._0_4_;
      fVar241 = auVar201._4_4_;
      fVar254 = auVar201._8_4_;
      fVar273 = auVar201._12_4_;
      auVar346._0_4_ =
           fVar232 * fVar230 + fVar260 * local_500 + fVar259 * fVar338 + fVar176 * fVar170;
      auVar346._4_4_ =
           fVar234 * fVar241 + fVar272 * fStack_4fc + fVar271 * fVar243 + fVar194 * fVar172;
      auVar346._8_4_ =
           fVar236 * fVar254 + fVar275 * fStack_4f8 + fVar274 * fVar341 + fVar196 * fVar257;
      auVar346._12_4_ =
           fVar204 * fVar273 + fVar278 * fStack_4f4 + fVar277 * fVar152 + fVar198 * fVar295;
      auVar346._16_4_ =
           fStack_1f0 * fVar230 + fVar260 * fStack_4f0 + fVar259 * fVar169 + fVar176 * fVar231;
      auVar346._20_4_ =
           fStack_1ec * fVar241 + fVar272 * fStack_4ec + fVar271 * fVar171 + fVar194 * fVar233;
      auVar346._24_4_ =
           fStack_1e8 * fVar254 + fVar275 * fStack_4e8 + fVar274 * fVar153 + fVar196 * fVar235;
      auVar346._28_4_ = fVar198 + 0.0 + 0.0 + 0.0;
      auVar201 = vpermilps_avx(_local_820,0xff);
      register0x00001450 = auVar201;
      _local_c0 = auVar201;
      _local_200 = *pauVar1;
      auVar15 = _local_200;
      fVar313 = auVar201._0_4_;
      fVar314 = auVar201._4_4_;
      fVar343 = auVar201._8_4_;
      local_7e0 = fVar313 * fVar232 + fVar333 * local_500 + fVar280 * fVar338 + fVar252 * fVar170;
      fStack_7dc = fVar314 * fVar234 + fVar368 * fStack_4fc + fVar311 * fVar243 + fVar256 * fVar172;
      fStack_7d8 = fVar343 * fVar236 + fVar370 * fStack_4f8 + fVar237 * fVar341 + fVar258 * fVar257;
      fStack_7d4 = auVar201._12_4_ * fVar204 +
                   fVar372 * fStack_4f4 + auVar12._12_4_ * fVar152 + fVar279 * fVar295;
      fStack_7d0 = fVar313 * fStack_1f0 +
                   fVar333 * fStack_4f0 + fVar280 * fVar169 + fVar252 * fVar231;
      fStack_7cc = fVar314 * fStack_1ec +
                   fVar368 * fStack_4ec + fVar311 * fVar171 + fVar256 * fVar233;
      fStack_7c8 = fVar343 * fStack_1e8 +
                   fVar370 * fStack_4e8 + fVar237 * fVar153 + fVar258 * fVar235;
      fStack_7c4 = fVar251 + 0.0;
      fVar239 = *(float *)(bezier_basis1 + lVar147 + 0x908);
      fVar242 = *(float *)(bezier_basis1 + lVar147 + 0x90c);
      fVar312 = *(float *)(bezier_basis1 + lVar147 + 0x910);
      fVar173 = *(float *)(bezier_basis1 + lVar147 + 0x914);
      fVar174 = *(float *)(bezier_basis1 + lVar147 + 0x918);
      fVar175 = *(float *)(bezier_basis1 + lVar147 + 0x91c);
      fVar177 = *(float *)(bezier_basis1 + lVar147 + 0x920);
      auVar156 = *(undefined1 (*) [32])(bezier_basis1 + lVar147 + 0xd8c);
      auVar310 = ZEXT3264(auVar156);
      fVar232 = auVar156._0_4_;
      fVar244 = auVar156._4_4_;
      fVar255 = auVar156._8_4_;
      fVar276 = auVar156._12_4_;
      fVar281 = auVar156._16_4_;
      fVar342 = auVar156._20_4_;
      fVar240 = auVar156._24_4_;
      fVar195 = *(float *)(bezier_basis1 + lVar147 + 0x484);
      fVar197 = *(float *)(bezier_basis1 + lVar147 + 0x488);
      fVar199 = *(float *)(bezier_basis1 + lVar147 + 0x48c);
      fVar200 = *(float *)(bezier_basis1 + lVar147 + 0x490);
      fVar202 = *(float *)(bezier_basis1 + lVar147 + 0x494);
      fVar203 = *(float *)(bezier_basis1 + lVar147 + 0x498);
      fVar296 = *(float *)(bezier_basis1 + lVar147 + 0x49c);
      fVar236 = fStack_1e4 + fVar251 + 0.0;
      fVar325 = *(float *)(bezier_basis1 + lVar147);
      fVar327 = *(float *)(bezier_basis1 + lVar147 + 4);
      fVar328 = *(float *)(bezier_basis1 + lVar147 + 8);
      fVar329 = *(float *)(bezier_basis1 + lVar147 + 0xc);
      fVar330 = *(float *)(bezier_basis1 + lVar147 + 0x10);
      fVar374 = *(float *)(bezier_basis1 + lVar147 + 0x14);
      fVar375 = *(float *)(bezier_basis1 + lVar147 + 0x18);
      auVar246._0_4_ = fVar217 * fVar325 + fVar332 * fVar195 + fVar239 * fVar282 + fVar376 * fVar232
      ;
      auVar246._4_4_ = fVar238 * fVar327 + fVar337 * fVar197 + fVar242 * fVar292 + fVar380 * fVar244
      ;
      auVar246._8_4_ = fVar253 * fVar328 + fVar339 * fVar199 + fVar312 * fVar293 + fVar381 * fVar255
      ;
      auVar246._12_4_ =
           fVar270 * fVar329 + fVar340 * fVar200 + fVar173 * fVar294 + fVar382 * fVar276;
      auVar246._16_4_ =
           fVar217 * fVar330 + fVar332 * fVar202 + fVar174 * fVar282 + fVar376 * fVar281;
      auVar246._20_4_ =
           fVar238 * fVar374 + fVar337 * fVar203 + fVar175 * fVar292 + fVar380 * fVar342;
      auVar246._24_4_ =
           fVar253 * fVar375 + fVar339 * fVar296 + fVar177 * fVar293 + fVar381 * fVar240;
      auVar246._28_4_ = fVar372 + fVar236;
      local_4e0._0_4_ =
           fVar230 * fVar325 + fVar260 * fVar195 + fVar239 * fVar259 + fVar232 * fVar176;
      local_4e0._4_4_ =
           fVar241 * fVar327 + fVar272 * fVar197 + fVar242 * fVar271 + fVar244 * fVar194;
      fStack_4d8 = fVar254 * fVar328 + fVar275 * fVar199 + fVar312 * fVar274 + fVar255 * fVar196;
      fStack_4d4 = fVar273 * fVar329 + fVar278 * fVar200 + fVar173 * fVar277 + fVar276 * fVar198;
      fStack_4d0 = fVar230 * fVar330 + fVar260 * fVar202 + fVar174 * fVar259 + fVar281 * fVar176;
      fStack_4cc = fVar241 * fVar374 + fVar272 * fVar203 + fVar175 * fVar271 + fVar342 * fVar194;
      fStack_4c8 = fVar254 * fVar375 + fVar275 * fVar296 + fVar177 * fVar274 + fVar240 * fVar196;
      register0x000012dc = fVar236 + fStack_1e4 + fVar294 + 0.0;
      local_780._0_4_ =
           fVar333 * fVar195 + fVar239 * fVar280 + fVar232 * fVar252 + fVar313 * fVar325;
      local_780._4_4_ =
           fVar368 * fVar197 + fVar242 * fVar311 + fVar244 * fVar256 + fVar314 * fVar327;
      fStack_778 = fVar370 * fVar199 + fVar312 * fVar237 + fVar255 * fVar258 + fVar343 * fVar328;
      fStack_774 = fVar372 * fVar200 + fVar173 * auVar12._12_4_ + fVar276 * fVar279 +
                   auVar201._12_4_ * fVar329;
      register0x000015d0 =
           fVar333 * fVar202 + fVar174 * fVar280 + fVar281 * fVar252 + fVar313 * fVar330;
      register0x000015d4 =
           fVar368 * fVar203 + fVar175 * fVar311 + fVar342 * fVar256 + fVar314 * fVar374;
      register0x000015d8 =
           fVar370 * fVar296 + fVar177 * fVar237 + fVar240 * fVar258 + fVar343 * fVar375;
      register0x000015dc = fStack_1e4 + fVar279 + fVar294 + fVar236;
      local_260 = vsubps_avx(auVar246,auVar348);
      auVar26 = vsubps_avx(_local_4e0,auVar346);
      fVar234 = local_260._0_4_;
      fVar251 = local_260._4_4_;
      auVar34._4_4_ = auVar346._4_4_ * fVar251;
      auVar34._0_4_ = auVar346._0_4_ * fVar234;
      fVar256 = local_260._8_4_;
      auVar34._8_4_ = auVar346._8_4_ * fVar256;
      fVar279 = local_260._12_4_;
      auVar34._12_4_ = auVar346._12_4_ * fVar279;
      fVar311 = local_260._16_4_;
      auVar34._16_4_ = auVar346._16_4_ * fVar311;
      fVar313 = local_260._20_4_;
      auVar34._20_4_ = auVar346._20_4_ * fVar313;
      fVar343 = local_260._24_4_;
      auVar34._24_4_ = auVar346._24_4_ * fVar343;
      auVar34._28_4_ = fVar236;
      fVar236 = auVar26._0_4_;
      fVar252 = auVar26._4_4_;
      auVar35._4_4_ = auVar348._4_4_ * fVar252;
      auVar35._0_4_ = auVar348._0_4_ * fVar236;
      fVar258 = auVar26._8_4_;
      auVar35._8_4_ = auVar348._8_4_ * fVar258;
      fVar280 = auVar26._12_4_;
      auVar35._12_4_ = auVar348._12_4_ * fVar280;
      fVar237 = auVar26._16_4_;
      auVar35._16_4_ = auVar348._16_4_ * fVar237;
      fVar314 = auVar26._20_4_;
      auVar35._20_4_ = auVar348._20_4_ * fVar314;
      fVar333 = auVar26._24_4_;
      auVar35._24_4_ = auVar348._24_4_ * fVar333;
      auVar35._28_4_ = register0x000012dc;
      auVar25 = vsubps_avx(auVar34,auVar35);
      auVar128._4_4_ = fStack_7dc;
      auVar128._0_4_ = local_7e0;
      auVar128._8_4_ = fStack_7d8;
      auVar128._12_4_ = fStack_7d4;
      auVar128._16_4_ = fStack_7d0;
      auVar128._20_4_ = fStack_7cc;
      auVar128._24_4_ = fStack_7c8;
      auVar128._28_4_ = fStack_7c4;
      auVar156 = vmaxps_avx(auVar128,_local_780);
      auVar36._4_4_ = auVar156._4_4_ * auVar156._4_4_ * (fVar251 * fVar251 + fVar252 * fVar252);
      auVar36._0_4_ = auVar156._0_4_ * auVar156._0_4_ * (fVar234 * fVar234 + fVar236 * fVar236);
      auVar36._8_4_ = auVar156._8_4_ * auVar156._8_4_ * (fVar256 * fVar256 + fVar258 * fVar258);
      auVar36._12_4_ = auVar156._12_4_ * auVar156._12_4_ * (fVar279 * fVar279 + fVar280 * fVar280);
      auVar36._16_4_ = auVar156._16_4_ * auVar156._16_4_ * (fVar311 * fVar311 + fVar237 * fVar237);
      auVar36._20_4_ = auVar156._20_4_ * auVar156._20_4_ * (fVar313 * fVar313 + fVar314 * fVar314);
      auVar36._24_4_ = auVar156._24_4_ * auVar156._24_4_ * (fVar343 * fVar343 + fVar333 * fVar333);
      auVar36._28_4_ = auVar26._28_4_ + register0x000012dc;
      auVar37._4_4_ = auVar25._4_4_ * auVar25._4_4_;
      auVar37._0_4_ = auVar25._0_4_ * auVar25._0_4_;
      auVar37._8_4_ = auVar25._8_4_ * auVar25._8_4_;
      auVar37._12_4_ = auVar25._12_4_ * auVar25._12_4_;
      auVar37._16_4_ = auVar25._16_4_ * auVar25._16_4_;
      auVar37._20_4_ = auVar25._20_4_ * auVar25._20_4_;
      auVar37._24_4_ = auVar25._24_4_ * auVar25._24_4_;
      auVar37._28_4_ = auVar25._28_4_;
      auVar156 = vcmpps_avx(auVar37,auVar36,2);
      auVar219._0_4_ = (float)(int)uVar20;
      auVar219._4_12_ = auVar209._4_12_;
      local_460._0_16_ = auVar219;
      auVar209 = vshufps_avx(auVar219,auVar219,0);
      auVar224._16_16_ = auVar209;
      auVar224._0_16_ = auVar209;
      auVar25 = vcmpps_avx(_DAT_02020f40,auVar224,1);
      auVar209 = vpermilps_avx(auVar180,0xaa);
      register0x00001450 = auVar209;
      _local_1c0 = auVar209;
      auVar201 = vpermilps_avx(auVar354,0xaa);
      register0x00001550 = auVar201;
      _local_420 = auVar201;
      auVar220 = vpermilps_avx(auVar306,0xaa);
      register0x00001590 = auVar220;
      _local_e0 = auVar220;
      auVar11 = vpermilps_avx(auVar316,0xaa);
      register0x00001310 = auVar11;
      _local_4c0 = auVar11;
      auVar27 = auVar25 & auVar156;
      _local_620 = ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]);
      auVar263 = ZEXT416((uint)(auVar263._0_4_ * 4.7683716e-07));
      local_680._0_16_ = auVar263;
      fVar234 = fVar260;
      fVar236 = fVar272;
      fVar251 = fVar275;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        auVar359 = ZEXT3264(local_740);
        auVar322 = ZEXT3264(local_760);
LAB_011886bb:
        auVar379 = ZEXT3264(_local_6c0);
      }
      else {
        local_220 = vandps_avx(auVar156,auVar25);
        fVar315 = auVar209._0_4_;
        fVar323 = auVar209._4_4_;
        fVar324 = auVar209._8_4_;
        fVar326 = auVar209._12_4_;
        fVar353 = auVar201._0_4_;
        fVar360 = auVar201._4_4_;
        fVar361 = auVar201._8_4_;
        fVar362 = auVar201._12_4_;
        fVar363 = auVar220._0_4_;
        fVar369 = auVar220._4_4_;
        fVar371 = auVar220._8_4_;
        fVar373 = auVar220._12_4_;
        fVar252 = auVar11._0_4_;
        fVar256 = auVar11._4_4_;
        fVar258 = auVar11._8_4_;
        fVar279 = auVar11._12_4_;
        fVar280 = auVar25._28_4_ + *(float *)(bezier_basis1 + lVar147 + 0x924) + 0.0;
        local_240 = fVar315 * fVar325 + fVar353 * fVar195 + fVar363 * fVar239 + fVar232 * fVar252;
        fStack_23c = fVar323 * fVar327 + fVar360 * fVar197 + fVar369 * fVar242 + fVar244 * fVar256;
        fStack_238 = fVar324 * fVar328 + fVar361 * fVar199 + fVar371 * fVar312 + fVar255 * fVar258;
        fStack_234 = fVar326 * fVar329 + fVar362 * fVar200 + fVar373 * fVar173 + fVar276 * fVar279;
        fStack_230 = fVar315 * fVar330 + fVar353 * fVar202 + fVar363 * fVar174 + fVar281 * fVar252;
        fStack_22c = fVar323 * fVar374 + fVar360 * fVar203 + fVar369 * fVar175 + fVar342 * fVar256;
        fStack_228 = fVar324 * fVar375 + fVar361 * fVar296 + fVar371 * fVar177 + fVar240 * fVar258;
        fStack_224 = local_220._28_4_ + fVar280;
        local_200._0_4_ = auVar138._0_4_;
        local_200._4_4_ = auVar138._4_4_;
        fStack_1f8 = auVar138._8_4_;
        local_5e0 = fVar315 * (float)local_200._0_4_ +
                    fVar353 * local_500 + fVar363 * fVar338 + fVar252 * fVar170;
        fStack_5dc = fVar323 * (float)local_200._4_4_ +
                     fVar360 * fStack_4fc + fVar369 * fVar243 + fVar256 * fVar172;
        fStack_5d8 = fVar324 * fStack_1f8 +
                     fVar361 * fStack_4f8 + fVar371 * fVar341 + fVar258 * fVar257;
        fStack_5d4 = fVar326 * fVar204 +
                     fVar362 * fStack_4f4 + fVar373 * fVar152 + fVar279 * fVar295;
        fStack_5d0 = fVar315 * fStack_1f0 +
                     fVar353 * fStack_4f0 + fVar363 * fVar169 + fVar252 * fVar231;
        fStack_5cc = fVar323 * fStack_1ec +
                     fVar360 * fStack_4ec + fVar369 * fVar171 + fVar256 * fVar233;
        fStack_5c8 = fVar324 * fStack_1e8 +
                     fVar361 * fStack_4e8 + fVar371 * fVar153 + fVar258 * fVar235;
        fStack_5c4 = fStack_224 + fVar280 + local_220._28_4_ + auVar25._28_4_;
        fVar232 = *(float *)(bezier_basis0 + lVar147 + 0x1210);
        fVar244 = *(float *)(bezier_basis0 + lVar147 + 0x1214);
        fVar255 = *(float *)(bezier_basis0 + lVar147 + 0x1218);
        fVar276 = *(float *)(bezier_basis0 + lVar147 + 0x121c);
        fVar280 = *(float *)(bezier_basis0 + lVar147 + 0x1220);
        fVar281 = *(float *)(bezier_basis0 + lVar147 + 0x1224);
        fVar311 = *(float *)(bezier_basis0 + lVar147 + 0x1228);
        fVar237 = *(float *)(bezier_basis0 + lVar147 + 0x1694);
        fVar342 = *(float *)(bezier_basis0 + lVar147 + 0x1698);
        fVar313 = *(float *)(bezier_basis0 + lVar147 + 0x169c);
        fVar314 = *(float *)(bezier_basis0 + lVar147 + 0x16a0);
        fVar240 = *(float *)(bezier_basis0 + lVar147 + 0x16a4);
        fVar343 = *(float *)(bezier_basis0 + lVar147 + 0x16a8);
        fVar333 = *(float *)(bezier_basis0 + lVar147 + 0x16ac);
        fVar338 = *(float *)(bezier_basis0 + lVar147 + 0x1b18);
        fVar243 = *(float *)(bezier_basis0 + lVar147 + 0x1b1c);
        fVar341 = *(float *)(bezier_basis0 + lVar147 + 0x1b20);
        fVar152 = *(float *)(bezier_basis0 + lVar147 + 0x1b24);
        fVar169 = *(float *)(bezier_basis0 + lVar147 + 0x1b28);
        fVar171 = *(float *)(bezier_basis0 + lVar147 + 0x1b2c);
        fVar153 = *(float *)(bezier_basis0 + lVar147 + 0x1b30);
        fVar170 = *(float *)(bezier_basis0 + lVar147 + 0x1f9c);
        fVar172 = *(float *)(bezier_basis0 + lVar147 + 0x1fa0);
        fVar257 = *(float *)(bezier_basis0 + lVar147 + 0x1fa4);
        fVar295 = *(float *)(bezier_basis0 + lVar147 + 0x1fa8);
        fVar231 = *(float *)(bezier_basis0 + lVar147 + 0x1fac);
        fVar233 = *(float *)(bezier_basis0 + lVar147 + 0x1fb0);
        fVar235 = *(float *)(bezier_basis0 + lVar147 + 0x1fb4);
        fVar204 = *(float *)(bezier_basis0 + lVar147 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar147 + 0x1fb8);
        fVar331 = *(float *)(bezier_basis0 + lVar147 + 0x16b0) + fVar204;
        auVar185._0_4_ =
             fVar230 * fVar232 + fVar259 * fVar338 + fVar176 * fVar170 + fVar260 * fVar237;
        auVar185._4_4_ =
             fVar241 * fVar244 + fVar271 * fVar243 + fVar194 * fVar172 + fVar272 * fVar342;
        auVar185._8_4_ =
             fVar254 * fVar255 + fVar274 * fVar341 + fVar196 * fVar257 + fVar275 * fVar313;
        auVar185._12_4_ =
             fVar273 * fVar276 + fVar277 * fVar152 + fVar198 * fVar295 + fVar278 * fVar314;
        auVar185._16_4_ =
             fVar230 * fVar280 + fVar259 * fVar169 + fVar176 * fVar231 + fVar260 * fVar240;
        auVar185._20_4_ =
             fVar241 * fVar281 + fVar271 * fVar171 + fVar194 * fVar233 + fVar272 * fVar343;
        auVar185._24_4_ =
             fVar254 * fVar311 + fVar274 * fVar153 + fVar196 * fVar235 + fVar275 * fVar333;
        auVar185._28_4_ =
             fVar204 + fVar326 + *(float *)(bezier_basis1 + lVar147 + 0x1c) +
                       fVar326 + *(float *)(bezier_basis1 + lVar147 + 0x4a0);
        auVar287._0_4_ =
             fVar353 * fVar237 + fVar363 * fVar338 + fVar252 * fVar170 + fVar315 * fVar232;
        auVar287._4_4_ =
             fVar360 * fVar342 + fVar369 * fVar243 + fVar256 * fVar172 + fVar323 * fVar244;
        auVar287._8_4_ =
             fVar361 * fVar313 + fVar371 * fVar341 + fVar258 * fVar257 + fVar324 * fVar255;
        auVar287._12_4_ =
             fVar362 * fVar314 + fVar373 * fVar152 + fVar279 * fVar295 + fVar326 * fVar276;
        auVar287._16_4_ =
             fVar353 * fVar240 + fVar363 * fVar169 + fVar252 * fVar231 + fVar315 * fVar280;
        auVar287._20_4_ =
             fVar360 * fVar343 + fVar369 * fVar171 + fVar256 * fVar233 + fVar323 * fVar281;
        auVar287._24_4_ =
             fVar361 * fVar333 + fVar371 * fVar153 + fVar258 * fVar235 + fVar324 * fVar311;
        auVar287._28_4_ = fVar331 + *(float *)(bezier_basis0 + lVar147 + 0x122c);
        fVar204 = *(float *)(bezier_basis1 + lVar147 + 0x1b18);
        fVar239 = *(float *)(bezier_basis1 + lVar147 + 0x1b1c);
        fVar242 = *(float *)(bezier_basis1 + lVar147 + 0x1b20);
        fVar312 = *(float *)(bezier_basis1 + lVar147 + 0x1b24);
        fVar173 = *(float *)(bezier_basis1 + lVar147 + 0x1b28);
        fVar174 = *(float *)(bezier_basis1 + lVar147 + 0x1b2c);
        fVar175 = *(float *)(bezier_basis1 + lVar147 + 0x1b30);
        fVar177 = *(float *)(bezier_basis1 + lVar147 + 0x1f9c);
        fVar195 = *(float *)(bezier_basis1 + lVar147 + 0x1fa0);
        fVar197 = *(float *)(bezier_basis1 + lVar147 + 0x1fa4);
        fVar199 = *(float *)(bezier_basis1 + lVar147 + 0x1fa8);
        fVar200 = *(float *)(bezier_basis1 + lVar147 + 0x1fac);
        fVar202 = *(float *)(bezier_basis1 + lVar147 + 0x1fb0);
        fVar203 = *(float *)(bezier_basis1 + lVar147 + 0x1fb4);
        fVar296 = *(float *)(bezier_basis1 + lVar147 + 0x1694);
        fVar325 = *(float *)(bezier_basis1 + lVar147 + 0x1698);
        fVar327 = *(float *)(bezier_basis1 + lVar147 + 0x169c);
        fVar328 = *(float *)(bezier_basis1 + lVar147 + 0x16a0);
        fVar329 = *(float *)(bezier_basis1 + lVar147 + 0x16a4);
        fVar330 = *(float *)(bezier_basis1 + lVar147 + 0x16a8);
        fVar374 = *(float *)(bezier_basis1 + lVar147 + 0x16ac);
        fVar375 = *(float *)(bezier_basis1 + lVar147 + 0x1210);
        fVar368 = *(float *)(bezier_basis1 + lVar147 + 0x1214);
        fVar370 = *(float *)(bezier_basis1 + lVar147 + 0x1218);
        fVar372 = *(float *)(bezier_basis1 + lVar147 + 0x121c);
        fVar125 = *(float *)(bezier_basis1 + lVar147 + 0x1220);
        fVar126 = *(float *)(bezier_basis1 + lVar147 + 0x1224);
        fVar127 = *(float *)(bezier_basis1 + lVar147 + 0x1228);
        auVar303._0_4_ =
             fVar217 * fVar375 + fVar332 * fVar296 + fVar282 * fVar204 + fVar376 * fVar177;
        auVar303._4_4_ =
             fVar238 * fVar368 + fVar337 * fVar325 + fVar292 * fVar239 + fVar380 * fVar195;
        auVar303._8_4_ =
             fVar253 * fVar370 + fVar339 * fVar327 + fVar293 * fVar242 + fVar381 * fVar197;
        auVar303._12_4_ =
             fVar270 * fVar372 + fVar340 * fVar328 + fVar294 * fVar312 + fVar382 * fVar199;
        auVar303._16_4_ =
             fVar217 * fVar125 + fVar332 * fVar329 + fVar282 * fVar173 + fVar376 * fVar200;
        auVar303._20_4_ =
             fVar238 * fVar126 + fVar337 * fVar330 + fVar292 * fVar174 + fVar380 * fVar202;
        auVar303._24_4_ =
             fVar253 * fVar127 + fVar339 * fVar374 + fVar293 * fVar175 + fVar381 * fVar203;
        auVar303._28_4_ = fVar277 + fVar277 + fVar331 + fVar382;
        auVar318._0_4_ =
             fVar230 * fVar375 + fVar260 * fVar296 + fVar259 * fVar204 + fVar176 * fVar177;
        auVar318._4_4_ =
             fVar241 * fVar368 + fVar272 * fVar325 + fVar271 * fVar239 + fVar194 * fVar195;
        auVar318._8_4_ =
             fVar254 * fVar370 + fVar275 * fVar327 + fVar274 * fVar242 + fVar196 * fVar197;
        auVar318._12_4_ =
             fVar273 * fVar372 + fVar278 * fVar328 + fVar277 * fVar312 + fVar198 * fVar199;
        auVar318._16_4_ =
             fVar230 * fVar125 + fVar260 * fVar329 + fVar259 * fVar173 + fVar176 * fVar200;
        auVar318._20_4_ =
             fVar241 * fVar126 + fVar272 * fVar330 + fVar271 * fVar174 + fVar194 * fVar202;
        auVar318._24_4_ =
             fVar254 * fVar127 + fVar275 * fVar374 + fVar274 * fVar175 + fVar196 * fVar203;
        auVar318._28_4_ = fVar277 + fVar277 + fVar277 + fVar331;
        auVar216._0_4_ =
             fVar315 * fVar375 + fVar353 * fVar296 + fVar363 * fVar204 + fVar177 * fVar252;
        auVar216._4_4_ =
             fVar323 * fVar368 + fVar360 * fVar325 + fVar369 * fVar239 + fVar195 * fVar256;
        auVar216._8_4_ =
             fVar324 * fVar370 + fVar361 * fVar327 + fVar371 * fVar242 + fVar197 * fVar258;
        auVar216._12_4_ =
             fVar326 * fVar372 + fVar362 * fVar328 + fVar373 * fVar312 + fVar199 * fVar279;
        auVar216._16_4_ =
             fVar315 * fVar125 + fVar353 * fVar329 + fVar363 * fVar173 + fVar200 * fVar252;
        auVar216._20_4_ =
             fVar323 * fVar126 + fVar360 * fVar330 + fVar369 * fVar174 + fVar202 * fVar256;
        auVar216._24_4_ =
             fVar324 * fVar127 + fVar361 * fVar374 + fVar371 * fVar175 + fVar203 * fVar258;
        auVar216._28_4_ =
             *(float *)(bezier_basis1 + lVar147 + 0x122c) +
             *(float *)(bezier_basis1 + lVar147 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar147 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar147 + 0x1fb8);
        auVar247._8_4_ = 0x7fffffff;
        auVar247._0_8_ = 0x7fffffff7fffffff;
        auVar247._12_4_ = 0x7fffffff;
        auVar247._16_4_ = 0x7fffffff;
        auVar247._20_4_ = 0x7fffffff;
        auVar247._24_4_ = 0x7fffffff;
        auVar247._28_4_ = 0x7fffffff;
        auVar130._4_4_ =
             fVar238 * fVar244 + fVar337 * fVar342 + fVar292 * fVar243 + fVar380 * fVar172;
        auVar130._0_4_ =
             fVar217 * fVar232 + fVar332 * fVar237 + fVar282 * fVar338 + fVar376 * fVar170;
        auVar130._8_4_ =
             fVar253 * fVar255 + fVar339 * fVar313 + fVar293 * fVar341 + fVar381 * fVar257;
        auVar130._12_4_ =
             fVar270 * fVar276 + fVar340 * fVar314 + fVar294 * fVar152 + fVar382 * fVar295;
        auVar130._16_4_ =
             fVar217 * fVar280 + fVar332 * fVar240 + fVar282 * fVar169 + fVar376 * fVar231;
        auVar130._20_4_ =
             fVar238 * fVar281 + fVar337 * fVar343 + fVar292 * fVar171 + fVar380 * fVar233;
        auVar130._24_4_ =
             fVar253 * fVar311 + fVar339 * fVar333 + fVar293 * fVar153 + fVar381 * fVar235;
        auVar130._28_4_ =
             *(float *)(bezier_basis0 + lVar147 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar147 + 0x1fb8) +
             fVar326 + *(float *)(bezier_basis1 + lVar147 + 0x4a0);
        auVar156 = vandps_avx(auVar130,auVar247);
        auVar25 = vandps_avx(auVar185,auVar247);
        auVar25 = vmaxps_avx(auVar156,auVar25);
        auVar156 = vandps_avx(auVar287,auVar247);
        auVar156 = vmaxps_avx(auVar25,auVar156);
        auVar263 = vpermilps_avx(auVar263,0);
        auVar288._16_16_ = auVar263;
        auVar288._0_16_ = auVar263;
        auVar156 = vcmpps_avx(auVar156,auVar288,1);
        auVar27 = vblendvps_avx(auVar130,local_260,auVar156);
        auVar28 = vblendvps_avx(auVar185,auVar26,auVar156);
        auVar156 = vandps_avx(auVar303,auVar247);
        auVar25 = vandps_avx(auVar318,auVar247);
        auVar29 = vmaxps_avx(auVar156,auVar25);
        auVar156 = vandps_avx(auVar216,auVar247);
        auVar156 = vmaxps_avx(auVar29,auVar156);
        auVar29 = vcmpps_avx(auVar156,auVar288,1);
        auVar156 = vblendvps_avx(auVar303,local_260,auVar29);
        auVar26 = vblendvps_avx(auVar318,auVar26,auVar29);
        fVar152 = auVar27._0_4_;
        fVar169 = auVar27._4_4_;
        fVar171 = auVar27._8_4_;
        fVar153 = auVar27._12_4_;
        fVar170 = auVar27._16_4_;
        fVar172 = auVar27._20_4_;
        fVar257 = auVar27._24_4_;
        fVar295 = auVar156._0_4_;
        fVar231 = auVar156._4_4_;
        fVar233 = auVar156._8_4_;
        fVar235 = auVar156._12_4_;
        fVar204 = auVar156._16_4_;
        fVar239 = auVar156._20_4_;
        fVar242 = auVar156._24_4_;
        fStack_5e4 = -auVar156._28_4_;
        fVar217 = auVar28._0_4_;
        fVar241 = auVar28._4_4_;
        fVar254 = auVar28._8_4_;
        fVar270 = auVar28._12_4_;
        fVar280 = auVar28._16_4_;
        fVar342 = auVar28._20_4_;
        fVar343 = auVar28._24_4_;
        auVar159._0_4_ = fVar217 * fVar217 + fVar152 * fVar152;
        auVar159._4_4_ = fVar241 * fVar241 + fVar169 * fVar169;
        auVar159._8_4_ = fVar254 * fVar254 + fVar171 * fVar171;
        auVar159._12_4_ = fVar270 * fVar270 + fVar153 * fVar153;
        auVar159._16_4_ = fVar280 * fVar280 + fVar170 * fVar170;
        auVar159._20_4_ = fVar342 * fVar342 + fVar172 * fVar172;
        auVar159._24_4_ = fVar343 * fVar343 + fVar257 * fVar257;
        auVar159._28_4_ = auVar318._28_4_ + auVar27._28_4_;
        auVar27 = vrsqrtps_avx(auVar159);
        fVar230 = auVar27._0_4_;
        fVar232 = auVar27._4_4_;
        auVar38._4_4_ = fVar232 * 1.5;
        auVar38._0_4_ = fVar230 * 1.5;
        fVar238 = auVar27._8_4_;
        auVar38._8_4_ = fVar238 * 1.5;
        fVar244 = auVar27._12_4_;
        auVar38._12_4_ = fVar244 * 1.5;
        fVar252 = auVar27._16_4_;
        auVar38._16_4_ = fVar252 * 1.5;
        fVar253 = auVar27._20_4_;
        auVar38._20_4_ = fVar253 * 1.5;
        fVar255 = auVar27._24_4_;
        fVar341 = auVar25._28_4_;
        auVar38._24_4_ = fVar255 * 1.5;
        auVar38._28_4_ = fVar341;
        auVar39._4_4_ = fVar232 * fVar232 * fVar232 * auVar159._4_4_ * 0.5;
        auVar39._0_4_ = fVar230 * fVar230 * fVar230 * auVar159._0_4_ * 0.5;
        auVar39._8_4_ = fVar238 * fVar238 * fVar238 * auVar159._8_4_ * 0.5;
        auVar39._12_4_ = fVar244 * fVar244 * fVar244 * auVar159._12_4_ * 0.5;
        auVar39._16_4_ = fVar252 * fVar252 * fVar252 * auVar159._16_4_ * 0.5;
        auVar39._20_4_ = fVar253 * fVar253 * fVar253 * auVar159._20_4_ * 0.5;
        auVar39._24_4_ = fVar255 * fVar255 * fVar255 * auVar159._24_4_ * 0.5;
        auVar39._28_4_ = auVar159._28_4_;
        auVar25 = vsubps_avx(auVar38,auVar39);
        fVar230 = auVar25._0_4_;
        fVar244 = auVar25._4_4_;
        fVar255 = auVar25._8_4_;
        fVar273 = auVar25._12_4_;
        fVar281 = auVar25._16_4_;
        fVar313 = auVar25._20_4_;
        fVar333 = auVar25._24_4_;
        fVar232 = auVar26._0_4_;
        fVar252 = auVar26._4_4_;
        fVar256 = auVar26._8_4_;
        fVar276 = auVar26._12_4_;
        fVar311 = auVar26._16_4_;
        fVar314 = auVar26._20_4_;
        fVar338 = auVar26._24_4_;
        auVar160._0_4_ = fVar232 * fVar232 + fVar295 * fVar295;
        auVar160._4_4_ = fVar252 * fVar252 + fVar231 * fVar231;
        auVar160._8_4_ = fVar256 * fVar256 + fVar233 * fVar233;
        auVar160._12_4_ = fVar276 * fVar276 + fVar235 * fVar235;
        auVar160._16_4_ = fVar311 * fVar311 + fVar204 * fVar204;
        auVar160._20_4_ = fVar314 * fVar314 + fVar239 * fVar239;
        auVar160._24_4_ = fVar338 * fVar338 + fVar242 * fVar242;
        auVar160._28_4_ = auVar156._28_4_ + auVar25._28_4_;
        auVar156 = vrsqrtps_avx(auVar160);
        fVar238 = auVar156._0_4_;
        fVar253 = auVar156._4_4_;
        auVar40._4_4_ = fVar253 * 1.5;
        auVar40._0_4_ = fVar238 * 1.5;
        fVar258 = auVar156._8_4_;
        auVar40._8_4_ = fVar258 * 1.5;
        fVar279 = auVar156._12_4_;
        auVar40._12_4_ = fVar279 * 1.5;
        fVar237 = auVar156._16_4_;
        auVar40._16_4_ = fVar237 * 1.5;
        fVar240 = auVar156._20_4_;
        auVar40._20_4_ = fVar240 * 1.5;
        fVar243 = auVar156._24_4_;
        auVar40._24_4_ = fVar243 * 1.5;
        auVar40._28_4_ = fVar341;
        auVar41._4_4_ = fVar253 * fVar253 * fVar253 * auVar160._4_4_ * 0.5;
        auVar41._0_4_ = fVar238 * fVar238 * fVar238 * auVar160._0_4_ * 0.5;
        auVar41._8_4_ = fVar258 * fVar258 * fVar258 * auVar160._8_4_ * 0.5;
        auVar41._12_4_ = fVar279 * fVar279 * fVar279 * auVar160._12_4_ * 0.5;
        auVar41._16_4_ = fVar237 * fVar237 * fVar237 * auVar160._16_4_ * 0.5;
        auVar41._20_4_ = fVar240 * fVar240 * fVar240 * auVar160._20_4_ * 0.5;
        auVar41._24_4_ = fVar243 * fVar243 * fVar243 * auVar160._24_4_ * 0.5;
        auVar41._28_4_ = auVar160._28_4_;
        auVar156 = vsubps_avx(auVar40,auVar41);
        fVar238 = auVar156._0_4_;
        fVar253 = auVar156._4_4_;
        fVar258 = auVar156._8_4_;
        fVar279 = auVar156._12_4_;
        fVar237 = auVar156._16_4_;
        fVar240 = auVar156._20_4_;
        fVar243 = auVar156._24_4_;
        local_600 = local_7e0 * fVar217 * fVar230;
        fStack_5fc = fStack_7dc * fVar241 * fVar244;
        auVar42._4_4_ = fStack_5fc;
        auVar42._0_4_ = local_600;
        fStack_5f8 = fStack_7d8 * fVar254 * fVar255;
        auVar42._8_4_ = fStack_5f8;
        fStack_5f4 = fStack_7d4 * fVar270 * fVar273;
        auVar42._12_4_ = fStack_5f4;
        fStack_5f0 = fStack_7d0 * fVar280 * fVar281;
        auVar42._16_4_ = fStack_5f0;
        fStack_5ec = fStack_7cc * fVar342 * fVar313;
        auVar42._20_4_ = fStack_5ec;
        fStack_5e8 = fStack_7c8 * fVar343 * fVar333;
        auVar42._24_4_ = fStack_5e8;
        auVar42._28_4_ = fStack_5e4;
        local_600 = auVar348._0_4_ + local_600;
        fStack_5fc = auVar348._4_4_ + fStack_5fc;
        fStack_5f8 = auVar348._8_4_ + fStack_5f8;
        fStack_5f4 = auVar348._12_4_ + fStack_5f4;
        fStack_5f0 = auVar348._16_4_ + fStack_5f0;
        fStack_5ec = auVar348._20_4_ + fStack_5ec;
        fStack_5e8 = auVar348._24_4_ + fStack_5e8;
        fStack_5e4 = auVar348._28_4_ + fStack_5e4;
        fVar217 = local_7e0 * fVar230 * -fVar152;
        fVar241 = fStack_7dc * fVar244 * -fVar169;
        auVar43._4_4_ = fVar241;
        auVar43._0_4_ = fVar217;
        fVar254 = fStack_7d8 * fVar255 * -fVar171;
        auVar43._8_4_ = fVar254;
        fVar270 = fStack_7d4 * fVar273 * -fVar153;
        auVar43._12_4_ = fVar270;
        fVar280 = fStack_7d0 * fVar281 * -fVar170;
        auVar43._16_4_ = fVar280;
        fVar342 = fStack_7cc * fVar313 * -fVar172;
        auVar43._20_4_ = fVar342;
        fVar343 = fStack_7c8 * fVar333 * -fVar257;
        auVar43._24_4_ = fVar343;
        auVar43._28_4_ = fVar341;
        local_5a0._4_4_ = fVar241 + auVar346._4_4_;
        local_5a0._0_4_ = fVar217 + auVar346._0_4_;
        fStack_598 = fVar254 + auVar346._8_4_;
        fStack_594 = fVar270 + auVar346._12_4_;
        fStack_590 = fVar280 + auVar346._16_4_;
        fStack_58c = fVar342 + auVar346._20_4_;
        fStack_588 = fVar343 + auVar346._24_4_;
        fStack_584 = fVar341 + auVar346._28_4_;
        fVar217 = local_7e0 * fVar230 * 0.0;
        fVar230 = fStack_7dc * fVar244 * 0.0;
        auVar44._4_4_ = fVar230;
        auVar44._0_4_ = fVar217;
        fVar241 = fStack_7d8 * fVar255 * 0.0;
        auVar44._8_4_ = fVar241;
        fVar244 = fStack_7d4 * fVar273 * 0.0;
        auVar44._12_4_ = fVar244;
        fVar254 = fStack_7d0 * fVar281 * 0.0;
        auVar44._16_4_ = fVar254;
        fVar255 = fStack_7cc * fVar313 * 0.0;
        auVar44._20_4_ = fVar255;
        fVar270 = fStack_7c8 * fVar333 * 0.0;
        auVar44._24_4_ = fVar270;
        auVar44._28_4_ = fVar340;
        auVar133._4_4_ = fStack_5dc;
        auVar133._0_4_ = local_5e0;
        auVar133._8_4_ = fStack_5d8;
        auVar133._12_4_ = fStack_5d4;
        auVar133._16_4_ = fStack_5d0;
        auVar133._20_4_ = fStack_5cc;
        auVar133._24_4_ = fStack_5c8;
        auVar133._28_4_ = fStack_5c4;
        auVar289._0_4_ = fVar217 + local_5e0;
        auVar289._4_4_ = fVar230 + fStack_5dc;
        auVar289._8_4_ = fVar241 + fStack_5d8;
        auVar289._12_4_ = fVar244 + fStack_5d4;
        auVar289._16_4_ = fVar254 + fStack_5d0;
        auVar289._20_4_ = fVar255 + fStack_5cc;
        auVar289._24_4_ = fVar270 + fStack_5c8;
        auVar289._28_4_ = fVar340 + fStack_5c4;
        fVar217 = (float)local_780._0_4_ * fVar232 * fVar238;
        fVar230 = (float)local_780._4_4_ * fVar252 * fVar253;
        auVar45._4_4_ = fVar230;
        auVar45._0_4_ = fVar217;
        fVar232 = fStack_778 * fVar256 * fVar258;
        auVar45._8_4_ = fVar232;
        fVar241 = fStack_774 * fVar276 * fVar279;
        auVar45._12_4_ = fVar241;
        fVar244 = register0x000015d0 * fVar311 * fVar237;
        auVar45._16_4_ = fVar244;
        fVar252 = register0x000015d4 * fVar314 * fVar240;
        auVar45._20_4_ = fVar252;
        fVar254 = register0x000015d8 * fVar338 * fVar243;
        auVar45._24_4_ = fVar254;
        auVar45._28_4_ = auVar26._28_4_;
        auVar28 = vsubps_avx(auVar348,auVar42);
        auVar319._0_4_ = auVar246._0_4_ + fVar217;
        auVar319._4_4_ = auVar246._4_4_ + fVar230;
        auVar319._8_4_ = auVar246._8_4_ + fVar232;
        auVar319._12_4_ = auVar246._12_4_ + fVar241;
        auVar319._16_4_ = auVar246._16_4_ + fVar244;
        auVar319._20_4_ = auVar246._20_4_ + fVar252;
        auVar319._24_4_ = auVar246._24_4_ + fVar254;
        auVar319._28_4_ = auVar246._28_4_ + auVar26._28_4_;
        fVar217 = (float)local_780._0_4_ * fVar238 * -fVar295;
        fVar230 = (float)local_780._4_4_ * fVar253 * -fVar231;
        auVar46._4_4_ = fVar230;
        auVar46._0_4_ = fVar217;
        fVar232 = fStack_778 * fVar258 * -fVar233;
        auVar46._8_4_ = fVar232;
        fVar241 = fStack_774 * fVar279 * -fVar235;
        auVar46._12_4_ = fVar241;
        fVar244 = register0x000015d0 * fVar237 * -fVar204;
        auVar46._16_4_ = fVar244;
        fVar252 = register0x000015d4 * fVar240 * -fVar239;
        auVar46._20_4_ = fVar252;
        fVar254 = register0x000015d8 * fVar243 * -fVar242;
        auVar46._24_4_ = fVar254;
        auVar46._28_4_ = fVar362;
        auVar29 = vsubps_avx(auVar346,auVar43);
        auVar335._0_4_ = fVar217 + (float)local_4e0._0_4_;
        auVar335._4_4_ = fVar230 + (float)local_4e0._4_4_;
        auVar335._8_4_ = fVar232 + fStack_4d8;
        auVar335._12_4_ = fVar241 + fStack_4d4;
        auVar335._16_4_ = fVar244 + fStack_4d0;
        auVar335._20_4_ = fVar252 + fStack_4cc;
        auVar335._24_4_ = fVar254 + fStack_4c8;
        auVar335._28_4_ = fVar362 + register0x000012dc;
        fVar217 = (float)local_780._0_4_ * fVar238 * 0.0;
        fVar230 = (float)local_780._4_4_ * fVar253 * 0.0;
        auVar47._4_4_ = fVar230;
        auVar47._0_4_ = fVar217;
        fVar232 = fStack_778 * fVar258 * 0.0;
        auVar47._8_4_ = fVar232;
        fVar238 = fStack_774 * fVar279 * 0.0;
        auVar47._12_4_ = fVar238;
        fVar241 = register0x000015d0 * fVar237 * 0.0;
        auVar47._16_4_ = fVar241;
        fVar244 = register0x000015d4 * fVar240 * 0.0;
        auVar47._20_4_ = fVar244;
        fVar252 = register0x000015d8 * fVar243 * 0.0;
        auVar47._24_4_ = fVar252;
        auVar47._28_4_ = 0x3f000000;
        auVar30 = vsubps_avx(auVar133,auVar44);
        auVar136._4_4_ = fStack_23c;
        auVar136._0_4_ = local_240;
        auVar136._8_4_ = fStack_238;
        auVar136._12_4_ = fStack_234;
        auVar136._16_4_ = fStack_230;
        auVar136._20_4_ = fStack_22c;
        auVar136._24_4_ = fStack_228;
        auVar136._28_4_ = fStack_224;
        auVar365._0_4_ = fVar217 + local_240;
        auVar365._4_4_ = fVar230 + fStack_23c;
        auVar365._8_4_ = fVar232 + fStack_238;
        auVar365._12_4_ = fVar238 + fStack_234;
        auVar365._16_4_ = fVar241 + fStack_230;
        auVar365._20_4_ = fVar244 + fStack_22c;
        auVar365._24_4_ = fVar252 + fStack_228;
        auVar365._28_4_ = fStack_224 + 0.5;
        auVar156 = vsubps_avx(auVar246,auVar45);
        auVar25 = vsubps_avx(_local_4e0,auVar46);
        auVar32 = vsubps_avx(auVar136,auVar47);
        auVar26 = vsubps_avx(auVar335,auVar29);
        auVar27 = vsubps_avx(auVar365,auVar30);
        auVar48._4_4_ = auVar30._4_4_ * auVar26._4_4_;
        auVar48._0_4_ = auVar30._0_4_ * auVar26._0_4_;
        auVar48._8_4_ = auVar30._8_4_ * auVar26._8_4_;
        auVar48._12_4_ = auVar30._12_4_ * auVar26._12_4_;
        auVar48._16_4_ = auVar30._16_4_ * auVar26._16_4_;
        auVar48._20_4_ = auVar30._20_4_ * auVar26._20_4_;
        auVar48._24_4_ = auVar30._24_4_ * auVar26._24_4_;
        auVar48._28_4_ = fVar326;
        auVar49._4_4_ = auVar29._4_4_ * auVar27._4_4_;
        auVar49._0_4_ = auVar29._0_4_ * auVar27._0_4_;
        auVar49._8_4_ = auVar29._8_4_ * auVar27._8_4_;
        auVar49._12_4_ = auVar29._12_4_ * auVar27._12_4_;
        auVar49._16_4_ = auVar29._16_4_ * auVar27._16_4_;
        auVar49._20_4_ = auVar29._20_4_ * auVar27._20_4_;
        auVar49._24_4_ = auVar29._24_4_ * auVar27._24_4_;
        auVar49._28_4_ = register0x000012dc;
        auVar31 = vsubps_avx(auVar49,auVar48);
        auVar50._4_4_ = auVar28._4_4_ * auVar27._4_4_;
        auVar50._0_4_ = auVar28._0_4_ * auVar27._0_4_;
        auVar50._8_4_ = auVar28._8_4_ * auVar27._8_4_;
        auVar50._12_4_ = auVar28._12_4_ * auVar27._12_4_;
        auVar50._16_4_ = auVar28._16_4_ * auVar27._16_4_;
        auVar50._20_4_ = auVar28._20_4_ * auVar27._20_4_;
        auVar50._24_4_ = auVar28._24_4_ * auVar27._24_4_;
        auVar50._28_4_ = auVar27._28_4_;
        auVar33 = vsubps_avx(auVar319,auVar28);
        auVar51._4_4_ = auVar30._4_4_ * auVar33._4_4_;
        auVar51._0_4_ = auVar30._0_4_ * auVar33._0_4_;
        auVar51._8_4_ = auVar30._8_4_ * auVar33._8_4_;
        auVar51._12_4_ = auVar30._12_4_ * auVar33._12_4_;
        auVar51._16_4_ = auVar30._16_4_ * auVar33._16_4_;
        auVar51._20_4_ = auVar30._20_4_ * auVar33._20_4_;
        auVar51._24_4_ = auVar30._24_4_ * auVar33._24_4_;
        auVar51._28_4_ = auVar246._28_4_;
        auVar24 = vsubps_avx(auVar51,auVar50);
        auVar52._4_4_ = auVar33._4_4_ * auVar29._4_4_;
        auVar52._0_4_ = auVar33._0_4_ * auVar29._0_4_;
        auVar52._8_4_ = auVar33._8_4_ * auVar29._8_4_;
        auVar52._12_4_ = auVar33._12_4_ * auVar29._12_4_;
        auVar52._16_4_ = auVar33._16_4_ * auVar29._16_4_;
        auVar52._20_4_ = auVar33._20_4_ * auVar29._20_4_;
        auVar52._24_4_ = auVar33._24_4_ * auVar29._24_4_;
        auVar52._28_4_ = auVar27._28_4_;
        auVar53._4_4_ = auVar28._4_4_ * auVar26._4_4_;
        auVar53._0_4_ = auVar28._0_4_ * auVar26._0_4_;
        auVar53._8_4_ = auVar28._8_4_ * auVar26._8_4_;
        auVar53._12_4_ = auVar28._12_4_ * auVar26._12_4_;
        auVar53._16_4_ = auVar28._16_4_ * auVar26._16_4_;
        auVar53._20_4_ = auVar28._20_4_ * auVar26._20_4_;
        auVar53._24_4_ = auVar28._24_4_ * auVar26._24_4_;
        auVar53._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar53,auVar52);
        auVar161._0_4_ = auVar31._0_4_ * 0.0 + auVar26._0_4_ + auVar24._0_4_ * 0.0;
        auVar161._4_4_ = auVar31._4_4_ * 0.0 + auVar26._4_4_ + auVar24._4_4_ * 0.0;
        auVar161._8_4_ = auVar31._8_4_ * 0.0 + auVar26._8_4_ + auVar24._8_4_ * 0.0;
        auVar161._12_4_ = auVar31._12_4_ * 0.0 + auVar26._12_4_ + auVar24._12_4_ * 0.0;
        auVar161._16_4_ = auVar31._16_4_ * 0.0 + auVar26._16_4_ + auVar24._16_4_ * 0.0;
        auVar161._20_4_ = auVar31._20_4_ * 0.0 + auVar26._20_4_ + auVar24._20_4_ * 0.0;
        auVar161._24_4_ = auVar31._24_4_ * 0.0 + auVar26._24_4_ + auVar24._24_4_ * 0.0;
        auVar161._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar24._28_4_;
        auVar31 = vcmpps_avx(auVar161,ZEXT432(0) << 0x20,2);
        auVar131._4_4_ = fStack_5fc;
        auVar131._0_4_ = local_600;
        auVar131._8_4_ = fStack_5f8;
        auVar131._12_4_ = fStack_5f4;
        auVar131._16_4_ = fStack_5f0;
        auVar131._20_4_ = fStack_5ec;
        auVar131._24_4_ = fStack_5e8;
        auVar131._28_4_ = fStack_5e4;
        _local_700 = vblendvps_avx(auVar156,auVar131,auVar31);
        _local_5c0 = vblendvps_avx(auVar25,_local_5a0,auVar31);
        auVar156 = vblendvps_avx(auVar32,auVar289,auVar31);
        auVar25 = vblendvps_avx(auVar28,auVar319,auVar31);
        auVar26 = vblendvps_avx(auVar29,auVar335,auVar31);
        auVar27 = vblendvps_avx(auVar30,auVar365,auVar31);
        auVar28 = vblendvps_avx(auVar319,auVar28,auVar31);
        auVar29 = vblendvps_avx(auVar335,auVar29,auVar31);
        _local_6a0 = vpackssdw_avx(local_220._0_16_,local_220._16_16_);
        auStack_690 = auVar348._16_16_;
        auVar30 = vblendvps_avx(auVar365,auVar30,auVar31);
        auVar28 = vsubps_avx(auVar28,_local_700);
        auVar33 = vsubps_avx(auVar29,_local_5c0);
        auVar30 = vsubps_avx(auVar30,auVar156);
        auVar24 = vsubps_avx(_local_5c0,auVar26);
        fVar217 = auVar33._0_4_;
        fVar257 = auVar156._0_4_;
        fVar244 = auVar33._4_4_;
        fVar295 = auVar156._4_4_;
        auVar54._4_4_ = fVar295 * fVar244;
        auVar54._0_4_ = fVar257 * fVar217;
        fVar256 = auVar33._8_4_;
        fVar231 = auVar156._8_4_;
        auVar54._8_4_ = fVar231 * fVar256;
        fVar279 = auVar33._12_4_;
        fVar233 = auVar156._12_4_;
        auVar54._12_4_ = fVar233 * fVar279;
        fVar342 = auVar33._16_4_;
        fVar235 = auVar156._16_4_;
        auVar54._16_4_ = fVar235 * fVar342;
        fVar333 = auVar33._20_4_;
        fVar204 = auVar156._20_4_;
        auVar54._20_4_ = fVar204 * fVar333;
        fVar169 = auVar33._24_4_;
        fVar239 = auVar156._24_4_;
        auVar54._24_4_ = fVar239 * fVar169;
        auVar54._28_4_ = auVar29._28_4_;
        fVar230 = local_5c0._0_4_;
        fVar197 = auVar30._0_4_;
        fVar252 = local_5c0._4_4_;
        fVar199 = auVar30._4_4_;
        auVar55._4_4_ = fVar199 * fVar252;
        auVar55._0_4_ = fVar197 * fVar230;
        fVar258 = local_5c0._8_4_;
        fVar200 = auVar30._8_4_;
        auVar55._8_4_ = fVar200 * fVar258;
        fVar280 = local_5c0._12_4_;
        fVar202 = auVar30._12_4_;
        auVar55._12_4_ = fVar202 * fVar280;
        fVar313 = local_5c0._16_4_;
        fVar203 = auVar30._16_4_;
        auVar55._16_4_ = fVar203 * fVar313;
        fVar338 = local_5c0._20_4_;
        fVar296 = auVar30._20_4_;
        auVar55._20_4_ = fVar296 * fVar338;
        fVar171 = local_5c0._24_4_;
        fVar325 = auVar30._24_4_;
        uVar8 = auVar32._28_4_;
        auVar55._24_4_ = fVar325 * fVar171;
        auVar55._28_4_ = uVar8;
        auVar29 = vsubps_avx(auVar55,auVar54);
        fVar232 = local_700._0_4_;
        fVar253 = local_700._4_4_;
        auVar56._4_4_ = fVar199 * fVar253;
        auVar56._0_4_ = fVar197 * fVar232;
        fVar270 = local_700._8_4_;
        auVar56._8_4_ = fVar200 * fVar270;
        fVar281 = local_700._12_4_;
        auVar56._12_4_ = fVar202 * fVar281;
        fVar314 = local_700._16_4_;
        auVar56._16_4_ = fVar203 * fVar314;
        fVar243 = local_700._20_4_;
        auVar56._20_4_ = fVar296 * fVar243;
        fVar153 = local_700._24_4_;
        auVar56._24_4_ = fVar325 * fVar153;
        auVar56._28_4_ = uVar8;
        fVar238 = auVar28._0_4_;
        fVar254 = auVar28._4_4_;
        auVar57._4_4_ = fVar295 * fVar254;
        auVar57._0_4_ = fVar257 * fVar238;
        fVar273 = auVar28._8_4_;
        auVar57._8_4_ = fVar231 * fVar273;
        fVar311 = auVar28._12_4_;
        auVar57._12_4_ = fVar233 * fVar311;
        fVar240 = auVar28._16_4_;
        auVar57._16_4_ = fVar235 * fVar240;
        fVar341 = auVar28._20_4_;
        auVar57._20_4_ = fVar204 * fVar341;
        fVar170 = auVar28._24_4_;
        auVar57._24_4_ = fVar239 * fVar170;
        auVar57._28_4_ = auVar365._28_4_;
        auVar32 = vsubps_avx(auVar57,auVar56);
        auVar58._4_4_ = fVar252 * fVar254;
        auVar58._0_4_ = fVar230 * fVar238;
        auVar58._8_4_ = fVar258 * fVar273;
        auVar58._12_4_ = fVar280 * fVar311;
        auVar58._16_4_ = fVar313 * fVar240;
        auVar58._20_4_ = fVar338 * fVar341;
        auVar58._24_4_ = fVar171 * fVar170;
        auVar58._28_4_ = uVar8;
        auVar377._0_4_ = fVar232 * fVar217;
        auVar377._4_4_ = fVar253 * fVar244;
        auVar377._8_4_ = fVar270 * fVar256;
        auVar377._12_4_ = fVar281 * fVar279;
        auVar377._16_4_ = fVar314 * fVar342;
        auVar377._20_4_ = fVar243 * fVar333;
        auVar377._24_4_ = fVar153 * fVar169;
        auVar377._28_4_ = 0;
        auVar157 = vsubps_avx(auVar377,auVar58);
        auVar158 = vsubps_avx(auVar156,auVar27);
        fVar241 = auVar157._28_4_ + auVar32._28_4_;
        auVar186._0_4_ = auVar157._0_4_ + auVar32._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
        auVar186._4_4_ = auVar157._4_4_ + auVar32._4_4_ * 0.0 + auVar29._4_4_ * 0.0;
        auVar186._8_4_ = auVar157._8_4_ + auVar32._8_4_ * 0.0 + auVar29._8_4_ * 0.0;
        auVar186._12_4_ = auVar157._12_4_ + auVar32._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
        auVar186._16_4_ = auVar157._16_4_ + auVar32._16_4_ * 0.0 + auVar29._16_4_ * 0.0;
        auVar186._20_4_ = auVar157._20_4_ + auVar32._20_4_ * 0.0 + auVar29._20_4_ * 0.0;
        auVar186._24_4_ = auVar157._24_4_ + auVar32._24_4_ * 0.0 + auVar29._24_4_ * 0.0;
        auVar186._28_4_ = fVar241 + auVar29._28_4_;
        fVar242 = auVar24._0_4_;
        fVar312 = auVar24._4_4_;
        auVar59._4_4_ = fVar312 * auVar27._4_4_;
        auVar59._0_4_ = fVar242 * auVar27._0_4_;
        fVar173 = auVar24._8_4_;
        auVar59._8_4_ = fVar173 * auVar27._8_4_;
        fVar174 = auVar24._12_4_;
        auVar59._12_4_ = fVar174 * auVar27._12_4_;
        fVar175 = auVar24._16_4_;
        auVar59._16_4_ = fVar175 * auVar27._16_4_;
        fVar177 = auVar24._20_4_;
        auVar59._20_4_ = fVar177 * auVar27._20_4_;
        fVar195 = auVar24._24_4_;
        auVar59._24_4_ = fVar195 * auVar27._24_4_;
        auVar59._28_4_ = fVar241;
        fVar241 = auVar158._0_4_;
        fVar255 = auVar158._4_4_;
        auVar60._4_4_ = auVar26._4_4_ * fVar255;
        auVar60._0_4_ = auVar26._0_4_ * fVar241;
        fVar276 = auVar158._8_4_;
        auVar60._8_4_ = auVar26._8_4_ * fVar276;
        fVar237 = auVar158._12_4_;
        auVar60._12_4_ = auVar26._12_4_ * fVar237;
        fVar343 = auVar158._16_4_;
        auVar60._16_4_ = auVar26._16_4_ * fVar343;
        fVar152 = auVar158._20_4_;
        auVar60._20_4_ = auVar26._20_4_ * fVar152;
        fVar172 = auVar158._24_4_;
        auVar60._24_4_ = auVar26._24_4_ * fVar172;
        auVar60._28_4_ = auVar157._28_4_;
        auVar32 = vsubps_avx(auVar60,auVar59);
        auVar24 = vsubps_avx(_local_700,auVar25);
        fVar327 = auVar24._0_4_;
        fVar328 = auVar24._4_4_;
        auVar61._4_4_ = fVar328 * auVar27._4_4_;
        auVar61._0_4_ = fVar327 * auVar27._0_4_;
        fVar329 = auVar24._8_4_;
        auVar61._8_4_ = fVar329 * auVar27._8_4_;
        fVar330 = auVar24._12_4_;
        auVar61._12_4_ = fVar330 * auVar27._12_4_;
        fVar374 = auVar24._16_4_;
        auVar61._16_4_ = fVar374 * auVar27._16_4_;
        fVar375 = auVar24._20_4_;
        auVar61._20_4_ = fVar375 * auVar27._20_4_;
        fVar176 = auVar24._24_4_;
        auVar61._24_4_ = fVar176 * auVar27._24_4_;
        auVar61._28_4_ = auVar27._28_4_;
        auVar62._4_4_ = auVar25._4_4_ * fVar255;
        auVar62._0_4_ = auVar25._0_4_ * fVar241;
        auVar62._8_4_ = auVar25._8_4_ * fVar276;
        auVar62._12_4_ = auVar25._12_4_ * fVar237;
        auVar62._16_4_ = auVar25._16_4_ * fVar343;
        auVar62._20_4_ = auVar25._20_4_ * fVar152;
        auVar62._24_4_ = auVar25._24_4_ * fVar172;
        auVar62._28_4_ = auVar29._28_4_;
        auVar29 = vsubps_avx(auVar61,auVar62);
        auVar63._4_4_ = auVar26._4_4_ * fVar328;
        auVar63._0_4_ = auVar26._0_4_ * fVar327;
        auVar63._8_4_ = auVar26._8_4_ * fVar329;
        auVar63._12_4_ = auVar26._12_4_ * fVar330;
        auVar63._16_4_ = auVar26._16_4_ * fVar374;
        auVar63._20_4_ = auVar26._20_4_ * fVar375;
        auVar63._24_4_ = auVar26._24_4_ * fVar176;
        auVar63._28_4_ = auVar27._28_4_;
        auVar64._4_4_ = auVar25._4_4_ * fVar312;
        auVar64._0_4_ = auVar25._0_4_ * fVar242;
        auVar64._8_4_ = auVar25._8_4_ * fVar173;
        auVar64._12_4_ = auVar25._12_4_ * fVar174;
        auVar64._16_4_ = auVar25._16_4_ * fVar175;
        auVar64._20_4_ = auVar25._20_4_ * fVar177;
        auVar64._24_4_ = auVar25._24_4_ * fVar195;
        auVar64._28_4_ = auVar25._28_4_;
        auVar25 = vsubps_avx(auVar64,auVar63);
        auVar248._0_4_ = auVar32._0_4_ * 0.0 + auVar25._0_4_ + auVar29._0_4_ * 0.0;
        auVar248._4_4_ = auVar32._4_4_ * 0.0 + auVar25._4_4_ + auVar29._4_4_ * 0.0;
        auVar248._8_4_ = auVar32._8_4_ * 0.0 + auVar25._8_4_ + auVar29._8_4_ * 0.0;
        auVar248._12_4_ = auVar32._12_4_ * 0.0 + auVar25._12_4_ + auVar29._12_4_ * 0.0;
        auVar248._16_4_ = auVar32._16_4_ * 0.0 + auVar25._16_4_ + auVar29._16_4_ * 0.0;
        auVar248._20_4_ = auVar32._20_4_ * 0.0 + auVar25._20_4_ + auVar29._20_4_ * 0.0;
        auVar248._24_4_ = auVar32._24_4_ * 0.0 + auVar25._24_4_ + auVar29._24_4_ * 0.0;
        auVar248._28_4_ = auVar25._28_4_ + auVar25._28_4_ + auVar29._28_4_;
        auVar25 = vmaxps_avx(auVar186,auVar248);
        auVar25 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,2);
        auVar263 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
        auVar263 = vpand_avx(auVar263,_local_6a0);
        auVar209 = vpmovsxwd_avx(auVar263);
        auVar201 = vpunpckhwd_avx(auVar263,auVar263);
        auVar225._16_16_ = auVar201;
        auVar225._0_16_ = auVar209;
        if ((((((((auVar225 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar225 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar225 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar225 >> 0x7f,0) == '\0') &&
              (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar201 >> 0x3f,0) == '\0') &&
            (auVar225 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar201[0xf]) {
LAB_0118998f:
          auVar268._8_8_ = uStack_538;
          auVar268._0_8_ = local_540;
          auVar268._16_8_ = uStack_530;
          auVar268._24_8_ = uStack_528;
          auVar359 = ZEXT3264(local_740);
          auVar322 = ZEXT3264(local_760);
          auVar310 = ZEXT3264(CONCAT428(fStack_7c4,
                                        CONCAT424(fStack_7c8,
                                                  CONCAT420(fStack_7cc,
                                                            CONCAT416(fStack_7d0,
                                                                      CONCAT412(fStack_7d4,
                                                                                CONCAT48(fStack_7d8,
                                                                                         CONCAT44(
                                                  fStack_7dc,local_7e0))))))));
        }
        else {
          _local_6a0 = auVar186;
          auStack_690 = auVar186._16_16_;
          auVar65._4_4_ = fVar255 * fVar244;
          auVar65._0_4_ = fVar241 * fVar217;
          auVar65._8_4_ = fVar276 * fVar256;
          auVar65._12_4_ = fVar237 * fVar279;
          auVar65._16_4_ = fVar343 * fVar342;
          auVar65._20_4_ = fVar152 * fVar333;
          auVar65._24_4_ = fVar172 * fVar169;
          auVar65._28_4_ = auVar201._12_4_;
          auVar349._0_4_ = fVar242 * fVar197;
          auVar349._4_4_ = fVar312 * fVar199;
          auVar349._8_4_ = fVar173 * fVar200;
          auVar349._12_4_ = fVar174 * fVar202;
          auVar349._16_4_ = fVar175 * fVar203;
          auVar349._20_4_ = fVar177 * fVar296;
          auVar349._24_4_ = fVar195 * fVar325;
          auVar349._28_4_ = 0;
          auVar25 = vsubps_avx(auVar349,auVar65);
          auVar66._4_4_ = fVar328 * fVar199;
          auVar66._0_4_ = fVar327 * fVar197;
          auVar66._8_4_ = fVar329 * fVar200;
          auVar66._12_4_ = fVar330 * fVar202;
          auVar66._16_4_ = fVar374 * fVar203;
          auVar66._20_4_ = fVar375 * fVar296;
          auVar66._24_4_ = fVar176 * fVar325;
          auVar66._28_4_ = auVar30._28_4_;
          auVar67._4_4_ = fVar255 * fVar254;
          auVar67._0_4_ = fVar241 * fVar238;
          auVar67._8_4_ = fVar276 * fVar273;
          auVar67._12_4_ = fVar237 * fVar311;
          auVar67._16_4_ = fVar343 * fVar240;
          auVar67._20_4_ = fVar152 * fVar341;
          auVar67._24_4_ = fVar172 * fVar170;
          auVar67._28_4_ = auVar158._28_4_;
          auVar27 = vsubps_avx(auVar67,auVar66);
          auVar68._4_4_ = fVar312 * fVar254;
          auVar68._0_4_ = fVar242 * fVar238;
          auVar68._8_4_ = fVar173 * fVar273;
          auVar68._12_4_ = fVar174 * fVar311;
          auVar68._16_4_ = fVar175 * fVar240;
          auVar68._20_4_ = fVar177 * fVar341;
          auVar68._24_4_ = fVar195 * fVar170;
          auVar68._28_4_ = auVar186._28_4_;
          auVar69._4_4_ = fVar328 * fVar244;
          auVar69._0_4_ = fVar327 * fVar217;
          auVar69._8_4_ = fVar329 * fVar256;
          auVar69._12_4_ = fVar330 * fVar279;
          auVar69._16_4_ = fVar374 * fVar342;
          auVar69._20_4_ = fVar375 * fVar333;
          auVar69._24_4_ = fVar176 * fVar169;
          auVar69._28_4_ = auVar33._28_4_;
          auVar29 = vsubps_avx(auVar69,auVar68);
          auVar304._0_4_ = auVar25._0_4_ * 0.0 + auVar29._0_4_ + auVar27._0_4_ * 0.0;
          auVar304._4_4_ = auVar25._4_4_ * 0.0 + auVar29._4_4_ + auVar27._4_4_ * 0.0;
          auVar304._8_4_ = auVar25._8_4_ * 0.0 + auVar29._8_4_ + auVar27._8_4_ * 0.0;
          auVar304._12_4_ = auVar25._12_4_ * 0.0 + auVar29._12_4_ + auVar27._12_4_ * 0.0;
          auVar304._16_4_ = auVar25._16_4_ * 0.0 + auVar29._16_4_ + auVar27._16_4_ * 0.0;
          auVar304._20_4_ = auVar25._20_4_ * 0.0 + auVar29._20_4_ + auVar27._20_4_ * 0.0;
          auVar304._24_4_ = auVar25._24_4_ * 0.0 + auVar29._24_4_ + auVar27._24_4_ * 0.0;
          auVar304._28_4_ = auVar33._28_4_ + auVar29._28_4_ + auVar186._28_4_;
          auVar26 = vrcpps_avx(auVar304);
          fVar238 = auVar26._0_4_;
          fVar241 = auVar26._4_4_;
          auVar70._4_4_ = auVar304._4_4_ * fVar241;
          auVar70._0_4_ = auVar304._0_4_ * fVar238;
          fVar244 = auVar26._8_4_;
          auVar70._8_4_ = auVar304._8_4_ * fVar244;
          fVar254 = auVar26._12_4_;
          auVar70._12_4_ = auVar304._12_4_ * fVar254;
          fVar255 = auVar26._16_4_;
          auVar70._16_4_ = auVar304._16_4_ * fVar255;
          fVar256 = auVar26._20_4_;
          auVar70._20_4_ = auVar304._20_4_ * fVar256;
          fVar273 = auVar26._24_4_;
          auVar70._24_4_ = auVar304._24_4_ * fVar273;
          auVar70._28_4_ = auVar158._28_4_;
          auVar350._8_4_ = 0x3f800000;
          auVar350._0_8_ = &DAT_3f8000003f800000;
          auVar350._12_4_ = 0x3f800000;
          auVar350._16_4_ = 0x3f800000;
          auVar350._20_4_ = 0x3f800000;
          auVar350._24_4_ = 0x3f800000;
          auVar350._28_4_ = 0x3f800000;
          auVar30 = vsubps_avx(auVar350,auVar70);
          fVar238 = auVar30._0_4_ * fVar238 + fVar238;
          fVar241 = auVar30._4_4_ * fVar241 + fVar241;
          fVar244 = auVar30._8_4_ * fVar244 + fVar244;
          fVar254 = auVar30._12_4_ * fVar254 + fVar254;
          fVar255 = auVar30._16_4_ * fVar255 + fVar255;
          fVar256 = auVar30._20_4_ * fVar256 + fVar256;
          fVar273 = auVar30._24_4_ * fVar273 + fVar273;
          auVar71._4_4_ =
               (auVar25._4_4_ * fVar253 + auVar27._4_4_ * fVar252 + auVar29._4_4_ * fVar295) *
               fVar241;
          auVar71._0_4_ =
               (auVar25._0_4_ * fVar232 + auVar27._0_4_ * fVar230 + auVar29._0_4_ * fVar257) *
               fVar238;
          auVar71._8_4_ =
               (auVar25._8_4_ * fVar270 + auVar27._8_4_ * fVar258 + auVar29._8_4_ * fVar231) *
               fVar244;
          auVar71._12_4_ =
               (auVar25._12_4_ * fVar281 + auVar27._12_4_ * fVar280 + auVar29._12_4_ * fVar233) *
               fVar254;
          auVar71._16_4_ =
               (auVar25._16_4_ * fVar314 + auVar27._16_4_ * fVar313 + auVar29._16_4_ * fVar235) *
               fVar255;
          auVar71._20_4_ =
               (auVar25._20_4_ * fVar243 + auVar27._20_4_ * fVar338 + auVar29._20_4_ * fVar204) *
               fVar256;
          auVar71._24_4_ =
               (auVar25._24_4_ * fVar153 + auVar27._24_4_ * fVar171 + auVar29._24_4_ * fVar239) *
               fVar273;
          auVar71._28_4_ = local_700._28_4_ + auVar28._28_4_ + auVar156._28_4_;
          auVar209 = vpermilps_avx(_local_620,0);
          auVar226._16_16_ = auVar209;
          auVar226._0_16_ = auVar209;
          auVar156 = vcmpps_avx(auVar226,auVar71,2);
          fVar217 = (ray->super_RayK<1>).tfar;
          auVar266._4_4_ = fVar217;
          auVar266._0_4_ = fVar217;
          auVar266._8_4_ = fVar217;
          auVar266._12_4_ = fVar217;
          auVar266._16_4_ = fVar217;
          auVar266._20_4_ = fVar217;
          auVar266._24_4_ = fVar217;
          auVar266._28_4_ = fVar217;
          auVar25 = vcmpps_avx(auVar71,auVar266,2);
          auVar156 = vandps_avx(auVar25,auVar156);
          auVar209 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
          auVar263 = vpand_avx(auVar263,auVar209);
          auVar209 = vpmovsxwd_avx(auVar263);
          auVar201 = vpshufd_avx(auVar263,0xee);
          auVar201 = vpmovsxwd_avx(auVar201);
          auVar227._16_16_ = auVar201;
          auVar227._0_16_ = auVar209;
          if ((((((((auVar227 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar227 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar227 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar227 >> 0x7f,0) == '\0') &&
                (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar201 >> 0x3f,0) == '\0') &&
              (auVar227 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar201[0xf]) goto LAB_0118998f;
          auVar156 = vcmpps_avx(ZEXT832(0) << 0x20,auVar304,4);
          auVar209 = vpackssdw_avx(auVar156._0_16_,auVar156._16_16_);
          auVar263 = vpand_avx(auVar263,auVar209);
          auVar209 = vpmovsxwd_avx(auVar263);
          auVar263 = vpunpckhwd_avx(auVar263,auVar263);
          auVar290._16_16_ = auVar263;
          auVar290._0_16_ = auVar209;
          auVar268._8_8_ = uStack_538;
          auVar268._0_8_ = local_540;
          auVar268._16_8_ = uStack_530;
          auVar268._24_8_ = uStack_528;
          auVar359 = ZEXT3264(local_740);
          auVar322 = ZEXT3264(local_760);
          auVar310 = ZEXT3264(CONCAT428(fStack_7c4,
                                        CONCAT424(fStack_7c8,
                                                  CONCAT420(fStack_7cc,
                                                            CONCAT416(fStack_7d0,
                                                                      CONCAT412(fStack_7d4,
                                                                                CONCAT48(fStack_7d8,
                                                                                         CONCAT44(
                                                  fStack_7dc,local_7e0))))))));
          if ((((((((auVar290 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar290 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar290 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar290 >> 0x7f,0) != '\0') ||
                (auVar290 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar263 >> 0x3f,0) != '\0') ||
              (auVar290 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar263[0xf] < '\0') {
            auVar228._0_4_ = fVar238 * auVar186._0_4_;
            auVar228._4_4_ = fVar241 * auVar186._4_4_;
            auVar228._8_4_ = fVar244 * auVar186._8_4_;
            auVar228._12_4_ = fVar254 * auVar186._12_4_;
            auVar228._16_4_ = fVar255 * auVar186._16_4_;
            auVar228._20_4_ = fVar256 * auVar186._20_4_;
            auVar228._24_4_ = fVar273 * auVar186._24_4_;
            auVar228._28_4_ = 0;
            auVar72._4_4_ = auVar248._4_4_ * fVar241;
            auVar72._0_4_ = auVar248._0_4_ * fVar238;
            auVar72._8_4_ = auVar248._8_4_ * fVar244;
            auVar72._12_4_ = auVar248._12_4_ * fVar254;
            auVar72._16_4_ = auVar248._16_4_ * fVar255;
            auVar72._20_4_ = auVar248._20_4_ * fVar256;
            auVar72._24_4_ = auVar248._24_4_ * fVar273;
            auVar72._28_4_ = auVar30._28_4_ + auVar26._28_4_;
            auVar267._8_4_ = 0x3f800000;
            auVar267._0_8_ = &DAT_3f8000003f800000;
            auVar267._12_4_ = 0x3f800000;
            auVar267._16_4_ = 0x3f800000;
            auVar267._20_4_ = 0x3f800000;
            auVar267._24_4_ = 0x3f800000;
            auVar267._28_4_ = 0x3f800000;
            auVar156 = vsubps_avx(auVar267,auVar228);
            auVar156 = vblendvps_avx(auVar156,auVar228,auVar31);
            auVar359 = ZEXT3264(auVar156);
            auVar156 = vsubps_avx(auVar267,auVar72);
            _local_280 = vblendvps_avx(auVar156,auVar72,auVar31);
            auVar322 = ZEXT3264(auVar71);
            auVar268 = auVar290;
          }
        }
        auVar379 = ZEXT3264(_local_6c0);
        if ((((((((auVar268 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar268 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar268 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar268 >> 0x7f,0) == '\0') &&
              (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar268 >> 0xbf,0) == '\0') &&
            (auVar268 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar268[0x1f]) goto LAB_011886bb;
        auVar156 = vsubps_avx(_local_780,auVar310._0_32_);
        fVar230 = auVar310._0_4_ + auVar359._0_4_ * auVar156._0_4_;
        fVar232 = auVar310._4_4_ + auVar359._4_4_ * auVar156._4_4_;
        fVar238 = auVar310._8_4_ + auVar359._8_4_ * auVar156._8_4_;
        fVar241 = auVar310._12_4_ + auVar359._12_4_ * auVar156._12_4_;
        fVar244 = auVar310._16_4_ + auVar359._16_4_ * auVar156._16_4_;
        fVar252 = auVar310._20_4_ + auVar359._20_4_ * auVar156._20_4_;
        fVar253 = auVar310._24_4_ + auVar359._24_4_ * auVar156._24_4_;
        fVar254 = auVar310._28_4_ + auVar156._28_4_;
        fVar217 = pre->depth_scale;
        auVar73._4_4_ = (fVar232 + fVar232) * fVar217;
        auVar73._0_4_ = (fVar230 + fVar230) * fVar217;
        auVar73._8_4_ = (fVar238 + fVar238) * fVar217;
        auVar73._12_4_ = (fVar241 + fVar241) * fVar217;
        auVar73._16_4_ = (fVar244 + fVar244) * fVar217;
        auVar73._20_4_ = (fVar252 + fVar252) * fVar217;
        auVar73._24_4_ = (fVar253 + fVar253) * fVar217;
        auVar73._28_4_ = fVar254 + fVar254;
        local_3a0 = auVar322._0_32_;
        auVar156 = vcmpps_avx(local_3a0,auVar73,6);
        auVar25 = auVar268 & auVar156;
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0x7f,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0xbf,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar25[0x1f]) goto LAB_011886bb;
        auVar156 = vandps_avx(auVar156,auVar268);
        local_280._0_4_ = (float)local_280._0_4_ + (float)local_280._0_4_ + -1.0;
        local_280._4_4_ = (float)local_280._4_4_ + (float)local_280._4_4_ + -1.0;
        uStack_278._0_4_ = (float)uStack_278 + (float)uStack_278 + -1.0;
        uStack_278._4_4_ = uStack_278._4_4_ + uStack_278._4_4_ + -1.0;
        uStack_270._0_4_ = (float)uStack_270 + (float)uStack_270 + -1.0;
        uStack_270._4_4_ = uStack_270._4_4_ + uStack_270._4_4_ + -1.0;
        uStack_268._0_4_ = (float)uStack_268 + (float)uStack_268 + -1.0;
        uStack_268._4_4_ = uStack_268._4_4_ + uStack_268._4_4_ + -1.0;
        local_3e0 = auVar359._0_32_;
        auVar142 = _local_280;
        auVar25 = _local_280;
        local_3c0 = (float)local_280._0_4_;
        fStack_3bc = (float)local_280._4_4_;
        fStack_3b8 = (float)uStack_278;
        fStack_3b4 = uStack_278._4_4_;
        fStack_3b0 = (float)uStack_270;
        fStack_3ac = uStack_270._4_4_;
        fStack_3a8 = (float)uStack_268;
        fStack_3a4 = uStack_268._4_4_;
        local_380 = 0;
        local_37c = uVar20;
        local_370 = (float)local_820._0_4_;
        fStack_36c = (float)local_820._4_4_;
        fStack_368 = fStack_818;
        fStack_364 = fStack_814;
        local_360 = _local_710;
        local_350 = _local_660;
        local_340 = _local_550;
        local_320 = auVar156;
        _local_280 = auVar25;
        if ((pGVar21->mask & (ray->super_RayK<1>).mask) != 0) {
          local_580 = auVar156;
          auVar206._0_4_ = 1.0 / auVar219._0_4_;
          auVar206._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar263 = vshufps_avx(auVar206,auVar206,0);
          local_300[0] = auVar263._0_4_ * (auVar359._0_4_ + 0.0);
          local_300[1] = auVar263._4_4_ * (auVar359._4_4_ + 1.0);
          local_300[2] = auVar263._8_4_ * (auVar359._8_4_ + 2.0);
          local_300[3] = auVar263._12_4_ * (auVar359._12_4_ + 3.0);
          fStack_2f0 = auVar263._0_4_ * (auVar359._16_4_ + 4.0);
          fStack_2ec = auVar263._4_4_ * (auVar359._20_4_ + 5.0);
          fStack_2e8 = auVar263._8_4_ * (auVar359._24_4_ + 6.0);
          fStack_2e4 = auVar359._28_4_ + 7.0;
          uStack_270 = auVar142._16_8_;
          uStack_268 = auVar25._24_8_;
          local_2e0 = local_280;
          uStack_2d8 = uStack_278;
          uStack_2d0 = uStack_270;
          uStack_2c8 = uStack_268;
          local_2c0 = local_3a0;
          auVar187._8_4_ = 0x7f800000;
          auVar187._0_8_ = 0x7f8000007f800000;
          auVar187._12_4_ = 0x7f800000;
          auVar187._16_4_ = 0x7f800000;
          auVar187._20_4_ = 0x7f800000;
          auVar187._24_4_ = 0x7f800000;
          auVar187._28_4_ = 0x7f800000;
          auVar25 = vblendvps_avx(auVar187,local_3a0,auVar156);
          auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
          auVar26 = vminps_avx(auVar25,auVar26);
          auVar27 = vshufpd_avx(auVar26,auVar26,5);
          auVar26 = vminps_avx(auVar26,auVar27);
          auVar27 = vperm2f128_avx(auVar26,auVar26,1);
          auVar26 = vminps_avx(auVar26,auVar27);
          auVar25 = vcmpps_avx(auVar25,auVar26,0);
          auVar26 = auVar156 & auVar25;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0x7f,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0xbf,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar26[0x1f] < '\0') {
            auVar156 = vandps_avx(auVar25,auVar156);
          }
          uVar145 = vmovmskps_avx(auVar156);
          uVar23 = 0;
          if (uVar145 != 0) {
            for (; (uVar145 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
            }
          }
          uVar148 = (ulong)uVar23;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            fVar217 = local_300[uVar148];
            fVar230 = *(float *)((long)&local_2e0 + uVar148 * 4);
            fVar238 = 1.0 - fVar217;
            fVar232 = fVar217 * fVar238 + fVar217 * fVar238;
            auVar263 = ZEXT416((uint)(fVar217 * fVar217 * 3.0));
            auVar263 = vshufps_avx(auVar263,auVar263,0);
            auVar209 = ZEXT416((uint)((fVar232 - fVar217 * fVar217) * 3.0));
            auVar209 = vshufps_avx(auVar209,auVar209,0);
            auVar201 = ZEXT416((uint)((fVar238 * fVar238 - fVar232) * 3.0));
            auVar201 = vshufps_avx(auVar201,auVar201,0);
            auVar220 = ZEXT416((uint)(fVar238 * fVar238 * -3.0));
            auVar220 = vshufps_avx(auVar220,auVar220,0);
            auVar207._0_4_ =
                 (float)local_820._0_4_ * auVar220._0_4_ +
                 (float)local_710._0_4_ * auVar201._0_4_ +
                 local_550._0_4_ * auVar263._0_4_ + local_660._0_4_ * auVar209._0_4_;
            auVar207._4_4_ =
                 (float)local_820._4_4_ * auVar220._4_4_ +
                 (float)local_710._4_4_ * auVar201._4_4_ +
                 local_550._4_4_ * auVar263._4_4_ + local_660._4_4_ * auVar209._4_4_;
            auVar207._8_4_ =
                 fStack_818 * auVar220._8_4_ +
                 fStack_708 * auVar201._8_4_ +
                 local_550._8_4_ * auVar263._8_4_ + local_660._8_4_ * auVar209._8_4_;
            auVar207._12_4_ =
                 fStack_814 * auVar220._12_4_ +
                 fStack_704 * auVar201._12_4_ +
                 local_550._12_4_ * auVar263._12_4_ + local_660._12_4_ * auVar209._12_4_;
            (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar148 * 4);
            uVar9 = vmovlps_avx(auVar207);
            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
            fVar232 = (float)vextractps_avx(auVar207,2);
            (ray->Ng).field_0.field_0.z = fVar232;
            ray->u = fVar217;
            ray->v = fVar230;
            ray->primID = uVar146;
            ray->geomID = uVar144;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
          }
          else {
            _local_6a0 = _local_710;
            _local_700 = _local_660;
            _local_5c0 = _local_550;
            local_740 = auVar359._0_32_;
            local_760 = local_3a0;
            local_7f8 = context;
            local_800 = ray;
            local_808 = pre;
            fVar217 = (float)local_820._0_4_;
            fVar230 = (float)local_820._4_4_;
            fVar232 = fStack_818;
            fVar238 = fStack_814;
            _local_820 = auVar14;
            _local_710 = auVar13;
            _local_200 = auVar15;
            do {
              local_644 = local_300[uVar148];
              local_640 = *(undefined4 *)((long)&local_2e0 + uVar148 * 4);
              local_780._0_4_ = (ray->super_RayK<1>).tfar;
              (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar148 * 4);
              local_7b0.context = context->user;
              fVar236 = 1.0 - local_644;
              fVar234 = local_644 * fVar236 + local_644 * fVar236;
              auVar263 = ZEXT416((uint)(local_644 * local_644 * 3.0));
              auVar263 = vshufps_avx(auVar263,auVar263,0);
              auVar209 = ZEXT416((uint)((fVar234 - local_644 * local_644) * 3.0));
              auVar209 = vshufps_avx(auVar209,auVar209,0);
              auVar201 = ZEXT416((uint)((fVar236 * fVar236 - fVar234) * 3.0));
              auVar201 = vshufps_avx(auVar201,auVar201,0);
              auVar220 = ZEXT416((uint)(fVar236 * fVar236 * -3.0));
              auVar220 = vshufps_avx(auVar220,auVar220,0);
              auVar212._0_4_ =
                   fVar217 * auVar220._0_4_ +
                   auVar201._0_4_ * (float)local_6a0._0_4_ +
                   auVar263._0_4_ * (float)local_5c0._0_4_ + auVar209._0_4_ * (float)local_700._0_4_
              ;
              auVar212._4_4_ =
                   fVar230 * auVar220._4_4_ +
                   auVar201._4_4_ * (float)local_6a0._4_4_ +
                   auVar263._4_4_ * (float)local_5c0._4_4_ + auVar209._4_4_ * (float)local_700._4_4_
              ;
              auVar212._8_4_ =
                   fVar232 * auVar220._8_4_ +
                   auVar201._8_4_ * fStack_698 +
                   auVar263._8_4_ * fStack_5b8 + auVar209._8_4_ * fStack_6f8;
              auVar212._12_4_ =
                   fVar238 * auVar220._12_4_ +
                   auVar201._12_4_ * fStack_694 +
                   auVar263._12_4_ * fStack_5b4 + auVar209._12_4_ * fStack_6f4;
              local_650 = vmovlps_avx(auVar212);
              local_648 = vextractps_avx(auVar212,2);
              local_63c = (int)local_7e8;
              local_638 = (int)local_7f0;
              local_634 = (local_7b0.context)->instID[0];
              local_630 = (local_7b0.context)->instPrimID[0];
              local_824 = -1;
              local_7b0.valid = &local_824;
              local_7b0.geometryUserPtr = pGVar21->userPtr;
              local_7b0.ray = (RTCRayN *)ray;
              local_7b0.hit = (RTCHitN *)&local_650;
              local_7b0.N = 1;
              local_7e0 = (float)uVar148;
              fStack_7dc = (float)(uVar148 >> 0x20);
              if (pGVar21->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01189bc3:
                p_Var22 = context->args->filter;
                if (p_Var22 != (RTCFilterFunctionN)0x0) {
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((pGVar21->field_8).field_0x2 & 0x40) != 0)) {
                    auVar310 = ZEXT1664(auVar310._0_16_);
                    (*p_Var22)(&local_7b0);
                    uVar148 = CONCAT44(fStack_7dc,local_7e0);
                    auVar379 = ZEXT3264(_local_6c0);
                    auVar322 = ZEXT3264(local_760);
                    auVar359 = ZEXT3264(local_740);
                    ray = local_800;
                    context = local_7f8;
                    pre = local_808;
                    fVar217 = (float)local_820._0_4_;
                    fVar230 = (float)local_820._4_4_;
                    fVar232 = fStack_818;
                    fVar238 = fStack_814;
                  }
                  if (*local_7b0.valid == 0) goto LAB_01189c94;
                }
                (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).components[0] =
                     *(float *)local_7b0.hit;
                (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_7b0.hit + 4);
                (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_7b0.hit + 8);
                *(float *)((long)local_7b0.ray + 0x3c) = *(float *)(local_7b0.hit + 0xc);
                *(float *)((long)local_7b0.ray + 0x40) = *(float *)(local_7b0.hit + 0x10);
                *(float *)((long)local_7b0.ray + 0x44) = *(float *)(local_7b0.hit + 0x14);
                *(float *)((long)local_7b0.ray + 0x48) = *(float *)(local_7b0.hit + 0x18);
                *(float *)((long)local_7b0.ray + 0x4c) = *(float *)(local_7b0.hit + 0x1c);
                *(float *)((long)local_7b0.ray + 0x50) = *(float *)(local_7b0.hit + 0x20);
              }
              else {
                auVar310 = ZEXT1664(auVar310._0_16_);
                (*pGVar21->intersectionFilterN)(&local_7b0);
                uVar148 = CONCAT44(fStack_7dc,local_7e0);
                auVar379 = ZEXT3264(_local_6c0);
                auVar322 = ZEXT3264(local_760);
                auVar359 = ZEXT3264(local_740);
                ray = local_800;
                context = local_7f8;
                pre = local_808;
                fVar217 = (float)local_820._0_4_;
                fVar230 = (float)local_820._4_4_;
                fVar232 = fStack_818;
                fVar238 = fStack_814;
                if (*local_7b0.valid != 0) goto LAB_01189bc3;
LAB_01189c94:
                (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
              }
              *(undefined4 *)(local_580 + uVar148 * 4) = 0;
              auVar26 = local_580;
              fVar234 = (ray->super_RayK<1>).tfar;
              auVar167._4_4_ = fVar234;
              auVar167._0_4_ = fVar234;
              auVar167._8_4_ = fVar234;
              auVar167._12_4_ = fVar234;
              auVar167._16_4_ = fVar234;
              auVar167._20_4_ = fVar234;
              auVar167._24_4_ = fVar234;
              auVar167._28_4_ = fVar234;
              auVar25 = vcmpps_avx(auVar322._0_32_,auVar167,2);
              auVar156 = vandps_avx(auVar25,local_580);
              local_580 = auVar156;
              auVar26 = auVar26 & auVar25;
              bVar123 = (auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
              bVar124 = (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
              bVar122 = (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
              bVar121 = SUB321(auVar26 >> 0x7f,0) != '\0';
              bVar120 = (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
              bVar119 = SUB321(auVar26 >> 0xbf,0) != '\0';
              bVar118 = (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
              bVar117 = auVar26[0x1f] < '\0';
              if (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119) ||
                  bVar118) || bVar117) {
                auVar193._8_4_ = 0x7f800000;
                auVar193._0_8_ = 0x7f8000007f800000;
                auVar193._12_4_ = 0x7f800000;
                auVar193._16_4_ = 0x7f800000;
                auVar193._20_4_ = 0x7f800000;
                auVar193._24_4_ = 0x7f800000;
                auVar193._28_4_ = 0x7f800000;
                auVar25 = vblendvps_avx(auVar193,auVar322._0_32_,auVar156);
                auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
                auVar26 = vminps_avx(auVar25,auVar26);
                auVar27 = vshufpd_avx(auVar26,auVar26,5);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar27 = vperm2f128_avx(auVar26,auVar26,1);
                auVar26 = vminps_avx(auVar26,auVar27);
                auVar25 = vcmpps_avx(auVar25,auVar26,0);
                auVar26 = auVar156 & auVar25;
                if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0x7f,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar26 >> 0xbf,0) != '\0') ||
                    (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar26[0x1f] < '\0') {
                  auVar156 = vandps_avx(auVar25,auVar156);
                }
                uVar146 = vmovmskps_avx(auVar156);
                uVar144 = 0;
                if (uVar146 != 0) {
                  for (; (uVar146 >> uVar144 & 1) == 0; uVar144 = uVar144 + 1) {
                  }
                }
                uVar148 = (ulong)uVar144;
              }
              fVar260 = (float)local_6e0._0_4_;
              fVar272 = (float)local_6e0._4_4_;
              fVar275 = fStack_6d8;
              fVar278 = fStack_6d4;
              fVar234 = fStack_6d0;
              fVar236 = fStack_6cc;
              fVar251 = fStack_6c8;
              auVar14 = _local_820;
              auVar13 = _local_710;
            } while (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119) ||
                     bVar118) || bVar117);
          }
        }
      }
      _local_710 = auVar13;
      _local_820 = auVar14;
      if (8 < (int)uVar20) {
        _local_200 = vpshufd_avx(ZEXT416(uVar20),0);
        auVar263 = vshufps_avx(local_680._0_16_,local_680._0_16_,0);
        local_260._16_16_ = auVar263;
        local_260._0_16_ = auVar263;
        auVar263 = vpermilps_avx(_local_620,0);
        local_120._16_16_ = auVar263;
        local_120._0_16_ = auVar263;
        auVar155._0_4_ = 1.0 / (float)local_460._0_4_;
        auVar155._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar263 = vshufps_avx(auVar155,auVar155,0);
        register0x00001210 = auVar263;
        _local_140 = auVar263;
        auVar168 = ZEXT3264(_local_140);
        lVar151 = 8;
        local_740 = auVar359._0_32_;
        local_760 = auVar322._0_32_;
        _local_6c0 = auVar379._0_32_;
        do {
          pauVar2 = (undefined1 (*) [28])(bezier_basis0 + lVar151 * 4 + lVar147);
          fVar230 = *(float *)*pauVar2;
          fVar232 = *(float *)(*pauVar2 + 4);
          fVar238 = *(float *)(*pauVar2 + 8);
          fVar241 = *(float *)(*pauVar2 + 0xc);
          fVar244 = *(float *)(*pauVar2 + 0x10);
          fVar252 = *(float *)(*pauVar2 + 0x14);
          fVar253 = *(float *)(*pauVar2 + 0x18);
          auVar141 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar147 + 0x2227768 + lVar151 * 4);
          fVar254 = *(float *)*pauVar2;
          fVar255 = *(float *)(*pauVar2 + 4);
          fVar256 = *(float *)(*pauVar2 + 8);
          fVar258 = *(float *)(*pauVar2 + 0xc);
          fVar270 = *(float *)(*pauVar2 + 0x10);
          fVar273 = *(float *)(*pauVar2 + 0x14);
          fVar276 = *(float *)(*pauVar2 + 0x18);
          auVar140 = *pauVar2;
          pauVar2 = (undefined1 (*) [28])(lVar147 + 0x2227bec + lVar151 * 4);
          fVar279 = *(float *)*pauVar2;
          fVar280 = *(float *)(*pauVar2 + 4);
          fVar281 = *(float *)(*pauVar2 + 8);
          fVar311 = *(float *)(*pauVar2 + 0xc);
          fVar237 = *(float *)(*pauVar2 + 0x10);
          fVar342 = *(float *)(*pauVar2 + 0x14);
          fVar313 = *(float *)(*pauVar2 + 0x18);
          auVar139 = *pauVar2;
          pfVar4 = (float *)(lVar147 + 0x2228070 + lVar151 * 4);
          fVar314 = *pfVar4;
          fVar240 = pfVar4[1];
          fVar343 = pfVar4[2];
          fVar333 = pfVar4[3];
          fVar338 = pfVar4[4];
          fVar243 = pfVar4[5];
          fVar341 = pfVar4[6];
          fVar217 = auVar310._28_4_;
          fStack_7c4 = fStack_504 + fStack_504 + auVar168._28_4_;
          fVar257 = fStack_504 + fStack_504 + pfVar4[7];
          auVar310 = ZEXT3264(local_1e0);
          fVar231 = local_1e0._0_4_;
          fVar233 = local_1e0._4_4_;
          fVar235 = local_1e0._8_4_;
          fVar204 = local_1e0._12_4_;
          fVar239 = local_1e0._16_4_;
          fVar242 = local_1e0._20_4_;
          fVar312 = local_1e0._24_4_;
          auVar366._0_4_ =
               fVar231 * fVar230 +
               auVar379._0_4_ * fVar254 +
               (float)local_4a0._0_4_ * fVar279 + (float)local_440._0_4_ * fVar314;
          auVar366._4_4_ =
               fVar233 * fVar232 +
               auVar379._4_4_ * fVar255 +
               (float)local_4a0._4_4_ * fVar280 + (float)local_440._4_4_ * fVar240;
          auVar366._8_4_ =
               fVar235 * fVar238 +
               auVar379._8_4_ * fVar256 + fStack_498 * fVar281 + fStack_438 * fVar343;
          auVar366._12_4_ =
               fVar204 * fVar241 +
               auVar379._12_4_ * fVar258 + fStack_494 * fVar311 + fStack_434 * fVar333;
          auVar366._16_4_ =
               fVar239 * fVar244 +
               auVar379._16_4_ * fVar270 + fStack_490 * fVar237 + fStack_430 * fVar338;
          auVar366._20_4_ =
               fVar242 * fVar252 +
               auVar379._20_4_ * fVar273 + fStack_48c * fVar342 + fStack_42c * fVar243;
          auVar366._24_4_ =
               fVar312 * fVar253 +
               auVar379._24_4_ * fVar276 + fStack_488 * fVar313 + fStack_428 * fVar341;
          auVar366._28_4_ = fStack_504 + pfVar4[7] + fStack_7c4;
          local_620._0_4_ =
               (float)local_180._0_4_ * fVar230 +
               (float)local_520._0_4_ * fVar314 + (float)local_400._0_4_ * fVar279 +
               fVar254 * fVar260;
          local_620._4_4_ =
               (float)local_180._4_4_ * fVar232 +
               (float)local_520._4_4_ * fVar240 + (float)local_400._4_4_ * fVar280 +
               fVar255 * fVar272;
          fStack_618 = fStack_178 * fVar238 +
                       fStack_518 * fVar343 + fStack_3f8 * fVar281 + fVar256 * fVar275;
          fStack_614 = fStack_174 * fVar241 +
                       fStack_514 * fVar333 + fStack_3f4 * fVar311 + fVar258 * fVar278;
          register0x00001290 =
               fStack_170 * fVar244 +
               fStack_510 * fVar338 + fStack_3f0 * fVar237 + fVar270 * fVar234;
          register0x00001294 =
               fStack_16c * fVar252 +
               fStack_50c * fVar243 + fStack_3ec * fVar342 + fVar273 * fVar236;
          register0x00001298 =
               fStack_168 * fVar253 +
               fStack_508 * fVar341 + fStack_3e8 * fVar313 + fVar276 * fVar251;
          register0x0000129c = fStack_7c4 + fVar217 + fStack_504 + fStack_504;
          local_7e0 = fVar230 * (float)local_c0._0_4_ +
                      (float)local_a0._0_4_ * fVar254 +
                      (float)local_160._0_4_ * fVar279 + fVar314 * (float)local_1a0._0_4_;
          fStack_7dc = fVar232 * (float)local_c0._4_4_ +
                       (float)local_a0._4_4_ * fVar255 +
                       (float)local_160._4_4_ * fVar280 + fVar240 * (float)local_1a0._4_4_;
          fStack_7d8 = fVar238 * fStack_b8 +
                       fStack_98 * fVar256 + fStack_158 * fVar281 + fVar343 * fStack_198;
          fStack_7d4 = fVar241 * fStack_b4 +
                       fStack_94 * fVar258 + fStack_154 * fVar311 + fVar333 * fStack_194;
          fStack_7d0 = fVar244 * fStack_b0 +
                       fStack_90 * fVar270 + fStack_150 * fVar237 + fVar338 * fStack_190;
          fStack_7cc = fVar252 * fStack_ac +
                       fStack_8c * fVar273 + fStack_14c * fVar342 + fVar243 * fStack_18c;
          fStack_7c8 = fVar253 * fStack_a8 +
                       fStack_88 * fVar276 + fStack_148 * fVar313 + fVar341 * fStack_188;
          fStack_7c4 = fStack_7c4 + fVar257;
          pauVar3 = (undefined1 (*) [32])(bezier_basis1 + lVar151 * 4 + lVar147);
          auVar142 = *(undefined1 (*) [24])*pauVar3;
          local_680 = *pauVar3;
          pauVar2 = (undefined1 (*) [28])(lVar147 + 0x2229b88 + lVar151 * 4);
          fVar230 = *(float *)*pauVar2;
          fVar244 = *(float *)(*pauVar2 + 4);
          fVar254 = *(float *)(*pauVar2 + 8);
          fVar256 = *(float *)(*pauVar2 + 0xc);
          fVar258 = *(float *)(*pauVar2 + 0x10);
          fVar270 = *(float *)(*pauVar2 + 0x14);
          fVar273 = *(float *)(*pauVar2 + 0x18);
          auVar143 = *pauVar2;
          pfVar4 = (float *)(lVar147 + 0x222a00c + lVar151 * 4);
          fVar276 = *pfVar4;
          fVar279 = pfVar4[1];
          fVar280 = pfVar4[2];
          fVar281 = pfVar4[3];
          fVar311 = pfVar4[4];
          fVar237 = pfVar4[5];
          fVar342 = pfVar4[6];
          pfVar4 = (float *)(lVar147 + 0x222a490 + lVar151 * 4);
          fVar313 = *pfVar4;
          fVar152 = pfVar4[1];
          fVar169 = pfVar4[2];
          fVar171 = pfVar4[3];
          fVar153 = pfVar4[4];
          fVar170 = pfVar4[5];
          fVar172 = pfVar4[6];
          fVar295 = fStack_484 + pfVar4[7];
          fVar257 = fStack_484 + fStack_484 + fVar257;
          auVar168 = ZEXT3264(local_680);
          fVar217 = auVar142._0_4_;
          fVar232 = auVar142._4_4_;
          fVar238 = auVar142._8_4_;
          fVar241 = auVar142._12_4_;
          fVar252 = auVar142._16_4_;
          fVar253 = auVar142._20_4_;
          fVar255 = (float)*(undefined8 *)(*pauVar3 + 0x18);
          auVar356._0_4_ =
               fVar231 * fVar217 +
               auVar379._0_4_ * fVar230 +
               fVar276 * (float)local_4a0._0_4_ + (float)local_440._0_4_ * fVar313;
          auVar356._4_4_ =
               fVar233 * fVar232 +
               auVar379._4_4_ * fVar244 +
               fVar279 * (float)local_4a0._4_4_ + (float)local_440._4_4_ * fVar152;
          auVar356._8_4_ =
               fVar235 * fVar238 +
               auVar379._8_4_ * fVar254 + fVar280 * fStack_498 + fStack_438 * fVar169;
          auVar356._12_4_ =
               fVar204 * fVar241 +
               auVar379._12_4_ * fVar256 + fVar281 * fStack_494 + fStack_434 * fVar171;
          auVar356._16_4_ =
               fVar239 * fVar252 +
               auVar379._16_4_ * fVar258 + fVar311 * fStack_490 + fStack_430 * fVar153;
          auVar356._20_4_ =
               fVar242 * fVar253 +
               auVar379._20_4_ * fVar270 + fVar237 * fStack_48c + fStack_42c * fVar170;
          auVar356._24_4_ =
               fVar312 * fVar255 +
               auVar379._24_4_ * fVar273 + fVar342 * fStack_488 + fStack_428 * fVar172;
          auVar356._28_4_ = fVar295 + fVar257;
          local_6a0._0_4_ =
               (float)local_180._0_4_ * fVar217 +
               fVar260 * fVar230 +
               (float)local_400._0_4_ * fVar276 + fVar313 * (float)local_520._0_4_;
          local_6a0._4_4_ =
               (float)local_180._4_4_ * fVar232 +
               fVar272 * fVar244 +
               (float)local_400._4_4_ * fVar279 + fVar152 * (float)local_520._4_4_;
          fStack_698 = fStack_178 * fVar238 +
                       fVar275 * fVar254 + fStack_3f8 * fVar280 + fVar169 * fStack_518;
          fStack_694 = fStack_174 * fVar241 +
                       fVar278 * fVar256 + fStack_3f4 * fVar281 + fVar171 * fStack_514;
          register0x00001350 =
               fStack_170 * fVar252 +
               fVar234 * fVar258 + fStack_3f0 * fVar311 + fVar153 * fStack_510;
          register0x00001354 =
               fStack_16c * fVar253 +
               fVar236 * fVar270 + fStack_3ec * fVar237 + fVar170 * fStack_50c;
          register0x00001358 =
               fStack_168 * fVar255 +
               fVar251 * fVar273 + fStack_3e8 * fVar342 + fVar172 * fStack_508;
          register0x0000135c = fVar257 + fStack_484 + fStack_484 + fStack_424;
          auVar305._0_4_ =
               (float)local_a0._0_4_ * fVar230 +
               (float)local_160._0_4_ * fVar276 + fVar313 * (float)local_1a0._0_4_ +
               (float)local_c0._0_4_ * fVar217;
          auVar305._4_4_ =
               (float)local_a0._4_4_ * fVar244 +
               (float)local_160._4_4_ * fVar279 + fVar152 * (float)local_1a0._4_4_ +
               (float)local_c0._4_4_ * fVar232;
          auVar305._8_4_ =
               fStack_98 * fVar254 + fStack_158 * fVar280 + fVar169 * fStack_198 +
               fStack_b8 * fVar238;
          auVar305._12_4_ =
               fStack_94 * fVar256 + fStack_154 * fVar281 + fVar171 * fStack_194 +
               fStack_b4 * fVar241;
          auVar305._16_4_ =
               fStack_90 * fVar258 + fStack_150 * fVar311 + fVar153 * fStack_190 +
               fStack_b0 * fVar252;
          auVar305._20_4_ =
               fStack_8c * fVar270 + fStack_14c * fVar237 + fVar170 * fStack_18c +
               fStack_ac * fVar253;
          auVar305._24_4_ =
               fStack_88 * fVar273 + fStack_148 * fVar342 + fVar172 * fStack_188 +
               fStack_a8 * fVar255;
          auVar305._28_4_ = fStack_484 + fVar295 + fVar257;
          local_220 = vsubps_avx(auVar356,auVar366);
          auVar25 = vsubps_avx(_local_6a0,_local_620);
          fVar258 = local_220._0_4_;
          fVar270 = local_220._4_4_;
          auVar74._4_4_ = fVar270 * (float)local_620._4_4_;
          auVar74._0_4_ = fVar258 * (float)local_620._0_4_;
          fVar273 = local_220._8_4_;
          auVar74._8_4_ = fVar273 * fStack_618;
          fVar173 = local_220._12_4_;
          auVar74._12_4_ = fVar173 * fStack_614;
          fVar174 = local_220._16_4_;
          auVar74._16_4_ = fVar174 * register0x00001290;
          fVar175 = local_220._20_4_;
          auVar74._20_4_ = fVar175 * register0x00001294;
          fVar177 = local_220._24_4_;
          auVar74._24_4_ = fVar177 * register0x00001298;
          auVar74._28_4_ = fVar257;
          fVar230 = auVar25._0_4_;
          fVar234 = auVar25._4_4_;
          auVar75._4_4_ = auVar366._4_4_ * fVar234;
          auVar75._0_4_ = auVar366._0_4_ * fVar230;
          fVar236 = auVar25._8_4_;
          auVar75._8_4_ = auVar366._8_4_ * fVar236;
          fVar244 = auVar25._12_4_;
          auVar75._12_4_ = auVar366._12_4_ * fVar244;
          fVar251 = auVar25._16_4_;
          auVar75._16_4_ = auVar366._16_4_ * fVar251;
          fVar254 = auVar25._20_4_;
          auVar75._20_4_ = auVar366._20_4_ * fVar254;
          fVar256 = auVar25._24_4_;
          auVar75._24_4_ = auVar366._24_4_ * fVar256;
          auVar75._28_4_ = register0x0000135c;
          auVar26 = vsubps_avx(auVar74,auVar75);
          auVar129._4_4_ = fStack_7dc;
          auVar129._0_4_ = local_7e0;
          auVar129._8_4_ = fStack_7d8;
          auVar129._12_4_ = fStack_7d4;
          auVar129._16_4_ = fStack_7d0;
          auVar129._20_4_ = fStack_7cc;
          auVar129._24_4_ = fStack_7c8;
          auVar129._28_4_ = fStack_7c4;
          auVar156 = vmaxps_avx(auVar129,auVar305);
          auVar76._4_4_ = auVar156._4_4_ * auVar156._4_4_ * (fVar270 * fVar270 + fVar234 * fVar234);
          auVar76._0_4_ = auVar156._0_4_ * auVar156._0_4_ * (fVar258 * fVar258 + fVar230 * fVar230);
          auVar76._8_4_ = auVar156._8_4_ * auVar156._8_4_ * (fVar273 * fVar273 + fVar236 * fVar236);
          auVar76._12_4_ =
               auVar156._12_4_ * auVar156._12_4_ * (fVar173 * fVar173 + fVar244 * fVar244);
          auVar76._16_4_ =
               auVar156._16_4_ * auVar156._16_4_ * (fVar174 * fVar174 + fVar251 * fVar251);
          auVar76._20_4_ =
               auVar156._20_4_ * auVar156._20_4_ * (fVar175 * fVar175 + fVar254 * fVar254);
          auVar76._24_4_ =
               auVar156._24_4_ * auVar156._24_4_ * (fVar177 * fVar177 + fVar256 * fVar256);
          auVar76._28_4_ = fVar295 + register0x0000135c;
          auVar77._4_4_ = auVar26._4_4_ * auVar26._4_4_;
          auVar77._0_4_ = auVar26._0_4_ * auVar26._0_4_;
          auVar77._8_4_ = auVar26._8_4_ * auVar26._8_4_;
          auVar77._12_4_ = auVar26._12_4_ * auVar26._12_4_;
          auVar77._16_4_ = auVar26._16_4_ * auVar26._16_4_;
          auVar77._20_4_ = auVar26._20_4_ * auVar26._20_4_;
          auVar77._24_4_ = auVar26._24_4_ * auVar26._24_4_;
          auVar77._28_4_ = auVar26._28_4_;
          auVar156 = vcmpps_avx(auVar77,auVar76,2);
          local_380 = (uint)lVar151;
          auVar209 = vpshufd_avx(ZEXT416(local_380),0);
          auVar263 = vpor_avx(auVar209,_DAT_01ff0cf0);
          auVar209 = vpor_avx(auVar209,_DAT_02020ea0);
          auVar263 = vpcmpgtd_avx(_local_200,auVar263);
          auVar209 = vpcmpgtd_avx(_local_200,auVar209);
          auVar229._16_16_ = auVar209;
          auVar229._0_16_ = auVar263;
          auVar26 = auVar229 & auVar156;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
            auVar359 = ZEXT3264(local_740);
            auVar322 = ZEXT3264(local_760);
            auVar379 = ZEXT3264(_local_6c0);
LAB_0118929f:
            fVar260 = (float)local_6e0._0_4_;
            fVar272 = (float)local_6e0._4_4_;
            fVar275 = fStack_6d8;
            fVar278 = fStack_6d4;
            fVar234 = fStack_6d0;
            fVar236 = fStack_6cc;
            fVar251 = fStack_6c8;
          }
          else {
            local_460 = auVar229;
            local_5a0._0_4_ = auVar143._0_4_;
            local_5a0._4_4_ = auVar143._4_4_;
            fStack_598 = auVar143._8_4_;
            fStack_594 = auVar143._12_4_;
            fStack_590 = auVar143._16_4_;
            fStack_58c = auVar143._20_4_;
            fStack_588 = auVar143._24_4_;
            fVar230 = (float)local_420._0_4_ * (float)local_5a0._0_4_;
            fVar234 = (float)local_420._4_4_ * (float)local_5a0._4_4_;
            fVar236 = fStack_418 * fStack_598;
            fVar244 = fStack_414 * fStack_594;
            fVar251 = fStack_410 * fStack_590;
            fVar254 = fStack_40c * fStack_58c;
            fVar256 = fStack_408 * fStack_588;
            local_680 = auVar305;
            _local_5a0 = auVar25;
            local_600 = fVar217 * (float)local_1c0._0_4_ +
                        fVar230 + (float)local_e0._0_4_ * fVar276 + (float)local_4c0._0_4_ * fVar313
            ;
            fStack_5fc = fVar232 * (float)local_1c0._4_4_ +
                         fVar234 + (float)local_e0._4_4_ * fVar279 +
                                   (float)local_4c0._4_4_ * fVar152;
            fStack_5f8 = fVar238 * fStack_1b8 + fVar236 + fStack_d8 * fVar280 + fStack_4b8 * fVar169
            ;
            fStack_5f4 = fVar241 * fStack_1b4 + fVar244 + fStack_d4 * fVar281 + fStack_4b4 * fVar171
            ;
            fStack_5f0 = fVar252 * fStack_1b0 + fVar251 + fStack_d0 * fVar311 + fStack_4b0 * fVar153
            ;
            fStack_5ec = fVar253 * fStack_1ac + fVar254 + fStack_cc * fVar237 + fStack_4ac * fVar170
            ;
            fStack_5e8 = fVar255 * fStack_1a8 + fVar256 + fStack_c8 * fVar342 + fStack_4a8 * fVar172
            ;
            fStack_5e4 = local_220._28_4_ +
                         (float)((ulong)*(undefined8 *)(*pauVar3 + 0x18) >> 0x20) + auVar25._28_4_ +
                         0.0;
            local_5c0._0_4_ = auVar140._0_4_;
            local_5c0._4_4_ = auVar140._4_4_;
            fStack_5b8 = auVar140._8_4_;
            fStack_5b4 = auVar140._12_4_;
            auStack_5b0._0_4_ = auVar140._16_4_;
            auStack_5b0._4_4_ = auVar140._20_4_;
            fStack_5a8 = auVar140._24_4_;
            fVar153 = (float)local_420._0_4_ * (float)local_5c0._0_4_;
            fVar170 = (float)local_420._4_4_ * (float)local_5c0._4_4_;
            fVar172 = fStack_418 * fStack_5b8;
            fVar257 = fStack_414 * fStack_5b4;
            fVar295 = fStack_410 * (float)auStack_5b0._0_4_;
            fVar173 = fStack_40c * (float)auStack_5b0._4_4_;
            fVar174 = fStack_408 * fStack_5a8;
            local_4e0._0_4_ = auVar139._0_4_;
            local_4e0._4_4_ = auVar139._4_4_;
            fStack_4d8 = auVar139._8_4_;
            fStack_4d4 = auVar139._12_4_;
            fStack_4d0 = auVar139._16_4_;
            fStack_4cc = auVar139._20_4_;
            fStack_4c8 = auVar139._24_4_;
            fVar177 = (float)local_e0._0_4_ * (float)local_4e0._0_4_;
            fVar195 = (float)local_e0._4_4_ * (float)local_4e0._4_4_;
            fVar197 = fStack_d8 * fStack_4d8;
            fVar199 = fStack_d4 * fStack_4d4;
            fVar200 = fStack_d0 * fStack_4d0;
            fVar202 = fStack_cc * fStack_4cc;
            fVar203 = fStack_c8 * fStack_4c8;
            pfVar4 = (float *)(lVar147 + 0x2228dfc + lVar151 * 4);
            fVar217 = *pfVar4;
            fVar230 = pfVar4[1];
            fVar232 = pfVar4[2];
            fVar234 = pfVar4[3];
            fVar236 = pfVar4[4];
            fVar238 = pfVar4[5];
            fVar241 = pfVar4[6];
            pfVar5 = (float *)(lVar147 + 0x2229280 + lVar151 * 4);
            fVar244 = *pfVar5;
            fVar251 = pfVar5[1];
            fVar252 = pfVar5[2];
            fVar253 = pfVar5[3];
            fVar254 = pfVar5[4];
            fVar255 = pfVar5[5];
            fVar256 = pfVar5[6];
            _local_4e0 = auVar356;
            pfVar6 = (float *)(lVar147 + 0x2228978 + lVar151 * 4);
            fVar258 = *pfVar6;
            fVar270 = pfVar6[1];
            fVar273 = pfVar6[2];
            fVar276 = pfVar6[3];
            fVar279 = pfVar6[4];
            fVar280 = pfVar6[5];
            fVar281 = pfVar6[6];
            fVar175 = pfVar4[7] + pfVar5[7];
            fStack_224 = pfVar5[7] + auVar366._28_4_ + 0.0;
            fVar296 = auVar366._28_4_ + auVar356._28_4_ + auVar366._28_4_ + 0.0;
            pfVar4 = (float *)(lVar147 + 0x22284f4 + lVar151 * 4);
            fVar311 = *pfVar4;
            fVar237 = pfVar4[1];
            fVar342 = pfVar4[2];
            fVar313 = pfVar4[3];
            fVar152 = pfVar4[4];
            fVar169 = pfVar4[5];
            fVar171 = pfVar4[6];
            local_500 = fVar311 * fVar231 +
                        fVar258 * (float)local_6c0._0_4_ +
                        (float)local_4a0._0_4_ * fVar217 + (float)local_440._0_4_ * fVar244;
            fStack_4fc = fVar237 * fVar233 +
                         fVar270 * (float)local_6c0._4_4_ +
                         (float)local_4a0._4_4_ * fVar230 + (float)local_440._4_4_ * fVar251;
            fStack_4f8 = fVar342 * fVar235 +
                         fVar273 * fStack_6b8 + fStack_498 * fVar232 + fStack_438 * fVar252;
            fStack_4f4 = fVar313 * fVar204 +
                         fVar276 * fStack_6b4 + fStack_494 * fVar234 + fStack_434 * fVar253;
            fStack_4f0 = fVar152 * fVar239 +
                         fVar279 * fStack_6b0 + fStack_490 * fVar236 + fStack_430 * fVar254;
            fStack_4ec = fVar169 * fVar242 +
                         fVar280 * fStack_6ac + fStack_48c * fVar238 + fStack_42c * fVar255;
            fStack_4e8 = fVar171 * fVar312 +
                         fVar281 * fStack_6a8 + fStack_488 * fVar241 + fStack_428 * fVar256;
            fStack_4e4 = fVar175 + fStack_224;
            local_240 = fVar311 * (float)local_180._0_4_ +
                        (float)local_400._0_4_ * fVar217 + (float)local_520._0_4_ * fVar244 +
                        fVar258 * (float)local_6e0._0_4_;
            fStack_23c = fVar237 * (float)local_180._4_4_ +
                         (float)local_400._4_4_ * fVar230 + (float)local_520._4_4_ * fVar251 +
                         fVar270 * (float)local_6e0._4_4_;
            fStack_238 = fVar342 * fStack_178 +
                         fStack_3f8 * fVar232 + fStack_518 * fVar252 + fVar273 * fStack_6d8;
            fStack_234 = fVar313 * fStack_174 +
                         fStack_3f4 * fVar234 + fStack_514 * fVar253 + fVar276 * fStack_6d4;
            fStack_230 = fVar152 * fStack_170 +
                         fStack_3f0 * fVar236 + fStack_510 * fVar254 + fVar279 * fStack_6d0;
            fStack_22c = fVar169 * fStack_16c +
                         fStack_3ec * fVar238 + fStack_50c * fVar255 + fVar280 * fStack_6cc;
            fStack_228 = fVar171 * fStack_168 +
                         fStack_3e8 * fVar241 + fStack_508 * fVar256 + fVar281 * fStack_6c8;
            fStack_224 = fStack_224 + fVar296;
            auVar357._0_4_ =
                 fVar258 * (float)local_420._0_4_ +
                 (float)local_e0._0_4_ * fVar217 + (float)local_4c0._0_4_ * fVar244 +
                 fVar311 * (float)local_1c0._0_4_;
            auVar357._4_4_ =
                 fVar270 * (float)local_420._4_4_ +
                 (float)local_e0._4_4_ * fVar230 + (float)local_4c0._4_4_ * fVar251 +
                 fVar237 * (float)local_1c0._4_4_;
            auVar357._8_4_ =
                 fVar273 * fStack_418 + fStack_d8 * fVar232 + fStack_4b8 * fVar252 +
                 fVar342 * fStack_1b8;
            auVar357._12_4_ =
                 fVar276 * fStack_414 + fStack_d4 * fVar234 + fStack_4b4 * fVar253 +
                 fVar313 * fStack_1b4;
            auVar357._16_4_ =
                 fVar279 * fStack_410 + fStack_d0 * fVar236 + fStack_4b0 * fVar254 +
                 fVar152 * fStack_1b0;
            auVar357._20_4_ =
                 fVar280 * fStack_40c + fStack_cc * fVar238 + fStack_4ac * fVar255 +
                 fVar169 * fStack_1ac;
            auVar357._24_4_ =
                 fVar281 * fStack_408 + fStack_c8 * fVar241 + fStack_4a8 * fVar256 +
                 fVar171 * fStack_1a8;
            auVar357._28_4_ = pfVar6[7] + fVar175 + fVar296;
            pfVar4 = (float *)(lVar147 + 0x222b21c + lVar151 * 4);
            fVar217 = *pfVar4;
            fVar230 = pfVar4[1];
            fVar232 = pfVar4[2];
            fVar234 = pfVar4[3];
            fVar236 = pfVar4[4];
            fVar238 = pfVar4[5];
            fVar241 = pfVar4[6];
            pfVar5 = (float *)(lVar147 + 0x222b6a0 + lVar151 * 4);
            fVar244 = *pfVar5;
            fVar251 = pfVar5[1];
            fVar252 = pfVar5[2];
            fVar253 = pfVar5[3];
            fVar254 = pfVar5[4];
            fVar255 = pfVar5[5];
            fVar256 = pfVar5[6];
            _local_5c0 = auVar156;
            pfVar6 = (float *)(lVar147 + 0x222ad98 + lVar151 * 4);
            fVar258 = *pfVar6;
            fVar270 = pfVar6[1];
            fVar273 = pfVar6[2];
            fVar276 = pfVar6[3];
            fVar279 = pfVar6[4];
            fVar280 = pfVar6[5];
            fVar281 = pfVar6[6];
            pfVar7 = (float *)(lVar147 + 0x222a914 + lVar151 * 4);
            fVar311 = *pfVar7;
            fVar237 = pfVar7[1];
            fVar342 = pfVar7[2];
            fVar313 = pfVar7[3];
            fVar152 = pfVar7[4];
            fVar169 = pfVar7[5];
            fVar171 = pfVar7[6];
            auVar320._0_4_ =
                 fVar311 * fVar231 +
                 fVar258 * (float)local_6c0._0_4_ +
                 (float)local_4a0._0_4_ * fVar217 + (float)local_440._0_4_ * fVar244;
            auVar320._4_4_ =
                 fVar237 * fVar233 +
                 fVar270 * (float)local_6c0._4_4_ +
                 (float)local_4a0._4_4_ * fVar230 + (float)local_440._4_4_ * fVar251;
            auVar320._8_4_ =
                 fVar342 * fVar235 +
                 fVar273 * fStack_6b8 + fStack_498 * fVar232 + fStack_438 * fVar252;
            auVar320._12_4_ =
                 fVar313 * fVar204 +
                 fVar276 * fStack_6b4 + fStack_494 * fVar234 + fStack_434 * fVar253;
            auVar320._16_4_ =
                 fVar152 * fVar239 +
                 fVar279 * fStack_6b0 + fStack_490 * fVar236 + fStack_430 * fVar254;
            auVar320._20_4_ =
                 fVar169 * fVar242 +
                 fVar280 * fStack_6ac + fStack_48c * fVar238 + fStack_42c * fVar255;
            auVar320._24_4_ =
                 fVar171 * fVar312 +
                 fVar281 * fStack_6a8 + fStack_488 * fVar241 + fStack_428 * fVar256;
            auVar320._28_4_ = fStack_3e4 + fStack_3e4 + fStack_424 + fStack_224;
            auVar351._0_4_ =
                 fVar311 * (float)local_180._0_4_ +
                 fVar258 * (float)local_6e0._0_4_ +
                 (float)local_400._0_4_ * fVar217 + (float)local_520._0_4_ * fVar244;
            auVar351._4_4_ =
                 fVar237 * (float)local_180._4_4_ +
                 fVar270 * (float)local_6e0._4_4_ +
                 (float)local_400._4_4_ * fVar230 + (float)local_520._4_4_ * fVar251;
            auVar351._8_4_ =
                 fVar342 * fStack_178 +
                 fVar273 * fStack_6d8 + fStack_3f8 * fVar232 + fStack_518 * fVar252;
            auVar351._12_4_ =
                 fVar313 * fStack_174 +
                 fVar276 * fStack_6d4 + fStack_3f4 * fVar234 + fStack_514 * fVar253;
            auVar351._16_4_ =
                 fVar152 * fStack_170 +
                 fVar279 * fStack_6d0 + fStack_3f0 * fVar236 + fStack_510 * fVar254;
            auVar351._20_4_ =
                 fVar169 * fStack_16c +
                 fVar280 * fStack_6cc + fStack_3ec * fVar238 + fStack_50c * fVar255;
            auVar351._24_4_ =
                 fVar171 * fStack_168 +
                 fVar281 * fStack_6c8 + fStack_3e8 * fVar241 + fStack_508 * fVar256;
            auVar351._28_4_ = fStack_3e4 + fStack_3e4 + fStack_504 + fStack_224;
            auVar269._8_4_ = 0x7fffffff;
            auVar269._0_8_ = 0x7fffffff7fffffff;
            auVar269._12_4_ = 0x7fffffff;
            auVar269._16_4_ = 0x7fffffff;
            auVar269._20_4_ = 0x7fffffff;
            auVar269._24_4_ = 0x7fffffff;
            auVar269._28_4_ = 0x7fffffff;
            auVar135._4_4_ = fStack_4fc;
            auVar135._0_4_ = local_500;
            auVar135._8_4_ = fStack_4f8;
            auVar135._12_4_ = fStack_4f4;
            auVar135._16_4_ = fStack_4f0;
            auVar135._20_4_ = fStack_4ec;
            auVar135._24_4_ = fStack_4e8;
            auVar135._28_4_ = fStack_4e4;
            auVar26 = vandps_avx(auVar135,auVar269);
            auVar137._4_4_ = fStack_23c;
            auVar137._0_4_ = local_240;
            auVar137._8_4_ = fStack_238;
            auVar137._12_4_ = fStack_234;
            auVar137._16_4_ = fStack_230;
            auVar137._20_4_ = fStack_22c;
            auVar137._24_4_ = fStack_228;
            auVar137._28_4_ = fStack_224;
            auVar27 = vandps_avx(auVar137,auVar269);
            auVar27 = vmaxps_avx(auVar26,auVar27);
            auVar26 = vandps_avx(auVar357,auVar269);
            auVar27 = vmaxps_avx(auVar27,auVar26);
            auVar27 = vcmpps_avx(auVar27,local_260,1);
            auVar28 = vblendvps_avx(auVar135,local_220,auVar27);
            auVar163._0_4_ =
                 fVar311 * (float)local_1c0._0_4_ +
                 fVar258 * (float)local_420._0_4_ +
                 (float)local_4c0._0_4_ * fVar244 + (float)local_e0._0_4_ * fVar217;
            auVar163._4_4_ =
                 fVar237 * (float)local_1c0._4_4_ +
                 fVar270 * (float)local_420._4_4_ +
                 (float)local_4c0._4_4_ * fVar251 + (float)local_e0._4_4_ * fVar230;
            auVar163._8_4_ =
                 fVar342 * fStack_1b8 +
                 fVar273 * fStack_418 + fStack_4b8 * fVar252 + fStack_d8 * fVar232;
            auVar163._12_4_ =
                 fVar313 * fStack_1b4 +
                 fVar276 * fStack_414 + fStack_4b4 * fVar253 + fStack_d4 * fVar234;
            auVar163._16_4_ =
                 fVar152 * fStack_1b0 +
                 fVar279 * fStack_410 + fStack_4b0 * fVar254 + fStack_d0 * fVar236;
            auVar163._20_4_ =
                 fVar169 * fStack_1ac +
                 fVar280 * fStack_40c + fStack_4ac * fVar255 + fStack_cc * fVar238;
            auVar163._24_4_ =
                 fVar171 * fStack_1a8 +
                 fVar281 * fStack_408 + fStack_4a8 * fVar256 + fStack_c8 * fVar241;
            auVar163._28_4_ = auVar26._28_4_ + pfVar6[7] + pfVar5[7] + pfVar4[7];
            auVar29 = vblendvps_avx(auVar137,auVar25,auVar27);
            auVar26 = vandps_avx(auVar320,auVar269);
            auVar27 = vandps_avx(auVar351,auVar269);
            auVar30 = vmaxps_avx(auVar26,auVar27);
            auVar26 = vandps_avx(auVar163,auVar269);
            auVar26 = vmaxps_avx(auVar30,auVar26);
            local_700._0_4_ = auVar141._0_4_;
            local_700._4_4_ = auVar141._4_4_;
            fStack_6f8 = auVar141._8_4_;
            fStack_6f4 = auVar141._12_4_;
            auStack_6f0._0_4_ = auVar141._16_4_;
            auStack_6f0._4_4_ = auVar141._20_4_;
            fStack_6e8 = auVar141._24_4_;
            auVar27 = vcmpps_avx(auVar26,local_260,1);
            auVar26 = vblendvps_avx(auVar320,local_220,auVar27);
            auVar164._0_4_ =
                 (float)local_1c0._0_4_ * (float)local_700._0_4_ +
                 fVar153 + fVar177 + (float)local_4c0._0_4_ * fVar314;
            auVar164._4_4_ =
                 (float)local_1c0._4_4_ * (float)local_700._4_4_ +
                 fVar170 + fVar195 + (float)local_4c0._4_4_ * fVar240;
            auVar164._8_4_ = fStack_1b8 * fStack_6f8 + fVar172 + fVar197 + fStack_4b8 * fVar343;
            auVar164._12_4_ = fStack_1b4 * fStack_6f4 + fVar257 + fVar199 + fStack_4b4 * fVar333;
            auVar164._16_4_ =
                 fStack_1b0 * (float)auStack_6f0._0_4_ + fVar295 + fVar200 + fStack_4b0 * fVar338;
            auVar164._20_4_ =
                 fStack_1ac * (float)auStack_6f0._4_4_ + fVar173 + fVar202 + fStack_4ac * fVar243;
            auVar164._24_4_ = fStack_1a8 * fStack_6e8 + fVar174 + fVar203 + fStack_4a8 * fVar341;
            auVar164._28_4_ = auVar30._28_4_ + fStack_5e4 + auVar25._28_4_ + 0.0;
            auVar25 = vblendvps_avx(auVar351,auVar25,auVar27);
            fVar153 = auVar28._0_4_;
            fVar170 = auVar28._4_4_;
            fVar172 = auVar28._8_4_;
            fVar257 = auVar28._12_4_;
            fVar295 = auVar28._16_4_;
            fVar231 = auVar28._20_4_;
            fVar233 = auVar28._24_4_;
            fVar235 = auVar28._28_4_;
            fVar258 = auVar26._0_4_;
            fVar273 = auVar26._4_4_;
            fVar279 = auVar26._8_4_;
            fVar281 = auVar26._12_4_;
            fVar237 = auVar26._16_4_;
            fVar313 = auVar26._20_4_;
            fVar240 = auVar26._24_4_;
            fVar217 = auVar29._0_4_;
            fVar232 = auVar29._4_4_;
            fVar236 = auVar29._8_4_;
            fVar241 = auVar29._12_4_;
            fVar251 = auVar29._16_4_;
            fVar253 = auVar29._20_4_;
            fVar255 = auVar29._24_4_;
            auVar336._0_4_ = fVar217 * fVar217 + fVar153 * fVar153;
            auVar336._4_4_ = fVar232 * fVar232 + fVar170 * fVar170;
            auVar336._8_4_ = fVar236 * fVar236 + fVar172 * fVar172;
            auVar336._12_4_ = fVar241 * fVar241 + fVar257 * fVar257;
            auVar336._16_4_ = fVar251 * fVar251 + fVar295 * fVar295;
            auVar336._20_4_ = fVar253 * fVar253 + fVar231 * fVar231;
            auVar336._24_4_ = fVar255 * fVar255 + fVar233 * fVar233;
            auVar336._28_4_ = auVar156._28_4_ + fStack_224;
            auVar27 = vrsqrtps_avx(auVar336);
            fVar230 = auVar27._0_4_;
            fVar234 = auVar27._4_4_;
            auVar78._4_4_ = fVar234 * 1.5;
            auVar78._0_4_ = fVar230 * 1.5;
            fVar238 = auVar27._8_4_;
            auVar78._8_4_ = fVar238 * 1.5;
            fVar244 = auVar27._12_4_;
            auVar78._12_4_ = fVar244 * 1.5;
            fVar252 = auVar27._16_4_;
            auVar78._16_4_ = fVar252 * 1.5;
            fVar254 = auVar27._20_4_;
            auVar78._20_4_ = fVar254 * 1.5;
            fVar256 = auVar27._24_4_;
            auVar78._24_4_ = fVar256 * 1.5;
            auVar78._28_4_ = auVar351._28_4_;
            auVar79._4_4_ = fVar234 * fVar234 * fVar234 * auVar336._4_4_ * 0.5;
            auVar79._0_4_ = fVar230 * fVar230 * fVar230 * auVar336._0_4_ * 0.5;
            auVar79._8_4_ = fVar238 * fVar238 * fVar238 * auVar336._8_4_ * 0.5;
            auVar79._12_4_ = fVar244 * fVar244 * fVar244 * auVar336._12_4_ * 0.5;
            auVar79._16_4_ = fVar252 * fVar252 * fVar252 * auVar336._16_4_ * 0.5;
            auVar79._20_4_ = fVar254 * fVar254 * fVar254 * auVar336._20_4_ * 0.5;
            auVar79._24_4_ = fVar256 * fVar256 * fVar256 * auVar336._24_4_ * 0.5;
            auVar79._28_4_ = auVar336._28_4_;
            auVar28 = vsubps_avx(auVar78,auVar79);
            fVar333 = auVar28._0_4_;
            fVar338 = auVar28._4_4_;
            fVar243 = auVar28._8_4_;
            fVar341 = auVar28._12_4_;
            fVar152 = auVar28._16_4_;
            fVar169 = auVar28._20_4_;
            fVar171 = auVar28._24_4_;
            fVar230 = auVar25._0_4_;
            fVar234 = auVar25._4_4_;
            fVar238 = auVar25._8_4_;
            fVar244 = auVar25._12_4_;
            fVar252 = auVar25._16_4_;
            fVar254 = auVar25._20_4_;
            fVar256 = auVar25._24_4_;
            auVar309._0_4_ = fVar230 * fVar230 + fVar258 * fVar258;
            auVar309._4_4_ = fVar234 * fVar234 + fVar273 * fVar273;
            auVar309._8_4_ = fVar238 * fVar238 + fVar279 * fVar279;
            auVar309._12_4_ = fVar244 * fVar244 + fVar281 * fVar281;
            auVar309._16_4_ = fVar252 * fVar252 + fVar237 * fVar237;
            auVar309._20_4_ = fVar254 * fVar254 + fVar313 * fVar313;
            auVar309._24_4_ = fVar256 * fVar256 + fVar240 * fVar240;
            auVar309._28_4_ = auVar27._28_4_ + auVar26._28_4_;
            auVar25 = vrsqrtps_avx(auVar309);
            fVar270 = auVar25._0_4_;
            fVar276 = auVar25._4_4_;
            auVar80._4_4_ = fVar276 * 1.5;
            auVar80._0_4_ = fVar270 * 1.5;
            fVar280 = auVar25._8_4_;
            auVar80._8_4_ = fVar280 * 1.5;
            fVar311 = auVar25._12_4_;
            auVar80._12_4_ = fVar311 * 1.5;
            fVar342 = auVar25._16_4_;
            auVar80._16_4_ = fVar342 * 1.5;
            fVar314 = auVar25._20_4_;
            auVar80._20_4_ = fVar314 * 1.5;
            fVar343 = auVar25._24_4_;
            auVar80._24_4_ = fVar343 * 1.5;
            auVar80._28_4_ = auVar351._28_4_;
            auVar81._4_4_ = fVar276 * fVar276 * fVar276 * auVar309._4_4_ * 0.5;
            auVar81._0_4_ = fVar270 * fVar270 * fVar270 * auVar309._0_4_ * 0.5;
            auVar81._8_4_ = fVar280 * fVar280 * fVar280 * auVar309._8_4_ * 0.5;
            auVar81._12_4_ = fVar311 * fVar311 * fVar311 * auVar309._12_4_ * 0.5;
            auVar81._16_4_ = fVar342 * fVar342 * fVar342 * auVar309._16_4_ * 0.5;
            auVar81._20_4_ = fVar314 * fVar314 * fVar314 * auVar309._20_4_ * 0.5;
            auVar81._24_4_ = fVar343 * fVar343 * fVar343 * auVar309._24_4_ * 0.5;
            auVar81._28_4_ = auVar309._28_4_;
            auVar26 = vsubps_avx(auVar80,auVar81);
            fVar270 = auVar26._0_4_;
            fVar276 = auVar26._4_4_;
            fVar280 = auVar26._8_4_;
            fVar311 = auVar26._12_4_;
            fVar342 = auVar26._16_4_;
            fVar314 = auVar26._20_4_;
            fVar343 = auVar26._24_4_;
            fVar217 = local_7e0 * fVar333 * fVar217;
            fVar232 = fStack_7dc * fVar338 * fVar232;
            auVar82._4_4_ = fVar232;
            auVar82._0_4_ = fVar217;
            fVar236 = fStack_7d8 * fVar243 * fVar236;
            auVar82._8_4_ = fVar236;
            fVar241 = fStack_7d4 * fVar341 * fVar241;
            auVar82._12_4_ = fVar241;
            fVar251 = fStack_7d0 * fVar152 * fVar251;
            auVar82._16_4_ = fVar251;
            fVar253 = fStack_7cc * fVar169 * fVar253;
            auVar82._20_4_ = fVar253;
            fVar255 = fStack_7c8 * fVar171 * fVar255;
            auVar82._24_4_ = fVar255;
            auVar82._28_4_ = auVar25._28_4_;
            local_700._4_4_ = fVar232 + auVar366._4_4_;
            local_700._0_4_ = fVar217 + auVar366._0_4_;
            fStack_6f8 = fVar236 + auVar366._8_4_;
            fStack_6f4 = fVar241 + auVar366._12_4_;
            auStack_6f0._0_4_ = fVar251 + auVar366._16_4_;
            auStack_6f0._4_4_ = fVar253 + auVar366._20_4_;
            fStack_6e8 = fVar255 + auVar366._24_4_;
            fStack_6e4 = auVar25._28_4_ + auVar366._28_4_;
            local_5e0 = local_7e0 * fVar333 * -fVar153;
            fStack_5dc = fStack_7dc * fVar338 * -fVar170;
            auVar83._4_4_ = fStack_5dc;
            auVar83._0_4_ = local_5e0;
            fStack_5d8 = fStack_7d8 * fVar243 * -fVar172;
            auVar83._8_4_ = fStack_5d8;
            fStack_5d4 = fStack_7d4 * fVar341 * -fVar257;
            auVar83._12_4_ = fStack_5d4;
            fStack_5d0 = fStack_7d0 * fVar152 * -fVar295;
            auVar83._16_4_ = fStack_5d0;
            fStack_5cc = fStack_7cc * fVar169 * -fVar231;
            auVar83._20_4_ = fStack_5cc;
            fStack_5c8 = fStack_7c8 * fVar171 * -fVar233;
            auVar83._24_4_ = fStack_5c8;
            auVar83._28_4_ = -fVar235;
            local_5e0 = (float)local_620._0_4_ + local_5e0;
            fStack_5dc = (float)local_620._4_4_ + fStack_5dc;
            fStack_5d8 = fStack_618 + fStack_5d8;
            fStack_5d4 = fStack_614 + fStack_5d4;
            fStack_5d0 = register0x00001290 + fStack_5d0;
            fStack_5cc = register0x00001294 + fStack_5cc;
            fStack_5c8 = register0x00001298 + fStack_5c8;
            fStack_5c4 = register0x0000129c + -fVar235;
            fVar217 = fVar333 * 0.0 * local_7e0;
            fVar232 = fVar338 * 0.0 * fStack_7dc;
            auVar84._4_4_ = fVar232;
            auVar84._0_4_ = fVar217;
            fVar236 = fVar243 * 0.0 * fStack_7d8;
            auVar84._8_4_ = fVar236;
            fVar241 = fVar341 * 0.0 * fStack_7d4;
            auVar84._12_4_ = fVar241;
            fVar251 = fVar152 * 0.0 * fStack_7d0;
            auVar84._16_4_ = fVar251;
            fVar253 = fVar169 * 0.0 * fStack_7cc;
            auVar84._20_4_ = fVar253;
            fVar255 = fVar171 * 0.0 * fStack_7c8;
            auVar84._24_4_ = fVar255;
            auVar84._28_4_ = fVar235;
            auVar31 = vsubps_avx(auVar366,auVar82);
            auVar378._0_4_ = fVar217 + auVar164._0_4_;
            auVar378._4_4_ = fVar232 + auVar164._4_4_;
            auVar378._8_4_ = fVar236 + auVar164._8_4_;
            auVar378._12_4_ = fVar241 + auVar164._12_4_;
            auVar378._16_4_ = fVar251 + auVar164._16_4_;
            auVar378._20_4_ = fVar253 + auVar164._20_4_;
            auVar378._24_4_ = fVar255 + auVar164._24_4_;
            auVar378._28_4_ = fVar235 + auVar164._28_4_;
            fVar217 = auVar305._0_4_ * fVar270 * fVar230;
            fVar230 = auVar305._4_4_ * fVar276 * fVar234;
            auVar85._4_4_ = fVar230;
            auVar85._0_4_ = fVar217;
            fVar232 = auVar305._8_4_ * fVar280 * fVar238;
            auVar85._8_4_ = fVar232;
            fVar234 = auVar305._12_4_ * fVar311 * fVar244;
            auVar85._12_4_ = fVar234;
            fVar236 = auVar305._16_4_ * fVar342 * fVar252;
            auVar85._16_4_ = fVar236;
            fVar238 = auVar305._20_4_ * fVar314 * fVar254;
            auVar85._20_4_ = fVar238;
            fVar241 = auVar305._24_4_ * fVar343 * fVar256;
            auVar85._24_4_ = fVar241;
            auVar85._28_4_ = fStack_7c4;
            auVar157 = vsubps_avx(_local_620,auVar83);
            auVar358._0_4_ = auVar356._0_4_ + fVar217;
            auVar358._4_4_ = auVar356._4_4_ + fVar230;
            auVar358._8_4_ = auVar356._8_4_ + fVar232;
            auVar358._12_4_ = auVar356._12_4_ + fVar234;
            auVar358._16_4_ = auVar356._16_4_ + fVar236;
            auVar358._20_4_ = auVar356._20_4_ + fVar238;
            auVar358._24_4_ = auVar356._24_4_ + fVar241;
            auVar358._28_4_ = auVar356._28_4_ + fStack_7c4;
            fVar217 = fVar270 * -fVar258 * auVar305._0_4_;
            fVar230 = fVar276 * -fVar273 * auVar305._4_4_;
            auVar86._4_4_ = fVar230;
            auVar86._0_4_ = fVar217;
            fVar232 = fVar280 * -fVar279 * auVar305._8_4_;
            auVar86._8_4_ = fVar232;
            fVar234 = fVar311 * -fVar281 * auVar305._12_4_;
            auVar86._12_4_ = fVar234;
            fVar236 = fVar342 * -fVar237 * auVar305._16_4_;
            auVar86._16_4_ = fVar236;
            fVar238 = fVar314 * -fVar313 * auVar305._20_4_;
            auVar86._20_4_ = fVar238;
            fVar241 = fVar343 * -fVar240 * auVar305._24_4_;
            auVar86._24_4_ = fVar241;
            auVar86._28_4_ = auVar366._28_4_;
            auVar158 = vsubps_avx(auVar164,auVar84);
            auVar249._0_4_ = (float)local_6a0._0_4_ + fVar217;
            auVar249._4_4_ = (float)local_6a0._4_4_ + fVar230;
            auVar249._8_4_ = fStack_698 + fVar232;
            auVar249._12_4_ = fStack_694 + fVar234;
            auVar249._16_4_ = register0x00001350 + fVar236;
            auVar249._20_4_ = register0x00001354 + fVar238;
            auVar249._24_4_ = register0x00001358 + fVar241;
            auVar249._28_4_ = register0x0000135c + auVar366._28_4_;
            fVar217 = fVar270 * 0.0 * auVar305._0_4_;
            fVar230 = fVar276 * 0.0 * auVar305._4_4_;
            auVar87._4_4_ = fVar230;
            auVar87._0_4_ = fVar217;
            fVar232 = fVar280 * 0.0 * auVar305._8_4_;
            auVar87._8_4_ = fVar232;
            fVar234 = fVar311 * 0.0 * auVar305._12_4_;
            auVar87._12_4_ = fVar234;
            fVar236 = fVar342 * 0.0 * auVar305._16_4_;
            auVar87._16_4_ = fVar236;
            fVar238 = fVar314 * 0.0 * auVar305._20_4_;
            auVar87._20_4_ = fVar238;
            fVar241 = fVar343 * 0.0 * auVar305._24_4_;
            auVar87._24_4_ = fVar241;
            auVar87._28_4_ = auVar164._28_4_;
            auVar25 = vsubps_avx(auVar356,auVar85);
            auVar132._4_4_ = fStack_5fc;
            auVar132._0_4_ = local_600;
            auVar132._8_4_ = fStack_5f8;
            auVar132._12_4_ = fStack_5f4;
            auVar132._16_4_ = fStack_5f0;
            auVar132._20_4_ = fStack_5ec;
            auVar132._24_4_ = fStack_5e8;
            auVar132._28_4_ = fStack_5e4;
            auVar321._0_4_ = local_600 + fVar217;
            auVar321._4_4_ = fStack_5fc + fVar230;
            auVar321._8_4_ = fStack_5f8 + fVar232;
            auVar321._12_4_ = fStack_5f4 + fVar234;
            auVar321._16_4_ = fStack_5f0 + fVar236;
            auVar321._20_4_ = fStack_5ec + fVar238;
            auVar321._24_4_ = fStack_5e8 + fVar241;
            auVar321._28_4_ = fStack_5e4 + auVar164._28_4_;
            auVar27 = vsubps_avx(_local_6a0,auVar86);
            auVar28 = vsubps_avx(auVar132,auVar87);
            auVar29 = vsubps_avx(auVar249,auVar157);
            auVar30 = vsubps_avx(auVar321,auVar158);
            auVar88._4_4_ = auVar158._4_4_ * auVar29._4_4_;
            auVar88._0_4_ = auVar158._0_4_ * auVar29._0_4_;
            auVar88._8_4_ = auVar158._8_4_ * auVar29._8_4_;
            auVar88._12_4_ = auVar158._12_4_ * auVar29._12_4_;
            auVar88._16_4_ = auVar158._16_4_ * auVar29._16_4_;
            auVar88._20_4_ = auVar158._20_4_ * auVar29._20_4_;
            auVar88._24_4_ = auVar158._24_4_ * auVar29._24_4_;
            auVar88._28_4_ = auVar351._28_4_;
            auVar89._4_4_ = auVar157._4_4_ * auVar30._4_4_;
            auVar89._0_4_ = auVar157._0_4_ * auVar30._0_4_;
            auVar89._8_4_ = auVar157._8_4_ * auVar30._8_4_;
            auVar89._12_4_ = auVar157._12_4_ * auVar30._12_4_;
            auVar89._16_4_ = auVar157._16_4_ * auVar30._16_4_;
            auVar89._20_4_ = auVar157._20_4_ * auVar30._20_4_;
            auVar89._24_4_ = auVar157._24_4_ * auVar30._24_4_;
            auVar89._28_4_ = register0x0000135c;
            auVar32 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = auVar31._4_4_ * auVar30._4_4_;
            auVar90._0_4_ = auVar31._0_4_ * auVar30._0_4_;
            auVar90._8_4_ = auVar31._8_4_ * auVar30._8_4_;
            auVar90._12_4_ = auVar31._12_4_ * auVar30._12_4_;
            auVar90._16_4_ = auVar31._16_4_ * auVar30._16_4_;
            auVar90._20_4_ = auVar31._20_4_ * auVar30._20_4_;
            auVar90._24_4_ = auVar31._24_4_ * auVar30._24_4_;
            auVar90._28_4_ = auVar30._28_4_;
            auVar30 = vsubps_avx(auVar358,auVar31);
            auVar91._4_4_ = auVar158._4_4_ * auVar30._4_4_;
            auVar91._0_4_ = auVar158._0_4_ * auVar30._0_4_;
            auVar91._8_4_ = auVar158._8_4_ * auVar30._8_4_;
            auVar91._12_4_ = auVar158._12_4_ * auVar30._12_4_;
            auVar91._16_4_ = auVar158._16_4_ * auVar30._16_4_;
            auVar91._20_4_ = auVar158._20_4_ * auVar30._20_4_;
            auVar91._24_4_ = auVar158._24_4_ * auVar30._24_4_;
            auVar91._28_4_ = auVar26._28_4_;
            auVar33 = vsubps_avx(auVar91,auVar90);
            auVar92._4_4_ = auVar157._4_4_ * auVar30._4_4_;
            auVar92._0_4_ = auVar157._0_4_ * auVar30._0_4_;
            auVar92._8_4_ = auVar157._8_4_ * auVar30._8_4_;
            auVar92._12_4_ = auVar157._12_4_ * auVar30._12_4_;
            auVar92._16_4_ = auVar157._16_4_ * auVar30._16_4_;
            auVar92._20_4_ = auVar157._20_4_ * auVar30._20_4_;
            auVar92._24_4_ = auVar157._24_4_ * auVar30._24_4_;
            auVar92._28_4_ = auVar26._28_4_;
            auVar93._4_4_ = auVar31._4_4_ * auVar29._4_4_;
            auVar93._0_4_ = auVar31._0_4_ * auVar29._0_4_;
            auVar93._8_4_ = auVar31._8_4_ * auVar29._8_4_;
            auVar93._12_4_ = auVar31._12_4_ * auVar29._12_4_;
            auVar93._16_4_ = auVar31._16_4_ * auVar29._16_4_;
            auVar93._20_4_ = auVar31._20_4_ * auVar29._20_4_;
            auVar93._24_4_ = auVar31._24_4_ * auVar29._24_4_;
            auVar93._28_4_ = auVar29._28_4_;
            auVar26 = vsubps_avx(auVar93,auVar92);
            auVar188._0_4_ = auVar32._0_4_ * 0.0 + auVar26._0_4_ + auVar33._0_4_ * 0.0;
            auVar188._4_4_ = auVar32._4_4_ * 0.0 + auVar26._4_4_ + auVar33._4_4_ * 0.0;
            auVar188._8_4_ = auVar32._8_4_ * 0.0 + auVar26._8_4_ + auVar33._8_4_ * 0.0;
            auVar188._12_4_ = auVar32._12_4_ * 0.0 + auVar26._12_4_ + auVar33._12_4_ * 0.0;
            auVar188._16_4_ = auVar32._16_4_ * 0.0 + auVar26._16_4_ + auVar33._16_4_ * 0.0;
            auVar188._20_4_ = auVar32._20_4_ * 0.0 + auVar26._20_4_ + auVar33._20_4_ * 0.0;
            auVar188._24_4_ = auVar32._24_4_ * 0.0 + auVar26._24_4_ + auVar33._24_4_ * 0.0;
            auVar188._28_4_ = auVar32._28_4_ + auVar26._28_4_ + auVar33._28_4_;
            auVar24 = vcmpps_avx(auVar188,ZEXT832(0) << 0x20,2);
            auVar25 = vblendvps_avx(auVar25,_local_700,auVar24);
            auVar134._4_4_ = fStack_5dc;
            auVar134._0_4_ = local_5e0;
            auVar134._8_4_ = fStack_5d8;
            auVar134._12_4_ = fStack_5d4;
            auVar134._16_4_ = fStack_5d0;
            auVar134._20_4_ = fStack_5cc;
            auVar134._24_4_ = fStack_5c8;
            auVar134._28_4_ = fStack_5c4;
            auVar26 = vblendvps_avx(auVar27,auVar134,auVar24);
            auVar27 = vblendvps_avx(auVar28,auVar378,auVar24);
            auVar28 = vblendvps_avx(auVar31,auVar358,auVar24);
            auVar29 = vblendvps_avx(auVar157,auVar249,auVar24);
            auVar30 = vblendvps_avx(auVar158,auVar321,auVar24);
            auVar31 = vblendvps_avx(auVar358,auVar31,auVar24);
            auVar32 = vblendvps_avx(auVar249,auVar157,auVar24);
            auVar33 = vblendvps_avx(auVar321,auVar158,auVar24);
            _local_620 = vandps_avx(auVar156,auVar229);
            auVar31 = vsubps_avx(auVar31,auVar25);
            auVar181 = vsubps_avx(auVar32,auVar26);
            auVar33 = vsubps_avx(auVar33,auVar27);
            auVar156 = vsubps_avx(auVar26,auVar29);
            auVar310 = ZEXT3264(auVar156);
            fVar217 = auVar181._0_4_;
            fVar175 = auVar27._0_4_;
            fVar244 = auVar181._4_4_;
            fVar177 = auVar27._4_4_;
            auVar94._4_4_ = fVar177 * fVar244;
            auVar94._0_4_ = fVar175 * fVar217;
            fVar258 = auVar181._8_4_;
            fVar195 = auVar27._8_4_;
            auVar94._8_4_ = fVar195 * fVar258;
            fVar311 = auVar181._12_4_;
            fVar197 = auVar27._12_4_;
            auVar94._12_4_ = fVar197 * fVar311;
            fVar333 = auVar181._16_4_;
            fVar199 = auVar27._16_4_;
            auVar94._16_4_ = fVar199 * fVar333;
            fVar153 = auVar181._20_4_;
            fVar200 = auVar27._20_4_;
            auVar94._20_4_ = fVar200 * fVar153;
            fVar235 = auVar181._24_4_;
            fVar202 = auVar27._24_4_;
            auVar94._24_4_ = fVar202 * fVar235;
            auVar94._28_4_ = auVar32._28_4_;
            fVar230 = auVar26._0_4_;
            fVar203 = auVar33._0_4_;
            fVar251 = auVar26._4_4_;
            fVar296 = auVar33._4_4_;
            auVar95._4_4_ = fVar296 * fVar251;
            auVar95._0_4_ = fVar203 * fVar230;
            fVar270 = auVar26._8_4_;
            fVar325 = auVar33._8_4_;
            auVar95._8_4_ = fVar325 * fVar270;
            fVar237 = auVar26._12_4_;
            fVar327 = auVar33._12_4_;
            auVar95._12_4_ = fVar327 * fVar237;
            fVar338 = auVar26._16_4_;
            fVar328 = auVar33._16_4_;
            auVar95._16_4_ = fVar328 * fVar338;
            fVar170 = auVar26._20_4_;
            fVar329 = auVar33._20_4_;
            auVar95._20_4_ = fVar329 * fVar170;
            fVar204 = auVar26._24_4_;
            fVar330 = auVar33._24_4_;
            uVar8 = auVar157._28_4_;
            auVar95._24_4_ = fVar330 * fVar204;
            auVar95._28_4_ = uVar8;
            auVar32 = vsubps_avx(auVar95,auVar94);
            fVar232 = auVar25._0_4_;
            fVar252 = auVar25._4_4_;
            auVar96._4_4_ = fVar296 * fVar252;
            auVar96._0_4_ = fVar203 * fVar232;
            fVar273 = auVar25._8_4_;
            auVar96._8_4_ = fVar325 * fVar273;
            fVar342 = auVar25._12_4_;
            auVar96._12_4_ = fVar327 * fVar342;
            fVar243 = auVar25._16_4_;
            auVar96._16_4_ = fVar328 * fVar243;
            fVar172 = auVar25._20_4_;
            auVar96._20_4_ = fVar329 * fVar172;
            fVar239 = auVar25._24_4_;
            auVar96._24_4_ = fVar330 * fVar239;
            auVar96._28_4_ = uVar8;
            fVar234 = auVar31._0_4_;
            fVar253 = auVar31._4_4_;
            auVar97._4_4_ = fVar177 * fVar253;
            auVar97._0_4_ = fVar175 * fVar234;
            fVar276 = auVar31._8_4_;
            auVar97._8_4_ = fVar195 * fVar276;
            fVar313 = auVar31._12_4_;
            auVar97._12_4_ = fVar197 * fVar313;
            fVar341 = auVar31._16_4_;
            auVar97._16_4_ = fVar199 * fVar341;
            fVar257 = auVar31._20_4_;
            auVar97._20_4_ = fVar200 * fVar257;
            fVar242 = auVar31._24_4_;
            auVar97._24_4_ = fVar202 * fVar242;
            auVar97._28_4_ = auVar358._28_4_;
            auVar157 = vsubps_avx(auVar97,auVar96);
            auVar98._4_4_ = fVar251 * fVar253;
            auVar98._0_4_ = fVar230 * fVar234;
            auVar98._8_4_ = fVar270 * fVar276;
            auVar98._12_4_ = fVar237 * fVar313;
            auVar98._16_4_ = fVar338 * fVar341;
            auVar98._20_4_ = fVar170 * fVar257;
            auVar98._24_4_ = fVar204 * fVar242;
            auVar98._28_4_ = uVar8;
            auVar99._4_4_ = fVar252 * fVar244;
            auVar99._0_4_ = fVar232 * fVar217;
            auVar99._8_4_ = fVar273 * fVar258;
            auVar99._12_4_ = fVar342 * fVar311;
            auVar99._16_4_ = fVar243 * fVar333;
            auVar99._20_4_ = fVar172 * fVar153;
            auVar99._24_4_ = fVar239 * fVar235;
            auVar99._28_4_ = auVar158._28_4_;
            auVar158 = vsubps_avx(auVar99,auVar98);
            auVar182 = vsubps_avx(auVar27,auVar30);
            fVar238 = auVar158._28_4_ + auVar157._28_4_;
            local_780._0_4_ = auVar158._0_4_ + auVar157._0_4_ * 0.0 + auVar32._0_4_ * 0.0;
            local_780._4_4_ = auVar158._4_4_ + auVar157._4_4_ * 0.0 + auVar32._4_4_ * 0.0;
            fStack_778 = auVar158._8_4_ + auVar157._8_4_ * 0.0 + auVar32._8_4_ * 0.0;
            fStack_774 = auVar158._12_4_ + auVar157._12_4_ * 0.0 + auVar32._12_4_ * 0.0;
            register0x00001490 = auVar158._16_4_ + auVar157._16_4_ * 0.0 + auVar32._16_4_ * 0.0;
            register0x00001494 = auVar158._20_4_ + auVar157._20_4_ * 0.0 + auVar32._20_4_ * 0.0;
            register0x00001498 = auVar158._24_4_ + auVar157._24_4_ * 0.0 + auVar32._24_4_ * 0.0;
            register0x0000149c = fVar238 + auVar32._28_4_;
            fVar236 = auVar156._0_4_;
            fVar254 = auVar156._4_4_;
            auVar100._4_4_ = auVar30._4_4_ * fVar254;
            auVar100._0_4_ = auVar30._0_4_ * fVar236;
            fVar279 = auVar156._8_4_;
            auVar100._8_4_ = auVar30._8_4_ * fVar279;
            fVar314 = auVar156._12_4_;
            auVar100._12_4_ = auVar30._12_4_ * fVar314;
            fVar152 = auVar156._16_4_;
            auVar100._16_4_ = auVar30._16_4_ * fVar152;
            fVar295 = auVar156._20_4_;
            auVar100._20_4_ = auVar30._20_4_ * fVar295;
            fVar312 = auVar156._24_4_;
            auVar100._24_4_ = auVar30._24_4_ * fVar312;
            auVar100._28_4_ = fVar238;
            fVar238 = auVar182._0_4_;
            fVar255 = auVar182._4_4_;
            auVar101._4_4_ = auVar29._4_4_ * fVar255;
            auVar101._0_4_ = auVar29._0_4_ * fVar238;
            fVar280 = auVar182._8_4_;
            auVar101._8_4_ = auVar29._8_4_ * fVar280;
            fVar240 = auVar182._12_4_;
            auVar101._12_4_ = auVar29._12_4_ * fVar240;
            fVar169 = auVar182._16_4_;
            auVar101._16_4_ = auVar29._16_4_ * fVar169;
            fVar231 = auVar182._20_4_;
            auVar101._20_4_ = auVar29._20_4_ * fVar231;
            fVar173 = auVar182._24_4_;
            auVar101._24_4_ = auVar29._24_4_ * fVar173;
            auVar101._28_4_ = auVar158._28_4_;
            auVar156 = vsubps_avx(auVar101,auVar100);
            auVar157 = vsubps_avx(auVar25,auVar28);
            fVar241 = auVar157._0_4_;
            fVar256 = auVar157._4_4_;
            auVar102._4_4_ = auVar30._4_4_ * fVar256;
            auVar102._0_4_ = auVar30._0_4_ * fVar241;
            fVar281 = auVar157._8_4_;
            auVar102._8_4_ = auVar30._8_4_ * fVar281;
            fVar343 = auVar157._12_4_;
            auVar102._12_4_ = auVar30._12_4_ * fVar343;
            fVar171 = auVar157._16_4_;
            auVar102._16_4_ = auVar30._16_4_ * fVar171;
            fVar233 = auVar157._20_4_;
            auVar102._20_4_ = auVar30._20_4_ * fVar233;
            fVar174 = auVar157._24_4_;
            auVar102._24_4_ = auVar30._24_4_ * fVar174;
            auVar102._28_4_ = auVar30._28_4_;
            auVar103._4_4_ = fVar255 * auVar28._4_4_;
            auVar103._0_4_ = fVar238 * auVar28._0_4_;
            auVar103._8_4_ = fVar280 * auVar28._8_4_;
            auVar103._12_4_ = fVar240 * auVar28._12_4_;
            auVar103._16_4_ = fVar169 * auVar28._16_4_;
            auVar103._20_4_ = fVar231 * auVar28._20_4_;
            auVar103._24_4_ = fVar173 * auVar28._24_4_;
            auVar103._28_4_ = auVar32._28_4_;
            auVar30 = vsubps_avx(auVar102,auVar103);
            auVar104._4_4_ = auVar29._4_4_ * fVar256;
            auVar104._0_4_ = auVar29._0_4_ * fVar241;
            auVar104._8_4_ = auVar29._8_4_ * fVar281;
            auVar104._12_4_ = auVar29._12_4_ * fVar343;
            auVar104._16_4_ = auVar29._16_4_ * fVar171;
            auVar104._20_4_ = auVar29._20_4_ * fVar233;
            auVar104._24_4_ = auVar29._24_4_ * fVar174;
            auVar104._28_4_ = auVar29._28_4_;
            auVar105._4_4_ = fVar254 * auVar28._4_4_;
            auVar105._0_4_ = fVar236 * auVar28._0_4_;
            auVar105._8_4_ = fVar279 * auVar28._8_4_;
            auVar105._12_4_ = fVar314 * auVar28._12_4_;
            auVar105._16_4_ = fVar152 * auVar28._16_4_;
            auVar105._20_4_ = fVar295 * auVar28._20_4_;
            auVar105._24_4_ = fVar312 * auVar28._24_4_;
            auVar105._28_4_ = auVar28._28_4_;
            auVar28 = vsubps_avx(auVar105,auVar104);
            auVar165._0_4_ = auVar156._0_4_ * 0.0 + auVar28._0_4_ + auVar30._0_4_ * 0.0;
            auVar165._4_4_ = auVar156._4_4_ * 0.0 + auVar28._4_4_ + auVar30._4_4_ * 0.0;
            auVar165._8_4_ = auVar156._8_4_ * 0.0 + auVar28._8_4_ + auVar30._8_4_ * 0.0;
            auVar165._12_4_ = auVar156._12_4_ * 0.0 + auVar28._12_4_ + auVar30._12_4_ * 0.0;
            auVar165._16_4_ = auVar156._16_4_ * 0.0 + auVar28._16_4_ + auVar30._16_4_ * 0.0;
            auVar165._20_4_ = auVar156._20_4_ * 0.0 + auVar28._20_4_ + auVar30._20_4_ * 0.0;
            auVar165._24_4_ = auVar156._24_4_ * 0.0 + auVar28._24_4_ + auVar30._24_4_ * 0.0;
            auVar165._28_4_ = auVar30._28_4_ + auVar28._28_4_ + auVar30._28_4_;
            auVar168 = ZEXT3264(auVar165);
            auVar156 = vmaxps_avx(_local_780,auVar165);
            auVar156 = vcmpps_avx(auVar156,ZEXT432(0) << 0x20,2);
            auVar28 = _local_620 & auVar156;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) {
LAB_01189561:
              auVar190._8_8_ = uStack_538;
              auVar190._0_8_ = local_540;
              auVar190._16_8_ = uStack_530;
              auVar190._24_8_ = uStack_528;
              auVar367._4_4_ = fStack_7dc;
              auVar367._0_4_ = local_7e0;
              auVar367._8_4_ = fStack_7d8;
              auVar367._12_4_ = fStack_7d4;
              auVar367._16_4_ = fStack_7d0;
              auVar367._20_4_ = fStack_7cc;
              auVar367._24_4_ = fStack_7c8;
              auVar367._28_4_ = fStack_7c4;
            }
            else {
              auVar28 = vandps_avx(auVar156,_local_620);
              auVar106._4_4_ = fVar255 * fVar244;
              auVar106._0_4_ = fVar238 * fVar217;
              auVar106._8_4_ = fVar280 * fVar258;
              auVar106._12_4_ = fVar240 * fVar311;
              auVar106._16_4_ = fVar169 * fVar333;
              auVar106._20_4_ = fVar231 * fVar153;
              auVar106._24_4_ = fVar173 * fVar235;
              auVar106._28_4_ = local_620._28_4_;
              auVar107._4_4_ = fVar254 * fVar296;
              auVar107._0_4_ = fVar236 * fVar203;
              auVar107._8_4_ = fVar279 * fVar325;
              auVar107._12_4_ = fVar314 * fVar327;
              auVar107._16_4_ = fVar152 * fVar328;
              auVar107._20_4_ = fVar295 * fVar329;
              auVar107._24_4_ = fVar312 * fVar330;
              auVar107._28_4_ = auVar156._28_4_;
              auVar29 = vsubps_avx(auVar107,auVar106);
              auVar108._4_4_ = fVar256 * fVar296;
              auVar108._0_4_ = fVar241 * fVar203;
              auVar108._8_4_ = fVar281 * fVar325;
              auVar108._12_4_ = fVar343 * fVar327;
              auVar108._16_4_ = fVar171 * fVar328;
              auVar108._20_4_ = fVar233 * fVar329;
              auVar108._24_4_ = fVar174 * fVar330;
              auVar108._28_4_ = auVar33._28_4_;
              auVar109._4_4_ = fVar255 * fVar253;
              auVar109._0_4_ = fVar238 * fVar234;
              auVar109._8_4_ = fVar280 * fVar276;
              auVar109._12_4_ = fVar240 * fVar313;
              auVar109._16_4_ = fVar169 * fVar341;
              auVar109._20_4_ = fVar231 * fVar257;
              auVar109._24_4_ = fVar173 * fVar242;
              auVar109._28_4_ = auVar182._28_4_;
              auVar30 = vsubps_avx(auVar109,auVar108);
              auVar110._4_4_ = fVar254 * fVar253;
              auVar110._0_4_ = fVar236 * fVar234;
              auVar110._8_4_ = fVar279 * fVar276;
              auVar110._12_4_ = fVar314 * fVar313;
              auVar110._16_4_ = fVar152 * fVar341;
              auVar110._20_4_ = fVar295 * fVar257;
              auVar110._24_4_ = fVar312 * fVar242;
              auVar110._28_4_ = auVar31._28_4_;
              auVar111._4_4_ = fVar256 * fVar244;
              auVar111._0_4_ = fVar241 * fVar217;
              auVar111._8_4_ = fVar281 * fVar258;
              auVar111._12_4_ = fVar343 * fVar311;
              auVar111._16_4_ = fVar171 * fVar333;
              auVar111._20_4_ = fVar233 * fVar153;
              auVar111._24_4_ = fVar174 * fVar235;
              auVar111._28_4_ = auVar181._28_4_;
              auVar32 = vsubps_avx(auVar111,auVar110);
              auVar310 = ZEXT3264(auVar32);
              auVar189._0_4_ = auVar29._0_4_ * 0.0 + auVar32._0_4_ + auVar30._0_4_ * 0.0;
              auVar189._4_4_ = auVar29._4_4_ * 0.0 + auVar32._4_4_ + auVar30._4_4_ * 0.0;
              auVar189._8_4_ = auVar29._8_4_ * 0.0 + auVar32._8_4_ + auVar30._8_4_ * 0.0;
              auVar189._12_4_ = auVar29._12_4_ * 0.0 + auVar32._12_4_ + auVar30._12_4_ * 0.0;
              auVar189._16_4_ = auVar29._16_4_ * 0.0 + auVar32._16_4_ + auVar30._16_4_ * 0.0;
              auVar189._20_4_ = auVar29._20_4_ * 0.0 + auVar32._20_4_ + auVar30._20_4_ * 0.0;
              auVar189._24_4_ = auVar29._24_4_ * 0.0 + auVar32._24_4_ + auVar30._24_4_ * 0.0;
              auVar189._28_4_ = auVar181._28_4_ + auVar32._28_4_ + auVar31._28_4_;
              auVar156 = vrcpps_avx(auVar189);
              fVar234 = auVar156._0_4_;
              fVar236 = auVar156._4_4_;
              auVar112._4_4_ = auVar189._4_4_ * fVar236;
              auVar112._0_4_ = auVar189._0_4_ * fVar234;
              fVar238 = auVar156._8_4_;
              auVar112._8_4_ = auVar189._8_4_ * fVar238;
              fVar241 = auVar156._12_4_;
              auVar112._12_4_ = auVar189._12_4_ * fVar241;
              fVar244 = auVar156._16_4_;
              auVar112._16_4_ = auVar189._16_4_ * fVar244;
              fVar253 = auVar156._20_4_;
              auVar112._20_4_ = auVar189._20_4_ * fVar253;
              fVar254 = auVar156._24_4_;
              auVar112._24_4_ = auVar189._24_4_ * fVar254;
              auVar112._28_4_ = auVar182._28_4_;
              auVar352._8_4_ = 0x3f800000;
              auVar352._0_8_ = &DAT_3f8000003f800000;
              auVar352._12_4_ = 0x3f800000;
              auVar352._16_4_ = 0x3f800000;
              auVar352._20_4_ = 0x3f800000;
              auVar352._24_4_ = 0x3f800000;
              auVar352._28_4_ = 0x3f800000;
              auVar156 = vsubps_avx(auVar352,auVar112);
              fVar234 = auVar156._0_4_ * fVar234 + fVar234;
              fVar236 = auVar156._4_4_ * fVar236 + fVar236;
              fVar238 = auVar156._8_4_ * fVar238 + fVar238;
              fVar241 = auVar156._12_4_ * fVar241 + fVar241;
              fVar244 = auVar156._16_4_ * fVar244 + fVar244;
              fVar253 = auVar156._20_4_ * fVar253 + fVar253;
              fVar254 = auVar156._24_4_ * fVar254 + fVar254;
              auVar113._4_4_ =
                   (fVar252 * auVar29._4_4_ + auVar30._4_4_ * fVar251 + auVar32._4_4_ * fVar177) *
                   fVar236;
              auVar113._0_4_ =
                   (fVar232 * auVar29._0_4_ + auVar30._0_4_ * fVar230 + auVar32._0_4_ * fVar175) *
                   fVar234;
              auVar113._8_4_ =
                   (fVar273 * auVar29._8_4_ + auVar30._8_4_ * fVar270 + auVar32._8_4_ * fVar195) *
                   fVar238;
              auVar113._12_4_ =
                   (fVar342 * auVar29._12_4_ + auVar30._12_4_ * fVar237 + auVar32._12_4_ * fVar197)
                   * fVar241;
              auVar113._16_4_ =
                   (fVar243 * auVar29._16_4_ + auVar30._16_4_ * fVar338 + auVar32._16_4_ * fVar199)
                   * fVar244;
              auVar113._20_4_ =
                   (fVar172 * auVar29._20_4_ + auVar30._20_4_ * fVar170 + auVar32._20_4_ * fVar200)
                   * fVar253;
              auVar113._24_4_ =
                   (fVar239 * auVar29._24_4_ + auVar30._24_4_ * fVar204 + auVar32._24_4_ * fVar202)
                   * fVar254;
              auVar113._28_4_ = auVar25._28_4_ + auVar26._28_4_ + auVar27._28_4_;
              fVar217 = (ray->super_RayK<1>).tfar;
              auVar250._4_4_ = fVar217;
              auVar250._0_4_ = fVar217;
              auVar250._8_4_ = fVar217;
              auVar250._12_4_ = fVar217;
              auVar250._16_4_ = fVar217;
              auVar250._20_4_ = fVar217;
              auVar250._24_4_ = fVar217;
              auVar250._28_4_ = fVar217;
              auVar156 = vcmpps_avx(local_120,auVar113,2);
              auVar25 = vcmpps_avx(auVar113,auVar250,2);
              auVar156 = vandps_avx(auVar156,auVar25);
              auVar26 = auVar28 & auVar156;
              if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar26 >> 0x7f,0) == '\0') &&
                    (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0xbf,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar26[0x1f]) goto LAB_01189561;
              auVar156 = vandps_avx(auVar28,auVar156);
              auVar26 = vcmpps_avx(ZEXT432(0) << 0x20,auVar189,4);
              auVar27 = auVar156 & auVar26;
              auVar190._8_8_ = uStack_538;
              auVar190._0_8_ = local_540;
              auVar190._16_8_ = uStack_530;
              auVar190._24_8_ = uStack_528;
              auVar367._4_4_ = fStack_7dc;
              auVar367._0_4_ = local_7e0;
              auVar367._8_4_ = fStack_7d8;
              auVar367._12_4_ = fStack_7d4;
              auVar367._16_4_ = fStack_7d0;
              auVar367._20_4_ = fStack_7cc;
              auVar367._24_4_ = fStack_7c8;
              auVar367._28_4_ = fStack_7c4;
              if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0x7f,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0xbf,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar27[0x1f] < '\0') {
                auVar190 = vandps_avx(auVar26,auVar156);
                auVar114._4_4_ = fVar236 * (float)local_780._4_4_;
                auVar114._0_4_ = fVar234 * (float)local_780._0_4_;
                auVar114._8_4_ = fVar238 * fStack_778;
                auVar114._12_4_ = fVar241 * fStack_774;
                auVar114._16_4_ = fVar244 * register0x00001490;
                auVar114._20_4_ = fVar253 * register0x00001494;
                auVar114._24_4_ = fVar254 * register0x00001498;
                auVar114._28_4_ = auVar25._28_4_;
                auVar115._4_4_ = auVar165._4_4_ * fVar236;
                auVar115._0_4_ = auVar165._0_4_ * fVar234;
                auVar115._8_4_ = auVar165._8_4_ * fVar238;
                auVar115._12_4_ = auVar165._12_4_ * fVar241;
                auVar115._16_4_ = auVar165._16_4_ * fVar244;
                auVar115._20_4_ = auVar165._20_4_ * fVar253;
                auVar115._24_4_ = auVar165._24_4_ * fVar254;
                auVar115._28_4_ = auVar165._28_4_;
                auVar291._8_4_ = 0x3f800000;
                auVar291._0_8_ = &DAT_3f8000003f800000;
                auVar291._12_4_ = 0x3f800000;
                auVar291._16_4_ = 0x3f800000;
                auVar291._20_4_ = 0x3f800000;
                auVar291._24_4_ = 0x3f800000;
                auVar291._28_4_ = 0x3f800000;
                auVar156 = vsubps_avx(auVar291,auVar114);
                _local_100 = vblendvps_avx(auVar156,auVar114,auVar24);
                auVar156 = vsubps_avx(auVar291,auVar115);
                _local_2a0 = vblendvps_avx(auVar156,auVar115,auVar24);
                auVar168 = ZEXT3264(_local_2a0);
                local_480 = auVar113;
              }
            }
            auVar359 = ZEXT3264(local_740);
            auVar322 = ZEXT3264(local_760);
            auVar379 = ZEXT3264(_local_6c0);
            if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar190 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar190 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar190 >> 0x7f,0) == '\0') &&
                  (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar190 >> 0xbf,0) == '\0') &&
                (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar190[0x1f]) goto LAB_0118929f;
            auVar156 = vsubps_avx(auVar305,auVar367);
            fVar230 = auVar367._0_4_ + auVar156._0_4_ * (float)local_100._0_4_;
            fVar232 = auVar367._4_4_ + auVar156._4_4_ * (float)local_100._4_4_;
            fVar234 = auVar367._8_4_ + auVar156._8_4_ * fStack_f8;
            fVar236 = auVar367._12_4_ + auVar156._12_4_ * fStack_f4;
            fVar238 = auVar367._16_4_ + auVar156._16_4_ * fStack_f0;
            fVar241 = auVar367._20_4_ + auVar156._20_4_ * fStack_ec;
            fVar244 = auVar367._24_4_ + auVar156._24_4_ * fStack_e8;
            fVar251 = auVar367._28_4_ + auVar156._28_4_;
            fVar217 = pre->depth_scale;
            auVar116._4_4_ = (fVar232 + fVar232) * fVar217;
            auVar116._0_4_ = (fVar230 + fVar230) * fVar217;
            auVar116._8_4_ = (fVar234 + fVar234) * fVar217;
            auVar116._12_4_ = (fVar236 + fVar236) * fVar217;
            auVar116._16_4_ = (fVar238 + fVar238) * fVar217;
            auVar116._20_4_ = (fVar241 + fVar241) * fVar217;
            auVar116._24_4_ = (fVar244 + fVar244) * fVar217;
            auVar116._28_4_ = fVar251 + fVar251;
            auVar156 = vcmpps_avx(local_480,auVar116,6);
            auVar168 = ZEXT3264(auVar156);
            auVar25 = auVar190 & auVar156;
            fVar260 = (float)local_6e0._0_4_;
            fVar272 = (float)local_6e0._4_4_;
            fVar275 = fStack_6d8;
            fVar278 = fStack_6d4;
            fVar234 = fStack_6d0;
            fVar236 = fStack_6cc;
            fVar251 = fStack_6c8;
            if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0x7f,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0xbf,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar25[0x1f] < '\0') {
              auVar156 = vandps_avx(auVar156,auVar190);
              auVar168 = ZEXT3264(auVar156);
              local_2a0._0_4_ = (float)local_2a0._0_4_ + (float)local_2a0._0_4_ + -1.0;
              local_2a0._4_4_ = (float)local_2a0._4_4_ + (float)local_2a0._4_4_ + -1.0;
              uStack_298._0_4_ = (float)uStack_298 + (float)uStack_298 + -1.0;
              uStack_298._4_4_ = uStack_298._4_4_ + uStack_298._4_4_ + -1.0;
              uStack_290._0_4_ = (float)uStack_290 + (float)uStack_290 + -1.0;
              uStack_290._4_4_ = uStack_290._4_4_ + uStack_290._4_4_ + -1.0;
              uStack_288._0_4_ = (float)uStack_288 + (float)uStack_288 + -1.0;
              uStack_288._4_4_ = uStack_288._4_4_ + uStack_288._4_4_ + -1.0;
              local_3e0 = _local_100;
              auVar142 = _local_2a0;
              auVar25 = _local_2a0;
              local_3c0 = (float)local_2a0._0_4_;
              fStack_3bc = (float)local_2a0._4_4_;
              fStack_3b8 = (float)uStack_298;
              fStack_3b4 = uStack_298._4_4_;
              fStack_3b0 = (float)uStack_290;
              fStack_3ac = uStack_290._4_4_;
              fStack_3a8 = (float)uStack_288;
              fStack_3a4 = uStack_288._4_4_;
              local_3a0 = local_480;
              local_37c = uVar20;
              local_370 = (float)local_820._0_4_;
              fStack_36c = (float)local_820._4_4_;
              fStack_368 = fStack_818;
              fStack_364 = fStack_814;
              local_360 = _local_710;
              local_350 = _local_660;
              local_340 = _local_550;
              local_320 = auVar156;
              auVar149 = (undefined1  [8])(context->scene->geometries).items[local_7f0].ptr;
              if ((((Geometry *)auVar149)->mask & (ray->super_RayK<1>).mask) != 0) {
                local_580 = auVar156;
                auVar310 = ZEXT1264(ZEXT812(0));
                auVar208._0_4_ = (float)(int)local_380;
                auVar208._4_8_ = SUB128(ZEXT812(0),4);
                auVar208._12_4_ = 0;
                auVar263 = vshufps_avx(auVar208,auVar208,0);
                local_300[0] = (auVar263._0_4_ + (float)local_100._0_4_ + 0.0) *
                               (float)local_140._0_4_;
                local_300[1] = (auVar263._4_4_ + (float)local_100._4_4_ + 1.0) *
                               (float)local_140._4_4_;
                local_300[2] = (auVar263._8_4_ + fStack_f8 + 2.0) * fStack_138;
                local_300[3] = (auVar263._12_4_ + fStack_f4 + 3.0) * fStack_134;
                fStack_2f0 = (auVar263._0_4_ + fStack_f0 + 4.0) * fStack_130;
                fStack_2ec = (auVar263._4_4_ + fStack_ec + 5.0) * fStack_12c;
                fStack_2e8 = (auVar263._8_4_ + fStack_e8 + 6.0) * fStack_128;
                fStack_2e4 = auVar263._12_4_ + fStack_e4 + 7.0;
                uStack_290 = auVar142._16_8_;
                uStack_288 = auVar25._24_8_;
                local_2e0 = local_2a0;
                uStack_2d8 = uStack_298;
                uStack_2d0 = uStack_290;
                uStack_2c8 = uStack_288;
                local_2c0 = local_480;
                auVar191._8_4_ = 0x7f800000;
                auVar191._0_8_ = 0x7f8000007f800000;
                auVar191._12_4_ = 0x7f800000;
                auVar191._16_4_ = 0x7f800000;
                auVar191._20_4_ = 0x7f800000;
                auVar191._24_4_ = 0x7f800000;
                auVar191._28_4_ = 0x7f800000;
                auVar26 = vblendvps_avx(auVar191,local_480,auVar156);
                auVar27 = vshufps_avx(auVar26,auVar26,0xb1);
                auVar27 = vminps_avx(auVar26,auVar27);
                auVar28 = vshufpd_avx(auVar27,auVar27,5);
                auVar27 = vminps_avx(auVar27,auVar28);
                auVar28 = vperm2f128_avx(auVar27,auVar27,1);
                auVar27 = vminps_avx(auVar27,auVar28);
                auVar26 = vcmpps_avx(auVar26,auVar27,0);
                auVar27 = auVar156 & auVar26;
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0x7f,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0xbf,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar27[0x1f] < '\0') {
                  auVar156 = vandps_avx(auVar26,auVar156);
                }
                uVar146 = vmovmskps_avx(auVar156);
                uVar144 = 0;
                if (uVar146 != 0) {
                  for (; (uVar146 >> uVar144 & 1) == 0; uVar144 = uVar144 + 1) {
                  }
                }
                uVar148 = (ulong)uVar144;
                _local_2a0 = auVar25;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (((Geometry *)auVar149)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar217 = local_300[uVar148];
                  auVar168 = ZEXT464((uint)fVar217);
                  fVar230 = *(float *)((long)&local_2e0 + uVar148 * 4);
                  fVar234 = 1.0 - fVar217;
                  fVar232 = fVar217 * fVar234 + fVar217 * fVar234;
                  auVar263 = ZEXT416((uint)(fVar217 * fVar217 * 3.0));
                  auVar263 = vshufps_avx(auVar263,auVar263,0);
                  auVar209 = ZEXT416((uint)((fVar232 - fVar217 * fVar217) * 3.0));
                  auVar209 = vshufps_avx(auVar209,auVar209,0);
                  auVar201 = ZEXT416((uint)((fVar234 * fVar234 - fVar232) * 3.0));
                  auVar201 = vshufps_avx(auVar201,auVar201,0);
                  auVar220 = ZEXT416((uint)(fVar234 * fVar234 * -3.0));
                  auVar220 = vshufps_avx(auVar220,auVar220,0);
                  auVar210._0_4_ =
                       (float)local_820._0_4_ * auVar220._0_4_ +
                       local_710._0_4_ * auVar201._0_4_ +
                       (float)local_550._0_4_ * auVar263._0_4_ +
                       auVar209._0_4_ * (float)local_660._0_4_;
                  auVar210._4_4_ =
                       (float)local_820._4_4_ * auVar220._4_4_ +
                       local_710._4_4_ * auVar201._4_4_ +
                       (float)local_550._4_4_ * auVar263._4_4_ +
                       auVar209._4_4_ * (float)local_660._4_4_;
                  auVar210._8_4_ =
                       fStack_818 * auVar220._8_4_ +
                       local_710._8_4_ * auVar201._8_4_ +
                       fStack_548 * auVar263._8_4_ + auVar209._8_4_ * fStack_658;
                  auVar210._12_4_ =
                       fStack_814 * auVar220._12_4_ +
                       local_710._12_4_ * auVar201._12_4_ +
                       fStack_544 * auVar263._12_4_ + auVar209._12_4_ * fStack_654;
                  (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar148 * 4);
                  uVar9 = vmovlps_avx(auVar210);
                  *(undefined8 *)&(ray->Ng).field_0 = uVar9;
                  fVar232 = (float)vextractps_avx(auVar210,2);
                  (ray->Ng).field_0.field_0.z = fVar232;
                  ray->u = fVar217;
                  ray->v = fVar230;
                  ray->primID = (uint)local_7e8;
                  ray->geomID = (uint)local_7f0;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                }
                else {
                  _local_620 = _local_710;
                  _local_780 = _local_660;
                  _local_6a0 = _local_550;
                  local_700 = auVar149;
                  local_7f8 = context;
                  local_800 = ray;
                  local_808 = pre;
                  fVar217 = (float)local_820._0_4_;
                  fVar230 = (float)local_820._4_4_;
                  fVar232 = fStack_818;
                  fVar234 = fStack_814;
                  do {
                    local_644 = local_300[uVar148];
                    local_640 = *(undefined4 *)((long)&local_2e0 + uVar148 * 4);
                    local_680._0_4_ = (ray->super_RayK<1>).tfar;
                    local_7e0 = (float)uVar148;
                    fStack_7dc = (float)(uVar148 >> 0x20);
                    (ray->super_RayK<1>).tfar = *(float *)(local_2c0 + uVar148 * 4);
                    local_7b0.context = context->user;
                    fVar238 = 1.0 - local_644;
                    fVar236 = local_644 * fVar238 + local_644 * fVar238;
                    auVar263 = ZEXT416((uint)(local_644 * local_644 * 3.0));
                    auVar263 = vshufps_avx(auVar263,auVar263,0);
                    auVar209 = ZEXT416((uint)((fVar236 - local_644 * local_644) * 3.0));
                    auVar209 = vshufps_avx(auVar209,auVar209,0);
                    auVar201 = ZEXT416((uint)((fVar238 * fVar238 - fVar236) * 3.0));
                    auVar201 = vshufps_avx(auVar201,auVar201,0);
                    auVar220 = ZEXT416((uint)(fVar238 * fVar238 * -3.0));
                    auVar220 = vshufps_avx(auVar220,auVar220,0);
                    auVar211._0_4_ =
                         fVar217 * auVar220._0_4_ +
                         auVar201._0_4_ * (float)local_620._0_4_ +
                         auVar263._0_4_ * (float)local_6a0._0_4_ +
                         auVar209._0_4_ * (float)local_780._0_4_;
                    auVar211._4_4_ =
                         fVar230 * auVar220._4_4_ +
                         auVar201._4_4_ * (float)local_620._4_4_ +
                         auVar263._4_4_ * (float)local_6a0._4_4_ +
                         auVar209._4_4_ * (float)local_780._4_4_;
                    auVar211._8_4_ =
                         fVar232 * auVar220._8_4_ +
                         auVar201._8_4_ * fStack_618 +
                         auVar263._8_4_ * fStack_698 + auVar209._8_4_ * fStack_778;
                    auVar211._12_4_ =
                         fVar234 * auVar220._12_4_ +
                         auVar201._12_4_ * fStack_614 +
                         auVar263._12_4_ * fStack_694 + auVar209._12_4_ * fStack_774;
                    local_650 = vmovlps_avx(auVar211);
                    local_648 = vextractps_avx(auVar211,2);
                    local_63c = (int)local_7e8;
                    local_638 = (int)local_7f0;
                    local_634 = (local_7b0.context)->instID[0];
                    local_630 = (local_7b0.context)->instPrimID[0];
                    local_824 = -1;
                    local_7b0.valid = &local_824;
                    local_7b0.geometryUserPtr = ((Geometry *)auVar149)->userPtr;
                    local_7b0.ray = (RTCRayN *)ray;
                    local_7b0.hit = (RTCHitN *)&local_650;
                    local_7b0.N = 1;
                    if (((Geometry *)auVar149)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011897a3:
                      p_Var22 = context->args->filter;
                      if (p_Var22 != (RTCFilterFunctionN)0x0) {
                        if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((((Geometry *)auVar149)->field_8).field_0x2 & 0x40) != 0)) {
                          auVar310 = ZEXT1664(auVar310._0_16_);
                          (*p_Var22)(&local_7b0);
                          auVar149 = local_700;
                        }
                        auVar359 = ZEXT3264(local_740);
                        auVar322 = ZEXT3264(local_760);
                        auVar379 = ZEXT3264(_local_6c0);
                        ray = local_800;
                        context = local_7f8;
                        pre = local_808;
                        fVar217 = (float)local_820._0_4_;
                        fVar230 = (float)local_820._4_4_;
                        fVar232 = fStack_818;
                        fVar234 = fStack_814;
                        if (*local_7b0.valid == 0) goto LAB_01189877;
                      }
                      (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).components[0] =
                           *(float *)local_7b0.hit;
                      (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_7b0.hit + 4);
                      (((Vec3f *)((long)local_7b0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_7b0.hit + 8);
                      *(float *)((long)local_7b0.ray + 0x3c) = *(float *)(local_7b0.hit + 0xc);
                      *(float *)((long)local_7b0.ray + 0x40) = *(float *)(local_7b0.hit + 0x10);
                      *(float *)((long)local_7b0.ray + 0x44) = *(float *)(local_7b0.hit + 0x14);
                      *(float *)((long)local_7b0.ray + 0x48) = *(float *)(local_7b0.hit + 0x18);
                      *(float *)((long)local_7b0.ray + 0x4c) = *(float *)(local_7b0.hit + 0x1c);
                      *(float *)((long)local_7b0.ray + 0x50) = *(float *)(local_7b0.hit + 0x20);
                    }
                    else {
                      auVar310 = ZEXT1664(auVar310._0_16_);
                      (*((Geometry *)auVar149)->intersectionFilterN)(&local_7b0);
                      auVar379 = ZEXT3264(_local_6c0);
                      auVar322 = ZEXT3264(local_760);
                      auVar359 = ZEXT3264(local_740);
                      ray = local_800;
                      context = local_7f8;
                      auVar149 = local_700;
                      pre = local_808;
                      fVar217 = (float)local_820._0_4_;
                      fVar230 = (float)local_820._4_4_;
                      fVar232 = fStack_818;
                      fVar234 = fStack_814;
                      if (*local_7b0.valid != 0) goto LAB_011897a3;
LAB_01189877:
                      (local_800->super_RayK<1>).tfar = (float)local_680._0_4_;
                      ray = local_800;
                      context = local_7f8;
                      pre = local_808;
                      fVar217 = (float)local_820._0_4_;
                      fVar230 = (float)local_820._4_4_;
                      fVar232 = fStack_818;
                      fVar234 = fStack_814;
                    }
                    auVar26 = local_480;
                    uVar148 = CONCAT44(fStack_7dc,local_7e0);
                    *(undefined4 *)(local_580 + uVar148 * 4) = 0;
                    auVar25 = local_580;
                    fVar236 = (ray->super_RayK<1>).tfar;
                    auVar166._4_4_ = fVar236;
                    auVar166._0_4_ = fVar236;
                    auVar166._8_4_ = fVar236;
                    auVar166._12_4_ = fVar236;
                    auVar166._16_4_ = fVar236;
                    auVar166._20_4_ = fVar236;
                    auVar166._24_4_ = fVar236;
                    auVar166._28_4_ = fVar236;
                    auVar156 = vcmpps_avx(auVar26,auVar166,2);
                    local_580 = vandps_avx(auVar156,local_580);
                    auVar168 = ZEXT3264(local_580);
                    auVar25 = auVar25 & auVar156;
                    bVar123 = (auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar124 = (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar122 = (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar121 = SUB321(auVar25 >> 0x7f,0) != '\0';
                    bVar120 = (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar119 = SUB321(auVar25 >> 0xbf,0) != '\0';
                    bVar118 = (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar117 = auVar25[0x1f] < '\0';
                    if (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119) ||
                        bVar118) || bVar117) {
                      auVar192._8_4_ = 0x7f800000;
                      auVar192._0_8_ = 0x7f8000007f800000;
                      auVar192._12_4_ = 0x7f800000;
                      auVar192._16_4_ = 0x7f800000;
                      auVar192._20_4_ = 0x7f800000;
                      auVar192._24_4_ = 0x7f800000;
                      auVar192._28_4_ = 0x7f800000;
                      auVar156 = vblendvps_avx(auVar192,auVar26,local_580);
                      auVar25 = vshufps_avx(auVar156,auVar156,0xb1);
                      auVar25 = vminps_avx(auVar156,auVar25);
                      auVar26 = vshufpd_avx(auVar25,auVar25,5);
                      auVar25 = vminps_avx(auVar25,auVar26);
                      auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                      auVar25 = vminps_avx(auVar25,auVar26);
                      auVar156 = vcmpps_avx(auVar156,auVar25,0);
                      auVar25 = local_580 & auVar156;
                      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar25 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar25 >> 0x7f,0) != '\0') ||
                            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar25 >> 0xbf,0) != '\0') ||
                          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar25[0x1f] < '\0') {
                        auVar156 = vandps_avx(auVar156,local_580);
                        auVar168 = ZEXT3264(auVar156);
                      }
                      uVar146 = vmovmskps_avx(auVar168._0_32_);
                      uVar144 = 0;
                      if (uVar146 != 0) {
                        for (; (uVar146 >> uVar144 & 1) == 0; uVar144 = uVar144 + 1) {
                        }
                      }
                      uVar148 = (ulong)uVar144;
                    }
                  } while (((((((bVar123 || bVar124) || bVar122) || bVar121) || bVar120) || bVar119)
                           || bVar118) || bVar117);
                }
                goto LAB_0118929f;
              }
            }
          }
          lVar151 = lVar151 + 8;
        } while ((int)lVar151 < (int)uVar20);
      }
      fVar217 = (ray->super_RayK<1>).tfar;
      auVar162._4_4_ = fVar217;
      auVar162._0_4_ = fVar217;
      auVar162._8_4_ = fVar217;
      auVar162._12_4_ = fVar217;
      auVar162._16_4_ = fVar217;
      auVar162._20_4_ = fVar217;
      auVar162._24_4_ = fVar217;
      auVar162._28_4_ = fVar217;
      auVar156 = vcmpps_avx(local_80,auVar162,2);
      uVar144 = vmovmskps_avx(auVar156);
      uVar144 = (uint)uVar150 & uVar144;
    } while (uVar144 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }